

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [28];
  LinearSpace3fa *pLVar3;
  undefined1 (*pauVar4) [28];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  uint uVar10;
  Primitive PVar11;
  uint uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  long lVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [12];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined8 uVar129;
  undefined8 uVar130;
  bool bVar131;
  int iVar132;
  long lVar133;
  uint uVar134;
  ulong uVar135;
  uint uVar136;
  byte bVar137;
  long lVar138;
  ulong uVar139;
  bool bVar140;
  float fVar141;
  float fVar142;
  float fVar159;
  float fVar161;
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar163;
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar171;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar160;
  float fVar162;
  float fVar164;
  float fVar166;
  float fVar168;
  float fVar170;
  float fVar172;
  float fVar173;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar174;
  float fVar189;
  float fVar190;
  vint4 bi_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar192;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar191;
  undefined1 auVar188 [64];
  vint4 ai;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar204;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar205;
  float fVar216;
  float fVar217;
  float fVar218;
  vint4 bi;
  undefined1 auVar206 [16];
  float fVar219;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar225;
  float fVar237;
  float fVar238;
  vint4 ai_2;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar240;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar239;
  float fVar241;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar242;
  float fVar254;
  float fVar257;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar243;
  float fVar244;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar255;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar264;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar272;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar273;
  float fVar274;
  undefined1 auVar269 [32];
  float fVar275;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar288;
  float fVar289;
  float fVar297;
  float fVar298;
  float fVar299;
  vint4 ai_1;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar300;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar301;
  float fVar302;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar303 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar304 [32];
  float fVar314;
  float fVar319;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [64];
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar325 [32];
  undefined1 auVar334 [16];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar340;
  float fVar344;
  float fVar345;
  undefined1 auVar341 [16];
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar351 [32];
  float fVar358;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  ulong local_920;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  uint local_8e0;
  undefined4 uStack_8dc;
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 *local_788;
  undefined1 (*local_780) [16];
  undefined1 (*local_778) [32];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [16];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  uint local_480;
  uint local_47c;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined1 local_420 [32];
  float local_400 [4];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  RTCHitN local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar180 [24];
  
  PVar11 = prim[1];
  uVar135 = (ulong)(byte)PVar11;
  lVar101 = uVar135 * 0x19;
  fVar205 = *(float *)(prim + lVar101 + 0x12);
  auVar248 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar248 = vinsertps_avx(auVar248,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar249 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar249 = vinsertps_avx(auVar249,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar248 = vsubps_avx(auVar248,*(undefined1 (*) [16])(prim + lVar101 + 6));
  auVar175._0_4_ = fVar205 * auVar248._0_4_;
  auVar175._4_4_ = fVar205 * auVar248._4_4_;
  auVar175._8_4_ = fVar205 * auVar248._8_4_;
  auVar175._12_4_ = fVar205 * auVar248._12_4_;
  auVar245._0_4_ = fVar205 * auVar249._0_4_;
  auVar245._4_4_ = fVar205 * auVar249._4_4_;
  auVar245._8_4_ = fVar205 * auVar249._8_4_;
  auVar245._12_4_ = fVar205 * auVar249._12_4_;
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 4 + 6)));
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 5 + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 6 + 6)));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar11 * 0xc + uVar135 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar196 = vcvtdq2ps_avx(auVar196);
  uVar139 = (ulong)(uint)((int)(uVar135 * 9) * 2);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar145 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 + uVar135 + 6)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  uVar139 = (ulong)(uint)((int)(uVar135 * 5) << 2);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 + 6)));
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar143 = vshufps_avx(auVar245,auVar245,0);
  auVar176 = vshufps_avx(auVar245,auVar245,0x55);
  auVar193 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar205 = auVar193._0_4_;
  fVar225 = auVar193._4_4_;
  fVar242 = auVar193._8_4_;
  fVar216 = auVar193._12_4_;
  fVar257 = auVar176._0_4_;
  fVar219 = auVar176._4_4_;
  fVar240 = auVar176._8_4_;
  fVar260 = auVar176._12_4_;
  fVar237 = auVar143._0_4_;
  fVar254 = auVar143._4_4_;
  fVar218 = auVar143._8_4_;
  fVar238 = auVar143._12_4_;
  auVar334._0_4_ = fVar237 * auVar248._0_4_ + fVar257 * auVar249._0_4_ + fVar205 * auVar18._0_4_;
  auVar334._4_4_ = fVar254 * auVar248._4_4_ + fVar219 * auVar249._4_4_ + fVar225 * auVar18._4_4_;
  auVar334._8_4_ = fVar218 * auVar248._8_4_ + fVar240 * auVar249._8_4_ + fVar242 * auVar18._8_4_;
  auVar334._12_4_ = fVar238 * auVar248._12_4_ + fVar260 * auVar249._12_4_ + fVar216 * auVar18._12_4_
  ;
  auVar341._0_4_ = fVar237 * auVar19._0_4_ + fVar257 * auVar198._0_4_ + auVar196._0_4_ * fVar205;
  auVar341._4_4_ = fVar254 * auVar19._4_4_ + fVar219 * auVar198._4_4_ + auVar196._4_4_ * fVar225;
  auVar341._8_4_ = fVar218 * auVar19._8_4_ + fVar240 * auVar198._8_4_ + auVar196._8_4_ * fVar242;
  auVar341._12_4_ = fVar238 * auVar19._12_4_ + fVar260 * auVar198._12_4_ + auVar196._12_4_ * fVar216
  ;
  auVar246._0_4_ = fVar237 * auVar144._0_4_ + fVar257 * auVar145._0_4_ + auVar177._0_4_ * fVar205;
  auVar246._4_4_ = fVar254 * auVar144._4_4_ + fVar219 * auVar145._4_4_ + auVar177._4_4_ * fVar225;
  auVar246._8_4_ = fVar218 * auVar144._8_4_ + fVar240 * auVar145._8_4_ + auVar177._8_4_ * fVar242;
  auVar246._12_4_ =
       fVar238 * auVar144._12_4_ + fVar260 * auVar145._12_4_ + auVar177._12_4_ * fVar216;
  auVar143 = vshufps_avx(auVar175,auVar175,0);
  auVar176 = vshufps_avx(auVar175,auVar175,0x55);
  auVar193 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar205 = auVar193._0_4_;
  fVar225 = auVar193._4_4_;
  fVar242 = auVar193._8_4_;
  fVar216 = auVar193._12_4_;
  fVar257 = auVar176._0_4_;
  fVar219 = auVar176._4_4_;
  fVar240 = auVar176._8_4_;
  fVar260 = auVar176._12_4_;
  fVar237 = auVar143._0_4_;
  fVar254 = auVar143._4_4_;
  fVar218 = auVar143._8_4_;
  fVar238 = auVar143._12_4_;
  auVar265._0_4_ = fVar237 * auVar248._0_4_ + fVar257 * auVar249._0_4_ + fVar205 * auVar18._0_4_;
  auVar265._4_4_ = fVar254 * auVar248._4_4_ + fVar219 * auVar249._4_4_ + fVar225 * auVar18._4_4_;
  auVar265._8_4_ = fVar218 * auVar248._8_4_ + fVar240 * auVar249._8_4_ + fVar242 * auVar18._8_4_;
  auVar265._12_4_ = fVar238 * auVar248._12_4_ + fVar260 * auVar249._12_4_ + fVar216 * auVar18._12_4_
  ;
  auVar143._0_4_ = fVar237 * auVar19._0_4_ + auVar196._0_4_ * fVar205 + fVar257 * auVar198._0_4_;
  auVar143._4_4_ = fVar254 * auVar19._4_4_ + auVar196._4_4_ * fVar225 + fVar219 * auVar198._4_4_;
  auVar143._8_4_ = fVar218 * auVar19._8_4_ + auVar196._8_4_ * fVar242 + fVar240 * auVar198._8_4_;
  auVar143._12_4_ = fVar238 * auVar19._12_4_ + auVar196._12_4_ * fVar216 + fVar260 * auVar198._12_4_
  ;
  auVar290._8_4_ = 0x7fffffff;
  auVar290._0_8_ = 0x7fffffff7fffffff;
  auVar290._12_4_ = 0x7fffffff;
  auVar248 = vandps_avx(auVar334,auVar290);
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  auVar248 = vcmpps_avx(auVar248,auVar226,1);
  auVar249 = vblendvps_avx(auVar334,auVar226,auVar248);
  auVar248 = vandps_avx(auVar341,auVar290);
  auVar248 = vcmpps_avx(auVar248,auVar226,1);
  auVar18 = vblendvps_avx(auVar341,auVar226,auVar248);
  auVar248 = vandps_avx(auVar290,auVar246);
  auVar248 = vcmpps_avx(auVar248,auVar226,1);
  auVar248 = vblendvps_avx(auVar246,auVar226,auVar248);
  auVar176._0_4_ = fVar237 * auVar144._0_4_ + fVar257 * auVar145._0_4_ + auVar177._0_4_ * fVar205;
  auVar176._4_4_ = fVar254 * auVar144._4_4_ + fVar219 * auVar145._4_4_ + auVar177._4_4_ * fVar225;
  auVar176._8_4_ = fVar218 * auVar144._8_4_ + fVar240 * auVar145._8_4_ + auVar177._8_4_ * fVar242;
  auVar176._12_4_ =
       fVar238 * auVar144._12_4_ + fVar260 * auVar145._12_4_ + auVar177._12_4_ * fVar216;
  auVar19 = vrcpps_avx(auVar249);
  fVar205 = auVar19._0_4_;
  auVar206._0_4_ = fVar205 * auVar249._0_4_;
  fVar216 = auVar19._4_4_;
  auVar206._4_4_ = fVar216 * auVar249._4_4_;
  fVar218 = auVar19._8_4_;
  auVar206._8_4_ = fVar218 * auVar249._8_4_;
  fVar219 = auVar19._12_4_;
  auVar206._12_4_ = fVar219 * auVar249._12_4_;
  auVar291._8_4_ = 0x3f800000;
  auVar291._0_8_ = &DAT_3f8000003f800000;
  auVar291._12_4_ = 0x3f800000;
  auVar249 = vsubps_avx(auVar291,auVar206);
  fVar205 = fVar205 + fVar205 * auVar249._0_4_;
  fVar216 = fVar216 + fVar216 * auVar249._4_4_;
  fVar218 = fVar218 + fVar218 * auVar249._8_4_;
  fVar219 = fVar219 + fVar219 * auVar249._12_4_;
  auVar249 = vrcpps_avx(auVar18);
  fVar225 = auVar249._0_4_;
  auVar227._0_4_ = fVar225 * auVar18._0_4_;
  fVar237 = auVar249._4_4_;
  auVar227._4_4_ = fVar237 * auVar18._4_4_;
  fVar238 = auVar249._8_4_;
  auVar227._8_4_ = fVar238 * auVar18._8_4_;
  fVar240 = auVar249._12_4_;
  auVar227._12_4_ = fVar240 * auVar18._12_4_;
  auVar249 = vsubps_avx(auVar291,auVar227);
  fVar225 = fVar225 + fVar225 * auVar249._0_4_;
  fVar237 = fVar237 + fVar237 * auVar249._4_4_;
  fVar238 = fVar238 + fVar238 * auVar249._8_4_;
  fVar240 = fVar240 + fVar240 * auVar249._12_4_;
  auVar249 = vrcpps_avx(auVar248);
  fVar242 = auVar249._0_4_;
  auVar247._0_4_ = fVar242 * auVar248._0_4_;
  fVar254 = auVar249._4_4_;
  auVar247._4_4_ = fVar254 * auVar248._4_4_;
  fVar257 = auVar249._8_4_;
  auVar247._8_4_ = fVar257 * auVar248._8_4_;
  fVar260 = auVar249._12_4_;
  auVar247._12_4_ = fVar260 * auVar248._12_4_;
  auVar249 = vsubps_avx(auVar291,auVar247);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar135 * 7 + 6);
  auVar248 = vpmovsxwd_avx(auVar248);
  fVar242 = fVar242 + fVar242 * auVar249._0_4_;
  fVar254 = fVar254 + fVar254 * auVar249._4_4_;
  fVar257 = fVar257 + fVar257 * auVar249._8_4_;
  fVar260 = fVar260 + fVar260 * auVar249._12_4_;
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar265);
  auVar193._0_4_ = fVar205 * auVar248._0_4_;
  auVar193._4_4_ = fVar216 * auVar248._4_4_;
  auVar193._8_4_ = fVar218 * auVar248._8_4_;
  auVar193._12_4_ = fVar219 * auVar248._12_4_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar135 * 9 + 6);
  auVar248 = vpmovsxwd_avx(auVar249);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar265);
  auVar207._0_4_ = fVar205 * auVar248._0_4_;
  auVar207._4_4_ = fVar216 * auVar248._4_4_;
  auVar207._8_4_ = fVar218 * auVar248._8_4_;
  auVar207._12_4_ = fVar219 * auVar248._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar249 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar135 * -2 + 6);
  auVar248 = vpmovsxwd_avx(auVar19);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar143);
  auVar292._0_4_ = auVar248._0_4_ * fVar225;
  auVar292._4_4_ = auVar248._4_4_ * fVar237;
  auVar292._8_4_ = auVar248._8_4_ * fVar238;
  auVar292._12_4_ = auVar248._12_4_ * fVar240;
  auVar248 = vcvtdq2ps_avx(auVar249);
  auVar248 = vsubps_avx(auVar248,auVar143);
  auVar144._0_4_ = fVar225 * auVar248._0_4_;
  auVar144._4_4_ = fVar237 * auVar248._4_4_;
  auVar144._8_4_ = fVar238 * auVar248._8_4_;
  auVar144._12_4_ = fVar240 * auVar248._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar139 + uVar135 + 6);
  auVar248 = vpmovsxwd_avx(auVar198);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar176);
  auVar228._0_4_ = auVar248._0_4_ * fVar242;
  auVar228._4_4_ = auVar248._4_4_ * fVar254;
  auVar228._8_4_ = auVar248._8_4_ * fVar257;
  auVar228._12_4_ = auVar248._12_4_ * fVar260;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar135 * 0x17 + 6);
  auVar248 = vpmovsxwd_avx(auVar196);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar176);
  auVar177._0_4_ = auVar248._0_4_ * fVar242;
  auVar177._4_4_ = auVar248._4_4_ * fVar254;
  auVar177._8_4_ = auVar248._8_4_ * fVar257;
  auVar177._12_4_ = auVar248._12_4_ * fVar260;
  auVar248 = vpminsd_avx(auVar193,auVar207);
  auVar249 = vpminsd_avx(auVar292,auVar144);
  auVar248 = vmaxps_avx(auVar248,auVar249);
  auVar249 = vpminsd_avx(auVar228,auVar177);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar303._4_4_ = uVar9;
  auVar303._0_4_ = uVar9;
  auVar303._8_4_ = uVar9;
  auVar303._12_4_ = uVar9;
  auVar249 = vmaxps_avx(auVar249,auVar303);
  auVar248 = vmaxps_avx(auVar248,auVar249);
  local_4f0._0_4_ = auVar248._0_4_ * 0.99999964;
  local_4f0._4_4_ = auVar248._4_4_ * 0.99999964;
  local_4f0._8_4_ = auVar248._8_4_ * 0.99999964;
  local_4f0._12_4_ = auVar248._12_4_ * 0.99999964;
  auVar248 = vpmaxsd_avx(auVar193,auVar207);
  auVar249 = vpmaxsd_avx(auVar292,auVar144);
  auVar248 = vminps_avx(auVar248,auVar249);
  auVar249 = vpmaxsd_avx(auVar228,auVar177);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar194._4_4_ = uVar9;
  auVar194._0_4_ = uVar9;
  auVar194._8_4_ = uVar9;
  auVar194._12_4_ = uVar9;
  auVar249 = vminps_avx(auVar249,auVar194);
  auVar248 = vminps_avx(auVar248,auVar249);
  auVar145._0_4_ = auVar248._0_4_ * 1.0000004;
  auVar145._4_4_ = auVar248._4_4_ * 1.0000004;
  auVar145._8_4_ = auVar248._8_4_ * 1.0000004;
  auVar145._12_4_ = auVar248._12_4_ * 1.0000004;
  auVar248 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar249 = vpcmpgtd_avx(auVar248,_DAT_01ff0cf0);
  auVar248 = vcmpps_avx(local_4f0,auVar145,2);
  auVar248 = vandps_avx(auVar248,auVar249);
  uVar134 = vmovmskps_avx(auVar248);
  bVar140 = uVar134 != 0;
  if (bVar140) {
    uVar134 = uVar134 & 0xff;
    local_660 = mm_lookupmask_ps._16_8_;
    uStack_658 = mm_lookupmask_ps._24_8_;
    uStack_650 = mm_lookupmask_ps._16_8_;
    uStack_648 = mm_lookupmask_ps._24_8_;
    pLVar3 = pre->ray_space + k;
    local_778 = (undefined1 (*) [32])&local_1a0;
    uVar136 = 1 << ((byte)k & 0x1f);
    local_780 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar136 & 0xf) << 4));
    local_788 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar136 >> 4) * 0x10);
    do {
      uVar139 = (ulong)uVar134;
      lVar133 = 0;
      if (uVar139 != 0) {
        for (; (uVar134 >> lVar133 & 1) == 0; lVar133 = lVar133 + 1) {
        }
      }
      uVar139 = uVar139 - 1 & uVar139;
      uVar134 = *(uint *)(prim + lVar133 * 4 + 6);
      local_5e0._0_4_ = uVar134;
      lVar133 = lVar133 * 0x40;
      lVar138 = 0;
      if (uVar139 != 0) {
        for (; (uVar139 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
        }
      }
      uVar136 = *(uint *)(prim + 2);
      pGVar13 = (context->scene->geometries).items[uVar136].ptr;
      auVar248 = *(undefined1 (*) [16])(prim + lVar133 + lVar101 + 0x16);
      if (((uVar139 != 0) && (uVar135 = uVar139 - 1 & uVar139, uVar135 != 0)) &&
         (lVar138 = 0, uVar135 != 0)) {
        for (; (uVar135 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
        }
      }
      auVar249 = *(undefined1 (*) [16])(prim + lVar133 + lVar101 + 0x26);
      auVar18 = *(undefined1 (*) [16])(prim + lVar133 + lVar101 + 0x36);
      auVar19 = *(undefined1 (*) [16])(prim + lVar133 + lVar101 + 0x46);
      uVar12 = (uint)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar198 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar145 = vinsertps_avx(auVar198,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar144 = vsubps_avx(auVar248,auVar145);
      auVar198 = vshufps_avx(auVar144,auVar144,0);
      auVar196 = vshufps_avx(auVar144,auVar144,0x55);
      auVar144 = vshufps_avx(auVar144,auVar144,0xaa);
      fVar205 = (pLVar3->vx).field_0.m128[0];
      fVar225 = (pLVar3->vx).field_0.m128[1];
      fVar242 = (pLVar3->vx).field_0.m128[2];
      fVar216 = (pLVar3->vx).field_0.m128[3];
      fVar237 = (pLVar3->vy).field_0.m128[0];
      fVar254 = (pLVar3->vy).field_0.m128[1];
      fVar218 = (pLVar3->vy).field_0.m128[2];
      fVar238 = (pLVar3->vy).field_0.m128[3];
      fVar257 = (pLVar3->vz).field_0.m128[0];
      fVar219 = (pLVar3->vz).field_0.m128[1];
      fVar240 = (pLVar3->vz).field_0.m128[2];
      fVar260 = (pLVar3->vz).field_0.m128[3];
      auVar229._0_8_ =
           CONCAT44(auVar198._4_4_ * fVar225 + auVar196._4_4_ * fVar254 + fVar219 * auVar144._4_4_,
                    auVar198._0_4_ * fVar205 + auVar196._0_4_ * fVar237 + fVar257 * auVar144._0_4_);
      auVar229._8_4_ =
           auVar198._8_4_ * fVar242 + auVar196._8_4_ * fVar218 + fVar240 * auVar144._8_4_;
      auVar229._12_4_ =
           auVar198._12_4_ * fVar216 + auVar196._12_4_ * fVar238 + fVar260 * auVar144._12_4_;
      auVar198 = vblendps_avx(auVar229,auVar248,8);
      auVar177 = vsubps_avx(auVar249,auVar145);
      auVar196 = vshufps_avx(auVar177,auVar177,0);
      auVar144 = vshufps_avx(auVar177,auVar177,0x55);
      auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
      auVar230._0_4_ =
           auVar196._0_4_ * fVar205 + auVar144._0_4_ * fVar237 + fVar257 * auVar177._0_4_;
      auVar230._4_4_ =
           auVar196._4_4_ * fVar225 + auVar144._4_4_ * fVar254 + fVar219 * auVar177._4_4_;
      auVar230._8_4_ =
           auVar196._8_4_ * fVar242 + auVar144._8_4_ * fVar218 + fVar240 * auVar177._8_4_;
      auVar230._12_4_ =
           auVar196._12_4_ * fVar216 + auVar144._12_4_ * fVar238 + fVar260 * auVar177._12_4_;
      auVar196 = vblendps_avx(auVar230,auVar249,8);
      auVar143 = vsubps_avx(auVar18,auVar145);
      auVar144 = vshufps_avx(auVar143,auVar143,0);
      auVar177 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar231._0_4_ =
           auVar144._0_4_ * fVar205 + auVar177._0_4_ * fVar237 + fVar257 * auVar143._0_4_;
      auVar231._4_4_ =
           auVar144._4_4_ * fVar225 + auVar177._4_4_ * fVar254 + fVar219 * auVar143._4_4_;
      auVar231._8_4_ =
           auVar144._8_4_ * fVar242 + auVar177._8_4_ * fVar218 + fVar240 * auVar143._8_4_;
      auVar231._12_4_ =
           auVar144._12_4_ * fVar216 + auVar177._12_4_ * fVar238 + fVar260 * auVar143._12_4_;
      auVar144 = vblendps_avx(auVar231,auVar18,8);
      auVar143 = vsubps_avx(auVar19,auVar145);
      auVar145 = vshufps_avx(auVar143,auVar143,0);
      auVar177 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar266._0_4_ =
           auVar145._0_4_ * fVar205 + auVar177._0_4_ * fVar237 + fVar257 * auVar143._0_4_;
      auVar266._4_4_ =
           auVar145._4_4_ * fVar225 + auVar177._4_4_ * fVar254 + fVar219 * auVar143._4_4_;
      auVar266._8_4_ =
           auVar145._8_4_ * fVar242 + auVar177._8_4_ * fVar218 + fVar240 * auVar143._8_4_;
      auVar266._12_4_ =
           auVar145._12_4_ * fVar216 + auVar177._12_4_ * fVar238 + fVar260 * auVar143._12_4_;
      auVar145 = vblendps_avx(auVar266,auVar19,8);
      auVar208._8_4_ = 0x7fffffff;
      auVar208._0_8_ = 0x7fffffff7fffffff;
      auVar208._12_4_ = 0x7fffffff;
      auVar198 = vandps_avx(auVar198,auVar208);
      auVar196 = vandps_avx(auVar196,auVar208);
      auVar177 = vmaxps_avx(auVar198,auVar196);
      auVar198 = vandps_avx(auVar144,auVar208);
      auVar196 = vandps_avx(auVar145,auVar208);
      auVar198 = vmaxps_avx(auVar198,auVar196);
      auVar198 = vmaxps_avx(auVar177,auVar198);
      auVar196 = vmovshdup_avx(auVar198);
      auVar196 = vmaxss_avx(auVar196,auVar198);
      auVar198 = vshufpd_avx(auVar198,auVar198,1);
      auVar198 = vmaxss_avx(auVar198,auVar196);
      lVar133 = (long)(int)uVar12 * 0x44;
      fVar205 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar133 + 0x908);
      fVar225 = *(float *)(bspline_basis0 + lVar133 + 0x90c);
      fVar242 = *(float *)(bspline_basis0 + lVar133 + 0x910);
      fVar216 = *(float *)(bspline_basis0 + lVar133 + 0x914);
      fVar237 = *(float *)(bspline_basis0 + lVar133 + 0x918);
      fVar254 = *(float *)(bspline_basis0 + lVar133 + 0x91c);
      fVar218 = *(float *)(bspline_basis0 + lVar133 + 0x920);
      auVar124 = *(undefined1 (*) [28])(bspline_basis0 + lVar133 + 0x908);
      auVar196 = vshufps_avx(auVar231,auVar231,0);
      register0x00001250 = auVar196;
      _local_6a0 = auVar196;
      auVar144 = vshufps_avx(auVar231,auVar231,0x55);
      fVar238 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar133 + 0xd8c);
      fVar257 = *(float *)(bspline_basis0 + lVar133 + 0xd90);
      fVar219 = *(float *)(bspline_basis0 + lVar133 + 0xd94);
      fVar240 = *(float *)(bspline_basis0 + lVar133 + 0xd98);
      fVar260 = *(float *)(bspline_basis0 + lVar133 + 0xd9c);
      fVar324 = *(float *)(bspline_basis0 + lVar133 + 0xda0);
      fVar217 = *(float *)(bspline_basis0 + lVar133 + 0xda4);
      auVar123 = *(undefined1 (*) [28])(bspline_basis0 + lVar133 + 0xd8c);
      auVar145 = vshufps_avx(auVar266,auVar266,0);
      register0x000015d0 = auVar145;
      _local_5a0 = auVar145;
      auVar177 = vshufps_avx(auVar266,auVar266,0x55);
      local_720._16_16_ = auVar177;
      local_720._0_16_ = auVar177;
      fVar358 = auVar145._0_4_;
      fVar362 = auVar145._4_4_;
      fVar363 = auVar145._8_4_;
      fVar364 = auVar145._12_4_;
      fVar174 = auVar196._0_4_;
      fVar189 = auVar196._4_4_;
      fVar190 = auVar196._8_4_;
      fVar191 = auVar196._12_4_;
      fVar264 = auVar177._0_4_;
      fVar270 = auVar177._4_4_;
      fVar271 = auVar177._8_4_;
      fVar272 = auVar177._12_4_;
      fVar243 = auVar144._0_4_;
      fVar255 = auVar144._4_4_;
      fVar258 = auVar144._8_4_;
      fVar261 = auVar144._12_4_;
      auVar196 = vshufps_avx(auVar18,auVar18,0xff);
      register0x00001490 = auVar196;
      _local_2e0 = auVar196;
      auVar144 = vshufps_avx(auVar19,auVar19,0xff);
      register0x00001410 = auVar144;
      _local_80 = auVar144;
      fVar288 = auVar144._0_4_;
      fVar297 = auVar144._4_4_;
      fVar275 = auVar144._8_4_;
      fVar282 = auVar144._12_4_;
      fVar286 = auVar196._0_4_;
      fVar287 = auVar196._4_4_;
      fVar302 = auVar196._8_4_;
      auVar144 = vshufps_avx(auVar230,auVar230,0);
      register0x00001550 = auVar144;
      _local_340 = auVar144;
      fVar326 = *(float *)(bspline_basis0 + lVar133 + 0x484);
      fVar220 = *(float *)(bspline_basis0 + lVar133 + 0x488);
      fVar327 = *(float *)(bspline_basis0 + lVar133 + 0x48c);
      fVar223 = *(float *)(bspline_basis0 + lVar133 + 0x490);
      fVar329 = *(float *)(bspline_basis0 + lVar133 + 0x494);
      fVar263 = *(float *)(bspline_basis0 + lVar133 + 0x498);
      fVar330 = *(float *)(bspline_basis0 + lVar133 + 0x49c);
      fVar317 = auVar144._0_4_;
      fVar318 = auVar144._4_4_;
      fVar345 = auVar144._8_4_;
      fVar347 = auVar144._12_4_;
      auVar144 = vshufps_avx(auVar230,auVar230,0x55);
      register0x00001350 = auVar144;
      _local_2a0 = auVar144;
      fVar244 = auVar144._0_4_;
      fVar256 = auVar144._4_4_;
      fVar259 = auVar144._8_4_;
      fVar262 = auVar144._12_4_;
      auVar144 = vpermilps_avx(auVar249,0xff);
      register0x00001590 = auVar144;
      _local_300 = auVar144;
      fVar349 = auVar144._0_4_;
      fVar352 = auVar144._4_4_;
      fVar354 = auVar144._8_4_;
      fVar356 = auVar144._12_4_;
      auVar107._8_4_ = auVar229._8_4_;
      auVar107._0_8_ = auVar229._0_8_;
      auVar107._12_4_ = auVar229._12_4_;
      auVar144 = vshufps_avx(auVar107,auVar107,0);
      register0x00001310 = auVar144;
      _local_580 = auVar144;
      pauVar1 = (undefined1 (*) [16])(bspline_basis0 + lVar133);
      fVar328 = *(float *)*pauVar1;
      fVar331 = *(float *)(bspline_basis0 + lVar133 + 4);
      fVar221 = *(float *)(bspline_basis0 + lVar133 + 8);
      auVar125 = *(undefined1 (*) [12])*pauVar1;
      fVar333 = *(float *)(bspline_basis0 + lVar133 + 0xc);
      fStack_510 = *(float *)(bspline_basis0 + lVar133 + 0x10);
      fStack_50c = *(float *)(bspline_basis0 + lVar133 + 0x14);
      fStack_508 = *(float *)(bspline_basis0 + lVar133 + 0x18);
      uStack_504 = *(undefined4 *)(bspline_basis0 + lVar133 + 0x1c);
      fVar173 = auVar144._0_4_;
      fVar274 = auVar144._4_4_;
      fVar239 = auVar144._8_4_;
      fVar241 = auVar144._12_4_;
      auVar325._0_4_ = fVar173 * fVar328 + fVar317 * fVar326 + fVar174 * fVar205 + fVar358 * fVar238
      ;
      auVar325._4_4_ = fVar274 * fVar331 + fVar318 * fVar220 + fVar189 * fVar225 + fVar362 * fVar257
      ;
      auVar325._8_4_ = fVar239 * fVar221 + fVar345 * fVar327 + fVar190 * fVar242 + fVar363 * fVar219
      ;
      auVar325._12_4_ =
           fVar241 * fVar333 + fVar347 * fVar223 + fVar191 * fVar216 + fVar364 * fVar240;
      auVar325._16_4_ =
           fVar173 * fStack_510 + fVar317 * fVar329 + fVar174 * fVar237 + fVar358 * fVar260;
      auVar325._20_4_ =
           fVar274 * fStack_50c + fVar318 * fVar263 + fVar189 * fVar254 + fVar362 * fVar324;
      auVar325._24_4_ =
           fVar239 * fStack_508 + fVar345 * fVar330 + fVar190 * fVar218 + fVar363 * fVar217;
      auVar325._28_4_ = fVar191 + 0.0 + 0.0 + 0.0;
      auVar144 = vshufps_avx(auVar107,auVar107,0x55);
      register0x00001510 = auVar144;
      _local_2c0 = auVar144;
      fVar311 = auVar144._0_4_;
      fVar313 = auVar144._4_4_;
      fVar315 = auVar144._8_4_;
      fVar316 = auVar144._12_4_;
      auVar267._0_4_ = fVar311 * fVar328 + fVar244 * fVar326 + fVar243 * fVar205 + fVar264 * fVar238
      ;
      auVar267._4_4_ = fVar313 * fVar331 + fVar256 * fVar220 + fVar255 * fVar225 + fVar270 * fVar257
      ;
      auVar267._8_4_ = fVar315 * fVar221 + fVar259 * fVar327 + fVar258 * fVar242 + fVar271 * fVar219
      ;
      auVar267._12_4_ =
           fVar316 * fVar333 + fVar262 * fVar223 + fVar261 * fVar216 + fVar272 * fVar240;
      auVar267._16_4_ =
           fVar311 * fStack_510 + fVar244 * fVar329 + fVar243 * fVar237 + fVar264 * fVar260;
      auVar267._20_4_ =
           fVar313 * fStack_50c + fVar256 * fVar263 + fVar255 * fVar254 + fVar270 * fVar324;
      auVar267._24_4_ =
           fVar315 * fStack_508 + fVar259 * fVar330 + fVar258 * fVar218 + fVar271 * fVar217;
      auVar267._28_4_ = fVar191 + 0.0 + 0.0 + 0.0;
      auVar144 = vpermilps_avx(auVar248,0xff);
      register0x00001450 = auVar144;
      _local_320 = auVar144;
      fVar283 = auVar144._0_4_;
      fVar284 = auVar144._4_4_;
      fVar285 = auVar144._8_4_;
      fVar141 = fVar283 * fVar328 + fVar349 * fVar326 + fVar286 * fVar205 + fVar288 * fVar238;
      fVar159 = fVar284 * fVar331 + fVar352 * fVar220 + fVar287 * fVar225 + fVar297 * fVar257;
      fVar161 = fVar285 * fVar221 + fVar354 * fVar327 + fVar302 * fVar242 + fVar275 * fVar219;
      fVar163 = auVar144._12_4_ * fVar333 +
                fVar356 * fVar223 + auVar196._12_4_ * fVar216 + fVar282 * fVar240;
      fVar165 = fVar283 * fStack_510 + fVar349 * fVar329 + fVar286 * fVar237 + fVar288 * fVar260;
      fVar167 = fVar284 * fStack_50c + fVar352 * fVar263 + fVar287 * fVar254 + fVar297 * fVar324;
      fVar169 = fVar285 * fStack_508 + fVar354 * fVar330 + fVar302 * fVar218 + fVar275 * fVar217;
      fVar171 = *(float *)(bspline_basis0 + lVar133 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar238 = *(float *)(bspline_basis1 + lVar133 + 0x908);
      fVar257 = *(float *)(bspline_basis1 + lVar133 + 0x90c);
      fVar219 = *(float *)(bspline_basis1 + lVar133 + 0x910);
      fVar240 = *(float *)(bspline_basis1 + lVar133 + 0x914);
      fVar260 = *(float *)(bspline_basis1 + lVar133 + 0x918);
      fVar324 = *(float *)(bspline_basis1 + lVar133 + 0x91c);
      fVar217 = *(float *)(bspline_basis1 + lVar133 + 0x920);
      fVar328 = *(float *)(bspline_basis1 + lVar133 + 0xd8c);
      fVar331 = *(float *)(bspline_basis1 + lVar133 + 0xd90);
      fVar221 = *(float *)(bspline_basis1 + lVar133 + 0xd94);
      fVar332 = *(float *)(bspline_basis1 + lVar133 + 0xd98);
      fVar289 = *(float *)(bspline_basis1 + lVar133 + 0xd9c);
      fVar222 = *(float *)(bspline_basis1 + lVar133 + 0xda0);
      fVar300 = *(float *)(bspline_basis1 + lVar133 + 0xda4);
      fVar298 = *(float *)(bspline_basis1 + lVar133 + 0x484);
      fVar299 = *(float *)(bspline_basis1 + lVar133 + 0x488);
      fVar224 = *(float *)(bspline_basis1 + lVar133 + 0x48c);
      fVar192 = *(float *)(bspline_basis1 + lVar133 + 0x490);
      fVar142 = *(float *)(bspline_basis1 + lVar133 + 0x494);
      fVar160 = *(float *)(bspline_basis1 + lVar133 + 0x498);
      fVar162 = *(float *)(bspline_basis1 + lVar133 + 0x49c);
      fVar205 = fVar347 + 0.0;
      fVar164 = *(float *)(bspline_basis1 + lVar133);
      fVar166 = *(float *)(bspline_basis1 + lVar133 + 4);
      fVar168 = *(float *)(bspline_basis1 + lVar133 + 8);
      fVar170 = *(float *)(bspline_basis1 + lVar133 + 0xc);
      fVar172 = *(float *)(bspline_basis1 + lVar133 + 0x10);
      fVar204 = *(float *)(bspline_basis1 + lVar133 + 0x14);
      fVar273 = *(float *)(bspline_basis1 + lVar133 + 0x18);
      auVar232._0_4_ = fVar164 * fVar173 + fVar317 * fVar298 + fVar238 * fVar174 + fVar358 * fVar328
      ;
      auVar232._4_4_ = fVar166 * fVar274 + fVar318 * fVar299 + fVar257 * fVar189 + fVar362 * fVar331
      ;
      auVar232._8_4_ = fVar168 * fVar239 + fVar345 * fVar224 + fVar219 * fVar190 + fVar363 * fVar221
      ;
      auVar232._12_4_ =
           fVar170 * fVar241 + fVar347 * fVar192 + fVar240 * fVar191 + fVar364 * fVar332;
      auVar232._16_4_ =
           fVar172 * fVar173 + fVar317 * fVar142 + fVar260 * fVar174 + fVar358 * fVar289;
      auVar232._20_4_ =
           fVar204 * fVar274 + fVar318 * fVar160 + fVar324 * fVar189 + fVar362 * fVar222;
      auVar232._24_4_ =
           fVar273 * fVar239 + fVar345 * fVar162 + fVar217 * fVar190 + fVar363 * fVar300;
      auVar232._28_4_ = fVar356 + fVar205;
      auVar209._0_4_ = fVar311 * fVar164 + fVar244 * fVar298 + fVar238 * fVar243 + fVar328 * fVar264
      ;
      auVar209._4_4_ = fVar313 * fVar166 + fVar256 * fVar299 + fVar257 * fVar255 + fVar331 * fVar270
      ;
      auVar209._8_4_ = fVar315 * fVar168 + fVar259 * fVar224 + fVar219 * fVar258 + fVar221 * fVar271
      ;
      auVar209._12_4_ =
           fVar316 * fVar170 + fVar262 * fVar192 + fVar240 * fVar261 + fVar332 * fVar272;
      auVar209._16_4_ =
           fVar311 * fVar172 + fVar244 * fVar142 + fVar260 * fVar243 + fVar289 * fVar264;
      auVar209._20_4_ =
           fVar313 * fVar204 + fVar256 * fVar160 + fVar324 * fVar255 + fVar222 * fVar270;
      auVar209._24_4_ =
           fVar315 * fVar273 + fVar259 * fVar162 + fVar217 * fVar258 + fVar300 * fVar271;
      auVar209._28_4_ = fVar205 + fVar347 + 0.0;
      auVar359._0_4_ = fVar349 * fVar298 + fVar286 * fVar238 + fVar288 * fVar328 + fVar283 * fVar164
      ;
      auVar359._4_4_ = fVar352 * fVar299 + fVar287 * fVar257 + fVar297 * fVar331 + fVar284 * fVar166
      ;
      auVar359._8_4_ = fVar354 * fVar224 + fVar302 * fVar219 + fVar275 * fVar221 + fVar285 * fVar168
      ;
      auVar359._12_4_ =
           fVar356 * fVar192 + auVar196._12_4_ * fVar240 + fVar282 * fVar332 +
           auVar144._12_4_ * fVar170;
      auVar359._16_4_ =
           fVar349 * fVar142 + fVar286 * fVar260 + fVar288 * fVar289 + fVar283 * fVar172;
      auVar359._20_4_ =
           fVar352 * fVar160 + fVar287 * fVar324 + fVar297 * fVar222 + fVar284 * fVar204;
      auVar359._24_4_ =
           fVar354 * fVar162 + fVar302 * fVar217 + fVar275 * fVar300 + fVar285 * fVar273;
      auVar359._28_4_ = fVar347 + fVar282 + 0.0 + fVar205;
      auVar20 = vsubps_avx(auVar232,auVar325);
      auVar21 = vsubps_avx(auVar209,auVar267);
      fVar288 = auVar20._0_4_;
      fVar297 = auVar20._4_4_;
      auVar186._4_4_ = fVar297 * auVar267._4_4_;
      auVar186._0_4_ = fVar288 * auVar267._0_4_;
      fVar275 = auVar20._8_4_;
      auVar186._8_4_ = fVar275 * auVar267._8_4_;
      fVar282 = auVar20._12_4_;
      auVar186._12_4_ = fVar282 * auVar267._12_4_;
      fVar283 = auVar20._16_4_;
      auVar186._16_4_ = fVar283 * auVar267._16_4_;
      fVar284 = auVar20._20_4_;
      auVar186._20_4_ = fVar284 * auVar267._20_4_;
      fVar285 = auVar20._24_4_;
      auVar186._24_4_ = fVar285 * auVar267._24_4_;
      auVar186._28_4_ = fVar205;
      fVar205 = auVar21._0_4_;
      fVar225 = auVar21._4_4_;
      auVar22._4_4_ = auVar325._4_4_ * fVar225;
      auVar22._0_4_ = auVar325._0_4_ * fVar205;
      fVar242 = auVar21._8_4_;
      auVar22._8_4_ = auVar325._8_4_ * fVar242;
      fVar216 = auVar21._12_4_;
      auVar22._12_4_ = auVar325._12_4_ * fVar216;
      fVar237 = auVar21._16_4_;
      auVar22._16_4_ = auVar325._16_4_ * fVar237;
      fVar254 = auVar21._20_4_;
      auVar22._20_4_ = auVar325._20_4_ * fVar254;
      fVar218 = auVar21._24_4_;
      auVar22._24_4_ = auVar325._24_4_ * fVar218;
      auVar22._28_4_ = auVar209._28_4_;
      auVar22 = vsubps_avx(auVar186,auVar22);
      auVar17._4_4_ = fVar159;
      auVar17._0_4_ = fVar141;
      auVar17._8_4_ = fVar161;
      auVar17._12_4_ = fVar163;
      auVar17._16_4_ = fVar165;
      auVar17._20_4_ = fVar167;
      auVar17._24_4_ = fVar169;
      auVar17._28_4_ = fVar171;
      auVar186 = vmaxps_avx(auVar17,auVar359);
      auVar27._4_4_ = auVar186._4_4_ * auVar186._4_4_ * (fVar297 * fVar297 + fVar225 * fVar225);
      auVar27._0_4_ = auVar186._0_4_ * auVar186._0_4_ * (fVar288 * fVar288 + fVar205 * fVar205);
      auVar27._8_4_ = auVar186._8_4_ * auVar186._8_4_ * (fVar275 * fVar275 + fVar242 * fVar242);
      auVar27._12_4_ = auVar186._12_4_ * auVar186._12_4_ * (fVar282 * fVar282 + fVar216 * fVar216);
      auVar27._16_4_ = auVar186._16_4_ * auVar186._16_4_ * (fVar283 * fVar283 + fVar237 * fVar237);
      auVar27._20_4_ = auVar186._20_4_ * auVar186._20_4_ * (fVar284 * fVar284 + fVar254 * fVar254);
      auVar27._24_4_ = auVar186._24_4_ * auVar186._24_4_ * (fVar285 * fVar285 + fVar218 * fVar218);
      auVar27._28_4_ = auVar21._28_4_ + auVar209._28_4_;
      auVar16._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar16._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar16._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar16._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar16._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar16._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar16._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar16._28_4_ = auVar22._28_4_;
      auVar186 = vcmpps_avx(auVar16,auVar27,2);
      local_5c0 = (float)(int)uVar12;
      fStack_5bc = 0.0;
      fStack_5b8 = 0.0;
      fStack_5b4 = 0.0;
      auVar196 = vshufps_avx(ZEXT416((uint)local_5c0),ZEXT416((uint)local_5c0),0);
      auVar210._16_16_ = auVar196;
      auVar210._0_16_ = auVar196;
      auVar22 = vcmpps_avx(_DAT_02020f40,auVar210,1);
      auVar215 = ZEXT3264(auVar22);
      auVar108._8_4_ = auVar229._8_4_;
      auVar108._0_8_ = auVar229._0_8_;
      auVar108._12_4_ = auVar229._12_4_;
      auVar196 = vpermilps_avx(auVar108,0xaa);
      auVar304._16_16_ = auVar196;
      auVar304._0_16_ = auVar196;
      auVar144 = vpermilps_avx(auVar230,0xaa);
      register0x00001550 = auVar144;
      _local_a0 = auVar144;
      auVar145 = vpermilps_avx(auVar231,0xaa);
      register0x00001590 = auVar145;
      _local_c0 = auVar145;
      auVar177 = vpermilps_avx(auVar266,0xaa);
      auVar27 = auVar22 & auVar186;
      uVar10 = *(uint *)(ray + k * 4 + 0x60);
      auVar198 = ZEXT416((uint)(auVar198._0_4_ * 4.7683716e-07));
      local_970 = auVar248._0_4_;
      fStack_96c = auVar248._4_4_;
      fStack_968 = auVar248._8_4_;
      fStack_964 = auVar248._12_4_;
      local_470 = auVar248._0_8_;
      uVar129 = local_470;
      uStack_468 = auVar248._8_8_;
      uVar130 = uStack_468;
      fVar205 = auVar177._0_4_;
      fVar225 = auVar177._4_4_;
      fVar242 = auVar177._8_4_;
      fVar216 = auVar177._12_4_;
      local_670 = auVar249;
      local_600 = auVar19;
      local_5f0 = auVar18;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        bVar131 = false;
        auVar323 = ZEXT3264(local_720);
      }
      else {
        local_640._0_8_ = pGVar13;
        auVar186 = vandps_avx(auVar186,auVar22);
        fVar301 = auVar196._0_4_;
        fVar310 = auVar196._4_4_;
        fVar312 = auVar196._8_4_;
        fVar314 = auVar196._12_4_;
        fVar340 = auVar144._0_4_;
        fVar344 = auVar144._4_4_;
        fVar346 = auVar144._8_4_;
        fVar348 = auVar144._12_4_;
        fVar350 = auVar145._0_4_;
        fVar353 = auVar145._4_4_;
        fVar355 = auVar145._8_4_;
        fVar357 = auVar145._12_4_;
        local_620 = fVar301 * fVar164 + fVar340 * fVar298 + fVar350 * fVar238 + fVar205 * fVar328;
        fStack_61c = fVar310 * fVar166 + fVar344 * fVar299 + fVar353 * fVar257 + fVar225 * fVar331;
        fStack_618 = fVar312 * fVar168 + fVar346 * fVar224 + fVar355 * fVar219 + fVar242 * fVar221;
        fStack_614 = fVar314 * fVar170 + fVar348 * fVar192 + fVar357 * fVar240 + fVar216 * fVar332;
        fStack_610 = fVar301 * fVar172 + fVar340 * fVar142 + fVar350 * fVar260 + fVar205 * fVar289;
        fStack_60c = fVar310 * fVar204 + fVar344 * fVar160 + fVar353 * fVar324 + fVar225 * fVar222;
        fStack_608 = fVar312 * fVar273 + fVar346 * fVar162 + fVar355 * fVar217 + fVar242 * fVar300;
        fStack_604 = auVar186._28_4_ +
                     auVar22._28_4_ + *(float *)(bspline_basis1 + lVar133 + 0x924) + 0.0;
        local_520._0_4_ = auVar125._0_4_;
        local_520._4_4_ = auVar125._4_4_;
        fStack_518 = auVar125._8_4_;
        local_7e0._0_4_ = auVar124._0_4_;
        local_7e0._4_4_ = auVar124._4_4_;
        fStack_7d8 = auVar124._8_4_;
        fStack_7d4 = auVar124._12_4_;
        fStack_7d0 = auVar124._16_4_;
        fStack_7cc = auVar124._20_4_;
        fStack_7c8 = auVar124._24_4_;
        local_900._0_4_ = auVar123._0_4_;
        local_900._4_4_ = auVar123._4_4_;
        fStack_8f8 = auVar123._8_4_;
        fStack_8f4 = auVar123._12_4_;
        fStack_8f0 = auVar123._16_4_;
        fStack_8ec = auVar123._20_4_;
        fStack_8e8 = auVar123._24_4_;
        local_7e0._0_4_ =
             fVar301 * (float)local_520._0_4_ +
             fVar340 * fVar326 + fVar350 * (float)local_7e0._0_4_ + fVar205 * (float)local_900._0_4_
        ;
        local_7e0._4_4_ =
             fVar310 * (float)local_520._4_4_ +
             fVar344 * fVar220 + fVar353 * (float)local_7e0._4_4_ + fVar225 * (float)local_900._4_4_
        ;
        fStack_7d8 = fVar312 * fStack_518 +
                     fVar346 * fVar327 + fVar355 * fStack_7d8 + fVar242 * fStack_8f8;
        fStack_7d4 = fVar314 * fVar333 +
                     fVar348 * fVar223 + fVar357 * fStack_7d4 + fVar216 * fStack_8f4;
        fStack_7d0 = fVar301 * fStack_510 +
                     fVar340 * fVar329 + fVar350 * fStack_7d0 + fVar205 * fStack_8f0;
        fStack_7cc = fVar310 * fStack_50c +
                     fVar344 * fVar263 + fVar353 * fStack_7cc + fVar225 * fStack_8ec;
        fStack_7c8 = fVar312 * fStack_508 +
                     fVar346 * fVar330 + fVar355 * fStack_7c8 + fVar242 * fStack_8e8;
        fStack_7c4 = fVar316 + fStack_604 + auVar186._28_4_ + auVar22._28_4_;
        fVar237 = *(float *)(bspline_basis0 + lVar133 + 0x1210);
        fVar254 = *(float *)(bspline_basis0 + lVar133 + 0x1214);
        fVar218 = *(float *)(bspline_basis0 + lVar133 + 0x1218);
        fVar238 = *(float *)(bspline_basis0 + lVar133 + 0x121c);
        fVar257 = *(float *)(bspline_basis0 + lVar133 + 0x1220);
        fVar219 = *(float *)(bspline_basis0 + lVar133 + 0x1224);
        fVar240 = *(float *)(bspline_basis0 + lVar133 + 0x1228);
        fVar260 = *(float *)(bspline_basis0 + lVar133 + 0x1694);
        fVar324 = *(float *)(bspline_basis0 + lVar133 + 0x1698);
        fVar217 = *(float *)(bspline_basis0 + lVar133 + 0x169c);
        fVar326 = *(float *)(bspline_basis0 + lVar133 + 0x16a0);
        fVar220 = *(float *)(bspline_basis0 + lVar133 + 0x16a4);
        fVar327 = *(float *)(bspline_basis0 + lVar133 + 0x16a8);
        fVar223 = *(float *)(bspline_basis0 + lVar133 + 0x16ac);
        fVar329 = *(float *)(bspline_basis0 + lVar133 + 0x1b18);
        fVar263 = *(float *)(bspline_basis0 + lVar133 + 0x1b1c);
        fVar330 = *(float *)(bspline_basis0 + lVar133 + 0x1b20);
        fVar328 = *(float *)(bspline_basis0 + lVar133 + 0x1b24);
        fVar331 = *(float *)(bspline_basis0 + lVar133 + 0x1b28);
        fVar221 = *(float *)(bspline_basis0 + lVar133 + 0x1b2c);
        fVar333 = *(float *)(bspline_basis0 + lVar133 + 0x1b30);
        fVar332 = *(float *)(bspline_basis0 + lVar133 + 0x1f9c);
        fVar289 = *(float *)(bspline_basis0 + lVar133 + 0x1fa0);
        fVar222 = *(float *)(bspline_basis0 + lVar133 + 0x1fa4);
        fVar300 = *(float *)(bspline_basis0 + lVar133 + 0x1fa8);
        fVar298 = *(float *)(bspline_basis0 + lVar133 + 0x1fac);
        fVar299 = *(float *)(bspline_basis0 + lVar133 + 0x1fb0);
        fVar224 = *(float *)(bspline_basis0 + lVar133 + 0x1fb4);
        fVar192 = *(float *)(bspline_basis0 + lVar133 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar133 + 0x1fb8);
        fVar319 = *(float *)(bspline_basis0 + lVar133 + 0x16b0) + fVar192;
        auVar181._0_4_ =
             fVar311 * fVar237 + fVar243 * fVar329 + fVar264 * fVar332 + fVar244 * fVar260;
        auVar181._4_4_ =
             fVar313 * fVar254 + fVar255 * fVar263 + fVar270 * fVar289 + fVar256 * fVar324;
        auVar181._8_4_ =
             fVar315 * fVar218 + fVar258 * fVar330 + fVar271 * fVar222 + fVar259 * fVar217;
        auVar181._12_4_ =
             fVar316 * fVar238 + fVar261 * fVar328 + fVar272 * fVar300 + fVar262 * fVar326;
        auVar181._16_4_ =
             fVar311 * fVar257 + fVar243 * fVar331 + fVar264 * fVar298 + fVar244 * fVar220;
        auVar181._20_4_ =
             fVar313 * fVar219 + fVar255 * fVar221 + fVar270 * fVar299 + fVar256 * fVar327;
        auVar181._24_4_ =
             fVar315 * fVar240 + fVar258 * fVar333 + fVar271 * fVar224 + fVar259 * fVar223;
        auVar181._28_4_ =
             fVar192 + fVar314 + *(float *)(bspline_basis1 + lVar133 + 0x1c) +
                       fVar314 + *(float *)(bspline_basis1 + lVar133 + 0x4a0);
        auVar276._0_4_ =
             fVar340 * fVar260 + fVar350 * fVar329 + fVar205 * fVar332 + fVar301 * fVar237;
        auVar276._4_4_ =
             fVar344 * fVar324 + fVar353 * fVar263 + fVar225 * fVar289 + fVar310 * fVar254;
        auVar276._8_4_ =
             fVar346 * fVar217 + fVar355 * fVar330 + fVar242 * fVar222 + fVar312 * fVar218;
        auVar276._12_4_ =
             fVar348 * fVar326 + fVar357 * fVar328 + fVar216 * fVar300 + fVar314 * fVar238;
        auVar276._16_4_ =
             fVar340 * fVar220 + fVar350 * fVar331 + fVar205 * fVar298 + fVar301 * fVar257;
        auVar276._20_4_ =
             fVar344 * fVar327 + fVar353 * fVar221 + fVar225 * fVar299 + fVar310 * fVar219;
        auVar276._24_4_ =
             fVar346 * fVar223 + fVar355 * fVar333 + fVar242 * fVar224 + fVar312 * fVar240;
        auVar276._28_4_ = fVar319 + *(float *)(bspline_basis0 + lVar133 + 0x122c);
        fVar192 = *(float *)(bspline_basis1 + lVar133 + 0x1b18);
        fVar142 = *(float *)(bspline_basis1 + lVar133 + 0x1b1c);
        fVar160 = *(float *)(bspline_basis1 + lVar133 + 0x1b20);
        fVar162 = *(float *)(bspline_basis1 + lVar133 + 0x1b24);
        fVar164 = *(float *)(bspline_basis1 + lVar133 + 0x1b28);
        fVar166 = *(float *)(bspline_basis1 + lVar133 + 0x1b2c);
        fVar168 = *(float *)(bspline_basis1 + lVar133 + 0x1b30);
        fVar170 = *(float *)(bspline_basis1 + lVar133 + 0x1f9c);
        fVar172 = *(float *)(bspline_basis1 + lVar133 + 0x1fa0);
        fVar204 = *(float *)(bspline_basis1 + lVar133 + 0x1fa4);
        fVar273 = *(float *)(bspline_basis1 + lVar133 + 0x1fa8);
        fVar288 = *(float *)(bspline_basis1 + lVar133 + 0x1fac);
        fVar297 = *(float *)(bspline_basis1 + lVar133 + 0x1fb0);
        fVar275 = *(float *)(bspline_basis1 + lVar133 + 0x1fb4);
        fVar282 = *(float *)(bspline_basis1 + lVar133 + 0x1694);
        fVar283 = *(float *)(bspline_basis1 + lVar133 + 0x1698);
        fVar284 = *(float *)(bspline_basis1 + lVar133 + 0x169c);
        fVar285 = *(float *)(bspline_basis1 + lVar133 + 0x16a0);
        fVar286 = *(float *)(bspline_basis1 + lVar133 + 0x16a4);
        fVar287 = *(float *)(bspline_basis1 + lVar133 + 0x16a8);
        fVar302 = *(float *)(bspline_basis1 + lVar133 + 0x16ac);
        fVar349 = *(float *)(bspline_basis1 + lVar133 + 0x1210);
        fVar352 = *(float *)(bspline_basis1 + lVar133 + 0x1214);
        fVar354 = *(float *)(bspline_basis1 + lVar133 + 0x1218);
        fVar356 = *(float *)(bspline_basis1 + lVar133 + 0x121c);
        fVar102 = *(float *)(bspline_basis1 + lVar133 + 0x1220);
        fVar103 = *(float *)(bspline_basis1 + lVar133 + 0x1224);
        fVar104 = *(float *)(bspline_basis1 + lVar133 + 0x1228);
        auVar293._0_4_ =
             fVar173 * fVar349 + fVar317 * fVar282 + fVar174 * fVar192 + fVar358 * fVar170;
        auVar293._4_4_ =
             fVar274 * fVar352 + fVar318 * fVar283 + fVar189 * fVar142 + fVar362 * fVar172;
        auVar293._8_4_ =
             fVar239 * fVar354 + fVar345 * fVar284 + fVar190 * fVar160 + fVar363 * fVar204;
        auVar293._12_4_ =
             fVar241 * fVar356 + fVar347 * fVar285 + fVar191 * fVar162 + fVar364 * fVar273;
        auVar293._16_4_ =
             fVar173 * fVar102 + fVar317 * fVar286 + fVar174 * fVar164 + fVar358 * fVar288;
        auVar293._20_4_ =
             fVar274 * fVar103 + fVar318 * fVar287 + fVar189 * fVar166 + fVar362 * fVar297;
        auVar293._24_4_ =
             fVar239 * fVar104 + fVar345 * fVar302 + fVar190 * fVar168 + fVar363 * fVar275;
        auVar293._28_4_ = fVar261 + fVar261 + fVar319 + fVar364;
        auVar305._0_4_ =
             fVar311 * fVar349 + fVar244 * fVar282 + fVar243 * fVar192 + fVar264 * fVar170;
        auVar305._4_4_ =
             fVar313 * fVar352 + fVar256 * fVar283 + fVar255 * fVar142 + fVar270 * fVar172;
        auVar305._8_4_ =
             fVar315 * fVar354 + fVar259 * fVar284 + fVar258 * fVar160 + fVar271 * fVar204;
        auVar305._12_4_ =
             fVar316 * fVar356 + fVar262 * fVar285 + fVar261 * fVar162 + fVar272 * fVar273;
        auVar305._16_4_ =
             fVar311 * fVar102 + fVar244 * fVar286 + fVar243 * fVar164 + fVar264 * fVar288;
        auVar305._20_4_ =
             fVar313 * fVar103 + fVar256 * fVar287 + fVar255 * fVar166 + fVar270 * fVar297;
        auVar305._24_4_ =
             fVar315 * fVar104 + fVar259 * fVar302 + fVar258 * fVar168 + fVar271 * fVar275;
        auVar305._28_4_ = fVar261 + fVar261 + fVar261 + fVar319;
        auVar200._0_4_ =
             fVar301 * fVar349 + fVar340 * fVar282 + fVar350 * fVar192 + fVar170 * fVar205;
        auVar200._4_4_ =
             fVar310 * fVar352 + fVar344 * fVar283 + fVar353 * fVar142 + fVar172 * fVar225;
        auVar200._8_4_ =
             fVar312 * fVar354 + fVar346 * fVar284 + fVar355 * fVar160 + fVar204 * fVar242;
        auVar200._12_4_ =
             fVar314 * fVar356 + fVar348 * fVar285 + fVar357 * fVar162 + fVar273 * fVar216;
        auVar200._16_4_ =
             fVar301 * fVar102 + fVar340 * fVar286 + fVar350 * fVar164 + fVar288 * fVar205;
        auVar200._20_4_ =
             fVar310 * fVar103 + fVar344 * fVar287 + fVar353 * fVar166 + fVar297 * fVar225;
        auVar200._24_4_ =
             fVar312 * fVar104 + fVar346 * fVar302 + fVar355 * fVar168 + fVar275 * fVar242;
        auVar200._28_4_ =
             *(float *)(bspline_basis1 + lVar133 + 0x122c) +
             *(float *)(bspline_basis1 + lVar133 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar133 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar133 + 0x1fb8);
        auVar233._8_4_ = 0x7fffffff;
        auVar233._0_8_ = 0x7fffffff7fffffff;
        auVar233._12_4_ = 0x7fffffff;
        auVar233._16_4_ = 0x7fffffff;
        auVar233._20_4_ = 0x7fffffff;
        auVar233._24_4_ = 0x7fffffff;
        auVar233._28_4_ = 0x7fffffff;
        auVar118._4_4_ =
             fVar274 * fVar254 + fVar318 * fVar324 + fVar189 * fVar263 + fVar362 * fVar289;
        auVar118._0_4_ =
             fVar173 * fVar237 + fVar317 * fVar260 + fVar174 * fVar329 + fVar358 * fVar332;
        auVar118._8_4_ =
             fVar239 * fVar218 + fVar345 * fVar217 + fVar190 * fVar330 + fVar363 * fVar222;
        auVar118._12_4_ =
             fVar241 * fVar238 + fVar347 * fVar326 + fVar191 * fVar328 + fVar364 * fVar300;
        auVar118._16_4_ =
             fVar173 * fVar257 + fVar317 * fVar220 + fVar174 * fVar331 + fVar358 * fVar298;
        auVar118._20_4_ =
             fVar274 * fVar219 + fVar318 * fVar327 + fVar189 * fVar221 + fVar362 * fVar299;
        auVar118._24_4_ =
             fVar239 * fVar240 + fVar345 * fVar223 + fVar190 * fVar333 + fVar363 * fVar224;
        auVar118._28_4_ =
             *(float *)(bspline_basis0 + lVar133 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar133 + 0x1fb8) +
             fVar314 + *(float *)(bspline_basis1 + lVar133 + 0x4a0);
        auVar22 = vandps_avx(auVar118,auVar233);
        auVar27 = vandps_avx(auVar181,auVar233);
        auVar27 = vmaxps_avx(auVar22,auVar27);
        auVar22 = vandps_avx(auVar276,auVar233);
        auVar22 = vmaxps_avx(auVar27,auVar22);
        auVar248 = vpermilps_avx(auVar198,0);
        auVar277._16_16_ = auVar248;
        auVar277._0_16_ = auVar248;
        auVar22 = vcmpps_avx(auVar22,auVar277,1);
        auVar16 = vblendvps_avx(auVar118,auVar20,auVar22);
        auVar17 = vblendvps_avx(auVar181,auVar21,auVar22);
        auVar22 = vandps_avx(auVar293,auVar233);
        auVar27 = vandps_avx(auVar305,auVar233);
        auVar210 = vmaxps_avx(auVar22,auVar27);
        auVar22 = vandps_avx(auVar200,auVar233);
        auVar22 = vmaxps_avx(auVar210,auVar22);
        auVar210 = vcmpps_avx(auVar22,auVar277,1);
        auVar22 = vblendvps_avx(auVar293,auVar20,auVar210);
        auVar20 = vblendvps_avx(auVar305,auVar21,auVar210);
        fVar142 = auVar16._0_4_;
        fVar160 = auVar16._4_4_;
        fVar162 = auVar16._8_4_;
        fVar164 = auVar16._12_4_;
        fVar166 = auVar16._16_4_;
        fVar168 = auVar16._20_4_;
        fVar170 = auVar16._24_4_;
        fVar172 = auVar22._0_4_;
        fVar204 = auVar22._4_4_;
        fVar273 = auVar22._8_4_;
        fVar174 = auVar22._12_4_;
        fVar189 = auVar22._16_4_;
        fVar190 = auVar22._20_4_;
        fVar191 = auVar22._24_4_;
        fVar173 = -auVar22._28_4_;
        fVar237 = auVar17._0_4_;
        fVar257 = auVar17._4_4_;
        fVar324 = auVar17._8_4_;
        fVar327 = auVar17._12_4_;
        fVar330 = auVar17._16_4_;
        fVar333 = auVar17._20_4_;
        fVar300 = auVar17._24_4_;
        auVar148._0_4_ = fVar237 * fVar237 + fVar142 * fVar142;
        auVar148._4_4_ = fVar257 * fVar257 + fVar160 * fVar160;
        auVar148._8_4_ = fVar324 * fVar324 + fVar162 * fVar162;
        auVar148._12_4_ = fVar327 * fVar327 + fVar164 * fVar164;
        auVar148._16_4_ = fVar330 * fVar330 + fVar166 * fVar166;
        auVar148._20_4_ = fVar333 * fVar333 + fVar168 * fVar168;
        auVar148._24_4_ = fVar300 * fVar300 + fVar170 * fVar170;
        auVar148._28_4_ = auVar305._28_4_ + auVar16._28_4_;
        auVar21 = vrsqrtps_avx(auVar148);
        fVar254 = auVar21._0_4_;
        fVar218 = auVar21._4_4_;
        auVar23._4_4_ = fVar218 * 1.5;
        auVar23._0_4_ = fVar254 * 1.5;
        fVar238 = auVar21._8_4_;
        auVar23._8_4_ = fVar238 * 1.5;
        fVar219 = auVar21._12_4_;
        auVar23._12_4_ = fVar219 * 1.5;
        fVar240 = auVar21._16_4_;
        auVar23._16_4_ = fVar240 * 1.5;
        fVar260 = auVar21._20_4_;
        auVar23._20_4_ = fVar260 * 1.5;
        fVar217 = auVar21._24_4_;
        fVar192 = auVar27._28_4_;
        auVar23._24_4_ = fVar217 * 1.5;
        auVar23._28_4_ = fVar192;
        auVar21._4_4_ = fVar218 * fVar218 * fVar218 * auVar148._4_4_ * 0.5;
        auVar21._0_4_ = fVar254 * fVar254 * fVar254 * auVar148._0_4_ * 0.5;
        auVar21._8_4_ = fVar238 * fVar238 * fVar238 * auVar148._8_4_ * 0.5;
        auVar21._12_4_ = fVar219 * fVar219 * fVar219 * auVar148._12_4_ * 0.5;
        auVar21._16_4_ = fVar240 * fVar240 * fVar240 * auVar148._16_4_ * 0.5;
        auVar21._20_4_ = fVar260 * fVar260 * fVar260 * auVar148._20_4_ * 0.5;
        auVar21._24_4_ = fVar217 * fVar217 * fVar217 * auVar148._24_4_ * 0.5;
        auVar21._28_4_ = auVar148._28_4_;
        auVar21 = vsubps_avx(auVar23,auVar21);
        fVar254 = auVar21._0_4_;
        fVar219 = auVar21._4_4_;
        fVar217 = auVar21._8_4_;
        fVar223 = auVar21._12_4_;
        fVar328 = auVar21._16_4_;
        fVar332 = auVar21._20_4_;
        fVar298 = auVar21._24_4_;
        fVar218 = auVar20._0_4_;
        fVar240 = auVar20._4_4_;
        fVar326 = auVar20._8_4_;
        fVar329 = auVar20._12_4_;
        fVar331 = auVar20._16_4_;
        fVar289 = auVar20._20_4_;
        fVar299 = auVar20._24_4_;
        auVar149._0_4_ = fVar218 * fVar218 + fVar172 * fVar172;
        auVar149._4_4_ = fVar240 * fVar240 + fVar204 * fVar204;
        auVar149._8_4_ = fVar326 * fVar326 + fVar273 * fVar273;
        auVar149._12_4_ = fVar329 * fVar329 + fVar174 * fVar174;
        auVar149._16_4_ = fVar331 * fVar331 + fVar189 * fVar189;
        auVar149._20_4_ = fVar289 * fVar289 + fVar190 * fVar190;
        auVar149._24_4_ = fVar299 * fVar299 + fVar191 * fVar191;
        auVar149._28_4_ = auVar22._28_4_ + auVar21._28_4_;
        auVar22 = vrsqrtps_avx(auVar149);
        fVar238 = auVar22._0_4_;
        fVar260 = auVar22._4_4_;
        auVar24._4_4_ = fVar260 * 1.5;
        auVar24._0_4_ = fVar238 * 1.5;
        fVar220 = auVar22._8_4_;
        auVar24._8_4_ = fVar220 * 1.5;
        fVar263 = auVar22._12_4_;
        auVar24._12_4_ = fVar263 * 1.5;
        fVar221 = auVar22._16_4_;
        auVar24._16_4_ = fVar221 * 1.5;
        fVar222 = auVar22._20_4_;
        auVar24._20_4_ = fVar222 * 1.5;
        fVar224 = auVar22._24_4_;
        auVar24._24_4_ = fVar224 * 1.5;
        auVar24._28_4_ = fVar192;
        auVar25._4_4_ = fVar260 * fVar260 * fVar260 * auVar149._4_4_ * 0.5;
        auVar25._0_4_ = fVar238 * fVar238 * fVar238 * auVar149._0_4_ * 0.5;
        auVar25._8_4_ = fVar220 * fVar220 * fVar220 * auVar149._8_4_ * 0.5;
        auVar25._12_4_ = fVar263 * fVar263 * fVar263 * auVar149._12_4_ * 0.5;
        auVar25._16_4_ = fVar221 * fVar221 * fVar221 * auVar149._16_4_ * 0.5;
        auVar25._20_4_ = fVar222 * fVar222 * fVar222 * auVar149._20_4_ * 0.5;
        auVar25._24_4_ = fVar224 * fVar224 * fVar224 * auVar149._24_4_ * 0.5;
        auVar25._28_4_ = auVar149._28_4_;
        auVar22 = vsubps_avx(auVar24,auVar25);
        fVar238 = auVar22._0_4_;
        fVar260 = auVar22._4_4_;
        fVar220 = auVar22._8_4_;
        fVar263 = auVar22._12_4_;
        fVar221 = auVar22._16_4_;
        fVar222 = auVar22._20_4_;
        fVar224 = auVar22._24_4_;
        fVar237 = fVar141 * fVar237 * fVar254;
        fVar257 = fVar159 * fVar257 * fVar219;
        auVar26._4_4_ = fVar257;
        auVar26._0_4_ = fVar237;
        fVar324 = fVar161 * fVar324 * fVar217;
        auVar26._8_4_ = fVar324;
        fVar327 = fVar163 * fVar327 * fVar223;
        auVar26._12_4_ = fVar327;
        fVar330 = fVar165 * fVar330 * fVar328;
        auVar26._16_4_ = fVar330;
        fVar333 = fVar167 * fVar333 * fVar332;
        auVar26._20_4_ = fVar333;
        fVar300 = fVar169 * fVar300 * fVar298;
        auVar26._24_4_ = fVar300;
        auVar26._28_4_ = fVar173;
        local_900._4_4_ = fVar257 + auVar325._4_4_;
        local_900._0_4_ = fVar237 + auVar325._0_4_;
        fStack_8f8 = fVar324 + auVar325._8_4_;
        fStack_8f4 = fVar327 + auVar325._12_4_;
        fStack_8f0 = fVar330 + auVar325._16_4_;
        fStack_8ec = fVar333 + auVar325._20_4_;
        fStack_8e8 = fVar300 + auVar325._24_4_;
        fStack_8e4 = fVar173 + auVar325._28_4_;
        fVar237 = fVar141 * fVar254 * -fVar142;
        fVar257 = fVar159 * fVar219 * -fVar160;
        auVar28._4_4_ = fVar257;
        auVar28._0_4_ = fVar237;
        fVar324 = fVar161 * fVar217 * -fVar162;
        auVar28._8_4_ = fVar324;
        fVar327 = fVar163 * fVar223 * -fVar164;
        auVar28._12_4_ = fVar327;
        fVar330 = fVar165 * fVar328 * -fVar166;
        auVar28._16_4_ = fVar330;
        fVar333 = fVar167 * fVar332 * -fVar168;
        auVar28._20_4_ = fVar333;
        fVar300 = fVar169 * fVar298 * -fVar170;
        auVar28._24_4_ = fVar300;
        auVar28._28_4_ = fVar192;
        local_800._4_4_ = fVar257 + auVar267._4_4_;
        local_800._0_4_ = fVar237 + auVar267._0_4_;
        uStack_7f8._0_4_ = fVar324 + auVar267._8_4_;
        uStack_7f8._4_4_ = fVar327 + auVar267._12_4_;
        fStack_7f0 = fVar330 + auVar267._16_4_;
        fStack_7ec = fVar333 + auVar267._20_4_;
        fStack_7e8 = fVar300 + auVar267._24_4_;
        fStack_7e4 = fVar192 + auVar267._28_4_;
        fVar237 = fVar254 * 0.0 * fVar141;
        fVar254 = fVar219 * 0.0 * fVar159;
        auVar29._4_4_ = fVar254;
        auVar29._0_4_ = fVar237;
        fVar257 = fVar217 * 0.0 * fVar161;
        auVar29._8_4_ = fVar257;
        fVar219 = fVar223 * 0.0 * fVar163;
        auVar29._12_4_ = fVar219;
        fVar324 = fVar328 * 0.0 * fVar165;
        auVar29._16_4_ = fVar324;
        fVar217 = fVar332 * 0.0 * fVar167;
        auVar29._20_4_ = fVar217;
        fVar327 = fVar298 * 0.0 * fVar169;
        auVar29._24_4_ = fVar327;
        auVar29._28_4_ = fVar272;
        auVar278._0_4_ = fVar237 + (float)local_7e0._0_4_;
        auVar278._4_4_ = fVar254 + (float)local_7e0._4_4_;
        auVar278._8_4_ = fVar257 + fStack_7d8;
        auVar278._12_4_ = fVar219 + fStack_7d4;
        auVar278._16_4_ = fVar324 + fStack_7d0;
        auVar278._20_4_ = fVar217 + fStack_7cc;
        auVar278._24_4_ = fVar327 + fStack_7c8;
        auVar278._28_4_ = fVar272 + fStack_7c4;
        fVar237 = auVar359._0_4_ * fVar218 * fVar238;
        fVar254 = auVar359._4_4_ * fVar240 * fVar260;
        auVar30._4_4_ = fVar254;
        auVar30._0_4_ = fVar237;
        fVar218 = auVar359._8_4_ * fVar326 * fVar220;
        auVar30._8_4_ = fVar218;
        fVar257 = auVar359._12_4_ * fVar329 * fVar263;
        auVar30._12_4_ = fVar257;
        fVar219 = auVar359._16_4_ * fVar331 * fVar221;
        auVar30._16_4_ = fVar219;
        fVar240 = auVar359._20_4_ * fVar289 * fVar222;
        auVar30._20_4_ = fVar240;
        fVar324 = auVar359._24_4_ * fVar299 * fVar224;
        auVar30._24_4_ = fVar324;
        auVar30._28_4_ = auVar20._28_4_;
        auVar210 = vsubps_avx(auVar325,auVar26);
        auVar306._0_4_ = auVar232._0_4_ + fVar237;
        auVar306._4_4_ = auVar232._4_4_ + fVar254;
        auVar306._8_4_ = auVar232._8_4_ + fVar218;
        auVar306._12_4_ = auVar232._12_4_ + fVar257;
        auVar306._16_4_ = auVar232._16_4_ + fVar219;
        auVar306._20_4_ = auVar232._20_4_ + fVar240;
        auVar306._24_4_ = auVar232._24_4_ + fVar324;
        auVar306._28_4_ = auVar232._28_4_ + auVar20._28_4_;
        fVar237 = auVar359._0_4_ * -fVar172 * fVar238;
        fVar254 = auVar359._4_4_ * -fVar204 * fVar260;
        auVar20._4_4_ = fVar254;
        auVar20._0_4_ = fVar237;
        fVar218 = auVar359._8_4_ * -fVar273 * fVar220;
        auVar20._8_4_ = fVar218;
        fVar257 = auVar359._12_4_ * -fVar174 * fVar263;
        auVar20._12_4_ = fVar257;
        fVar219 = auVar359._16_4_ * -fVar189 * fVar221;
        auVar20._16_4_ = fVar219;
        fVar240 = auVar359._20_4_ * -fVar190 * fVar222;
        auVar20._20_4_ = fVar240;
        fVar324 = auVar359._24_4_ * -fVar191 * fVar224;
        auVar20._24_4_ = fVar324;
        auVar20._28_4_ = fVar348;
        auVar267 = vsubps_avx(auVar267,auVar28);
        auVar320._0_4_ = fVar237 + auVar209._0_4_;
        auVar320._4_4_ = fVar254 + auVar209._4_4_;
        auVar320._8_4_ = fVar218 + auVar209._8_4_;
        auVar320._12_4_ = fVar257 + auVar209._12_4_;
        auVar320._16_4_ = fVar219 + auVar209._16_4_;
        auVar320._20_4_ = fVar240 + auVar209._20_4_;
        auVar320._24_4_ = fVar324 + auVar209._24_4_;
        auVar320._28_4_ = fVar348 + auVar209._28_4_;
        fVar237 = fVar238 * 0.0 * auVar359._0_4_;
        fVar254 = fVar260 * 0.0 * auVar359._4_4_;
        auVar31._4_4_ = fVar254;
        auVar31._0_4_ = fVar237;
        fVar218 = fVar220 * 0.0 * auVar359._8_4_;
        auVar31._8_4_ = fVar218;
        fVar238 = fVar263 * 0.0 * auVar359._12_4_;
        auVar31._12_4_ = fVar238;
        fVar257 = fVar221 * 0.0 * auVar359._16_4_;
        auVar31._16_4_ = fVar257;
        fVar219 = fVar222 * 0.0 * auVar359._20_4_;
        auVar31._20_4_ = fVar219;
        fVar240 = fVar224 * 0.0 * auVar359._24_4_;
        auVar31._24_4_ = fVar240;
        auVar31._28_4_ = fVar357;
        auVar325 = vsubps_avx(_local_7e0,auVar29);
        auVar120._4_4_ = fStack_61c;
        auVar120._0_4_ = local_620;
        auVar120._8_4_ = fStack_618;
        auVar120._12_4_ = fStack_614;
        auVar120._16_4_ = fStack_610;
        auVar120._20_4_ = fStack_60c;
        auVar120._24_4_ = fStack_608;
        auVar120._28_4_ = fStack_604;
        auVar360._0_4_ = fVar237 + local_620;
        auVar360._4_4_ = fVar254 + fStack_61c;
        auVar360._8_4_ = fVar218 + fStack_618;
        auVar360._12_4_ = fVar238 + fStack_614;
        auVar360._16_4_ = fVar257 + fStack_610;
        auVar360._20_4_ = fVar219 + fStack_60c;
        auVar360._24_4_ = fVar240 + fStack_608;
        auVar360._28_4_ = fVar357 + fStack_604;
        auVar22 = vsubps_avx(auVar232,auVar30);
        auVar20 = vsubps_avx(auVar209,auVar20);
        auVar21 = vsubps_avx(auVar120,auVar31);
        auVar27 = vsubps_avx(auVar320,auVar267);
        auVar16 = vsubps_avx(auVar360,auVar325);
        auVar32._4_4_ = auVar325._4_4_ * auVar27._4_4_;
        auVar32._0_4_ = auVar325._0_4_ * auVar27._0_4_;
        auVar32._8_4_ = auVar325._8_4_ * auVar27._8_4_;
        auVar32._12_4_ = auVar325._12_4_ * auVar27._12_4_;
        auVar32._16_4_ = auVar325._16_4_ * auVar27._16_4_;
        auVar32._20_4_ = auVar325._20_4_ * auVar27._20_4_;
        auVar32._24_4_ = auVar325._24_4_ * auVar27._24_4_;
        auVar32._28_4_ = fVar357;
        auVar33._4_4_ = auVar267._4_4_ * auVar16._4_4_;
        auVar33._0_4_ = auVar267._0_4_ * auVar16._0_4_;
        auVar33._8_4_ = auVar267._8_4_ * auVar16._8_4_;
        auVar33._12_4_ = auVar267._12_4_ * auVar16._12_4_;
        auVar33._16_4_ = auVar267._16_4_ * auVar16._16_4_;
        auVar33._20_4_ = auVar267._20_4_ * auVar16._20_4_;
        auVar33._24_4_ = auVar267._24_4_ * auVar16._24_4_;
        auVar33._28_4_ = auVar209._28_4_;
        auVar17 = vsubps_avx(auVar33,auVar32);
        auVar34._4_4_ = auVar210._4_4_ * auVar16._4_4_;
        auVar34._0_4_ = auVar210._0_4_ * auVar16._0_4_;
        auVar34._8_4_ = auVar210._8_4_ * auVar16._8_4_;
        auVar34._12_4_ = auVar210._12_4_ * auVar16._12_4_;
        auVar34._16_4_ = auVar210._16_4_ * auVar16._16_4_;
        auVar34._20_4_ = auVar210._20_4_ * auVar16._20_4_;
        auVar34._24_4_ = auVar210._24_4_ * auVar16._24_4_;
        auVar34._28_4_ = auVar16._28_4_;
        auVar209 = vsubps_avx(auVar306,auVar210);
        auVar35._4_4_ = auVar325._4_4_ * auVar209._4_4_;
        auVar35._0_4_ = auVar325._0_4_ * auVar209._0_4_;
        auVar35._8_4_ = auVar325._8_4_ * auVar209._8_4_;
        auVar35._12_4_ = auVar325._12_4_ * auVar209._12_4_;
        auVar35._16_4_ = auVar325._16_4_ * auVar209._16_4_;
        auVar35._20_4_ = auVar325._20_4_ * auVar209._20_4_;
        auVar35._24_4_ = auVar325._24_4_ * auVar209._24_4_;
        auVar35._28_4_ = auVar232._28_4_;
        auVar232 = vsubps_avx(auVar35,auVar34);
        auVar36._4_4_ = auVar209._4_4_ * auVar267._4_4_;
        auVar36._0_4_ = auVar209._0_4_ * auVar267._0_4_;
        auVar36._8_4_ = auVar209._8_4_ * auVar267._8_4_;
        auVar36._12_4_ = auVar209._12_4_ * auVar267._12_4_;
        auVar36._16_4_ = auVar209._16_4_ * auVar267._16_4_;
        auVar36._20_4_ = auVar209._20_4_ * auVar267._20_4_;
        auVar36._24_4_ = auVar209._24_4_ * auVar267._24_4_;
        auVar36._28_4_ = auVar16._28_4_;
        auVar37._4_4_ = auVar210._4_4_ * auVar27._4_4_;
        auVar37._0_4_ = auVar210._0_4_ * auVar27._0_4_;
        auVar37._8_4_ = auVar210._8_4_ * auVar27._8_4_;
        auVar37._12_4_ = auVar210._12_4_ * auVar27._12_4_;
        auVar37._16_4_ = auVar210._16_4_ * auVar27._16_4_;
        auVar37._20_4_ = auVar210._20_4_ * auVar27._20_4_;
        auVar37._24_4_ = auVar210._24_4_ * auVar27._24_4_;
        auVar37._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar37,auVar36);
        auVar150._0_4_ = auVar17._0_4_ * 0.0 + auVar27._0_4_ + auVar232._0_4_ * 0.0;
        auVar150._4_4_ = auVar17._4_4_ * 0.0 + auVar27._4_4_ + auVar232._4_4_ * 0.0;
        auVar150._8_4_ = auVar17._8_4_ * 0.0 + auVar27._8_4_ + auVar232._8_4_ * 0.0;
        auVar150._12_4_ = auVar17._12_4_ * 0.0 + auVar27._12_4_ + auVar232._12_4_ * 0.0;
        auVar150._16_4_ = auVar17._16_4_ * 0.0 + auVar27._16_4_ + auVar232._16_4_ * 0.0;
        auVar150._20_4_ = auVar17._20_4_ * 0.0 + auVar27._20_4_ + auVar232._20_4_ * 0.0;
        auVar150._24_4_ = auVar17._24_4_ * 0.0 + auVar27._24_4_ + auVar232._24_4_ * 0.0;
        auVar150._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar232._28_4_;
        auVar232 = vcmpps_avx(auVar150,ZEXT432(0) << 0x20,2);
        auVar22 = vblendvps_avx(auVar22,_local_900,auVar232);
        auVar20 = vblendvps_avx(auVar20,_local_800,auVar232);
        auVar21 = vblendvps_avx(auVar21,auVar278,auVar232);
        auVar27 = vblendvps_avx(auVar210,auVar306,auVar232);
        auVar16 = vblendvps_avx(auVar267,auVar320,auVar232);
        auVar17 = vblendvps_avx(auVar325,auVar360,auVar232);
        auVar209 = vblendvps_avx(auVar306,auVar210,auVar232);
        auVar210 = vblendvps_avx(auVar320,auVar267,auVar232);
        auVar248 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
        auVar186 = vblendvps_avx(auVar360,auVar325,auVar232);
        auVar209 = vsubps_avx(auVar209,auVar22);
        auVar267 = vsubps_avx(auVar210,auVar20);
        auVar23 = vsubps_avx(auVar186,auVar21);
        auVar186 = vsubps_avx(auVar20,auVar16);
        fVar237 = auVar267._0_4_;
        fVar170 = auVar21._0_4_;
        fVar219 = auVar267._4_4_;
        fVar172 = auVar21._4_4_;
        auVar38._4_4_ = fVar172 * fVar219;
        auVar38._0_4_ = fVar170 * fVar237;
        fVar326 = auVar267._8_4_;
        fVar204 = auVar21._8_4_;
        auVar38._8_4_ = fVar204 * fVar326;
        fVar263 = auVar267._12_4_;
        fVar273 = auVar21._12_4_;
        auVar38._12_4_ = fVar273 * fVar263;
        fVar333 = auVar267._16_4_;
        fVar174 = auVar21._16_4_;
        auVar38._16_4_ = fVar174 * fVar333;
        fVar298 = auVar267._20_4_;
        fVar189 = auVar21._20_4_;
        auVar38._20_4_ = fVar189 * fVar298;
        fVar160 = auVar267._24_4_;
        fVar190 = auVar21._24_4_;
        auVar38._24_4_ = fVar190 * fVar160;
        auVar38._28_4_ = auVar210._28_4_;
        fVar254 = auVar20._0_4_;
        fVar259 = auVar23._0_4_;
        fVar240 = auVar20._4_4_;
        fVar262 = auVar23._4_4_;
        auVar39._4_4_ = fVar262 * fVar240;
        auVar39._0_4_ = fVar259 * fVar254;
        fVar220 = auVar20._8_4_;
        fVar264 = auVar23._8_4_;
        auVar39._8_4_ = fVar264 * fVar220;
        fVar330 = auVar20._12_4_;
        fVar270 = auVar23._12_4_;
        auVar39._12_4_ = fVar270 * fVar330;
        fVar332 = auVar20._16_4_;
        fVar271 = auVar23._16_4_;
        auVar39._16_4_ = fVar271 * fVar332;
        fVar299 = auVar20._20_4_;
        fVar272 = auVar23._20_4_;
        auVar39._20_4_ = fVar272 * fVar299;
        fVar162 = auVar20._24_4_;
        fVar288 = auVar23._24_4_;
        uVar9 = auVar325._28_4_;
        auVar39._24_4_ = fVar288 * fVar162;
        auVar39._28_4_ = uVar9;
        auVar20 = vsubps_avx(auVar39,auVar38);
        fVar218 = auVar22._0_4_;
        fVar260 = auVar22._4_4_;
        auVar40._4_4_ = fVar262 * fVar260;
        auVar40._0_4_ = fVar259 * fVar218;
        fVar327 = auVar22._8_4_;
        auVar40._8_4_ = fVar264 * fVar327;
        fVar328 = auVar22._12_4_;
        auVar40._12_4_ = fVar270 * fVar328;
        fVar289 = auVar22._16_4_;
        auVar40._16_4_ = fVar271 * fVar289;
        fVar224 = auVar22._20_4_;
        auVar40._20_4_ = fVar272 * fVar224;
        fVar164 = auVar22._24_4_;
        auVar40._24_4_ = fVar288 * fVar164;
        auVar40._28_4_ = uVar9;
        fVar238 = auVar209._0_4_;
        auVar351._0_4_ = fVar170 * fVar238;
        fVar324 = auVar209._4_4_;
        auVar351._4_4_ = fVar172 * fVar324;
        fVar223 = auVar209._8_4_;
        auVar351._8_4_ = fVar204 * fVar223;
        fVar331 = auVar209._12_4_;
        auVar351._12_4_ = fVar273 * fVar331;
        fVar222 = auVar209._16_4_;
        auVar351._16_4_ = fVar174 * fVar222;
        fVar192 = auVar209._20_4_;
        auVar351._20_4_ = fVar189 * fVar192;
        fVar166 = auVar209._24_4_;
        auVar351._24_4_ = fVar190 * fVar166;
        auVar351._28_4_ = 0;
        auVar210 = vsubps_avx(auVar351,auVar40);
        auVar41._4_4_ = fVar240 * fVar324;
        auVar41._0_4_ = fVar254 * fVar238;
        auVar41._8_4_ = fVar220 * fVar223;
        auVar41._12_4_ = fVar330 * fVar331;
        auVar41._16_4_ = fVar332 * fVar222;
        auVar41._20_4_ = fVar299 * fVar192;
        auVar41._24_4_ = fVar162 * fVar166;
        auVar41._28_4_ = uVar9;
        auVar42._4_4_ = fVar260 * fVar219;
        auVar42._0_4_ = fVar218 * fVar237;
        auVar42._8_4_ = fVar327 * fVar326;
        auVar42._12_4_ = fVar328 * fVar263;
        auVar42._16_4_ = fVar289 * fVar333;
        auVar42._20_4_ = fVar224 * fVar298;
        auVar42._24_4_ = fVar164 * fVar160;
        auVar42._28_4_ = auVar360._28_4_;
        auVar325 = vsubps_avx(auVar42,auVar41);
        auVar24 = vsubps_avx(auVar21,auVar17);
        fVar257 = auVar325._28_4_ + auVar210._28_4_;
        auVar279._0_4_ = auVar325._0_4_ + auVar210._0_4_ * 0.0 + auVar20._0_4_ * 0.0;
        auVar279._4_4_ = auVar325._4_4_ + auVar210._4_4_ * 0.0 + auVar20._4_4_ * 0.0;
        auVar279._8_4_ = auVar325._8_4_ + auVar210._8_4_ * 0.0 + auVar20._8_4_ * 0.0;
        auVar279._12_4_ = auVar325._12_4_ + auVar210._12_4_ * 0.0 + auVar20._12_4_ * 0.0;
        auVar279._16_4_ = auVar325._16_4_ + auVar210._16_4_ * 0.0 + auVar20._16_4_ * 0.0;
        auVar279._20_4_ = auVar325._20_4_ + auVar210._20_4_ * 0.0 + auVar20._20_4_ * 0.0;
        auVar279._24_4_ = auVar325._24_4_ + auVar210._24_4_ * 0.0 + auVar20._24_4_ * 0.0;
        auVar279._28_4_ = fVar257 + auVar20._28_4_;
        fVar191 = auVar186._0_4_;
        fVar173 = auVar186._4_4_;
        auVar43._4_4_ = fVar173 * auVar17._4_4_;
        auVar43._0_4_ = fVar191 * auVar17._0_4_;
        fVar274 = auVar186._8_4_;
        auVar43._8_4_ = fVar274 * auVar17._8_4_;
        fVar239 = auVar186._12_4_;
        auVar43._12_4_ = fVar239 * auVar17._12_4_;
        fVar241 = auVar186._16_4_;
        auVar43._16_4_ = fVar241 * auVar17._16_4_;
        fVar244 = auVar186._20_4_;
        auVar43._20_4_ = fVar244 * auVar17._20_4_;
        fVar256 = auVar186._24_4_;
        auVar43._24_4_ = fVar256 * auVar17._24_4_;
        auVar43._28_4_ = fVar257;
        fVar257 = auVar24._0_4_;
        fVar217 = auVar24._4_4_;
        auVar44._4_4_ = auVar16._4_4_ * fVar217;
        auVar44._0_4_ = auVar16._0_4_ * fVar257;
        fVar329 = auVar24._8_4_;
        auVar44._8_4_ = auVar16._8_4_ * fVar329;
        fVar221 = auVar24._12_4_;
        auVar44._12_4_ = auVar16._12_4_ * fVar221;
        fVar300 = auVar24._16_4_;
        auVar44._16_4_ = auVar16._16_4_ * fVar300;
        fVar142 = auVar24._20_4_;
        auVar44._20_4_ = auVar16._20_4_ * fVar142;
        fVar168 = auVar24._24_4_;
        auVar44._24_4_ = auVar16._24_4_ * fVar168;
        auVar44._28_4_ = auVar325._28_4_;
        auVar186 = vsubps_avx(auVar44,auVar43);
        auVar210 = vsubps_avx(auVar22,auVar27);
        fVar297 = auVar210._0_4_;
        fVar275 = auVar210._4_4_;
        auVar45._4_4_ = fVar275 * auVar17._4_4_;
        auVar45._0_4_ = fVar297 * auVar17._0_4_;
        fVar282 = auVar210._8_4_;
        auVar45._8_4_ = fVar282 * auVar17._8_4_;
        fVar283 = auVar210._12_4_;
        auVar45._12_4_ = fVar283 * auVar17._12_4_;
        fVar284 = auVar210._16_4_;
        auVar45._16_4_ = fVar284 * auVar17._16_4_;
        fVar285 = auVar210._20_4_;
        auVar45._20_4_ = fVar285 * auVar17._20_4_;
        fVar286 = auVar210._24_4_;
        auVar45._24_4_ = fVar286 * auVar17._24_4_;
        auVar45._28_4_ = auVar17._28_4_;
        auVar46._4_4_ = auVar27._4_4_ * fVar217;
        auVar46._0_4_ = auVar27._0_4_ * fVar257;
        auVar46._8_4_ = auVar27._8_4_ * fVar329;
        auVar46._12_4_ = auVar27._12_4_ * fVar221;
        auVar46._16_4_ = auVar27._16_4_ * fVar300;
        auVar46._20_4_ = auVar27._20_4_ * fVar142;
        auVar46._24_4_ = auVar27._24_4_ * fVar168;
        auVar46._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(auVar45,auVar46);
        auVar47._4_4_ = auVar16._4_4_ * fVar275;
        auVar47._0_4_ = auVar16._0_4_ * fVar297;
        auVar47._8_4_ = auVar16._8_4_ * fVar282;
        auVar47._12_4_ = auVar16._12_4_ * fVar283;
        auVar47._16_4_ = auVar16._16_4_ * fVar284;
        auVar47._20_4_ = auVar16._20_4_ * fVar285;
        auVar47._24_4_ = auVar16._24_4_ * fVar286;
        auVar47._28_4_ = auVar17._28_4_;
        auVar48._4_4_ = auVar27._4_4_ * fVar173;
        auVar48._0_4_ = auVar27._0_4_ * fVar191;
        auVar48._8_4_ = auVar27._8_4_ * fVar274;
        auVar48._12_4_ = auVar27._12_4_ * fVar239;
        auVar48._16_4_ = auVar27._16_4_ * fVar241;
        auVar48._20_4_ = auVar27._20_4_ * fVar244;
        auVar48._24_4_ = auVar27._24_4_ * fVar256;
        auVar48._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar48,auVar47);
        auVar188 = ZEXT864(0) << 0x20;
        auVar234._0_4_ = auVar186._0_4_ * 0.0 + auVar27._0_4_ + auVar20._0_4_ * 0.0;
        auVar234._4_4_ = auVar186._4_4_ * 0.0 + auVar27._4_4_ + auVar20._4_4_ * 0.0;
        auVar234._8_4_ = auVar186._8_4_ * 0.0 + auVar27._8_4_ + auVar20._8_4_ * 0.0;
        auVar234._12_4_ = auVar186._12_4_ * 0.0 + auVar27._12_4_ + auVar20._12_4_ * 0.0;
        auVar234._16_4_ = auVar186._16_4_ * 0.0 + auVar27._16_4_ + auVar20._16_4_ * 0.0;
        auVar234._20_4_ = auVar186._20_4_ * 0.0 + auVar27._20_4_ + auVar20._20_4_ * 0.0;
        auVar234._24_4_ = auVar186._24_4_ * 0.0 + auVar27._24_4_ + auVar20._24_4_ * 0.0;
        auVar234._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar20._28_4_;
        auVar186 = vmaxps_avx(auVar279,auVar234);
        auVar186 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
        auVar196 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
        auVar248 = vpand_avx(auVar196,auVar248);
        auVar196 = vpmovsxwd_avx(auVar248);
        auVar144 = vpunpckhwd_avx(auVar248,auVar248);
        auVar211._16_16_ = auVar144;
        auVar211._0_16_ = auVar196;
        if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar211 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar211 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar211 >> 0x7f,0) == '\0') &&
              (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar144 >> 0x3f,0) == '\0') &&
            (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar144[0xf]) {
LAB_00f09bb7:
          auVar215 = ZEXT3264(auVar211);
          auVar158 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          auVar294._4_4_ = fVar159;
          auVar294._0_4_ = fVar141;
          auVar294._8_4_ = fVar161;
          auVar294._12_4_ = fVar163;
          auVar294._16_4_ = fVar165;
          auVar294._20_4_ = fVar167;
          auVar294._24_4_ = fVar169;
          auVar294._28_4_ = fVar171;
        }
        else {
          auVar49._4_4_ = fVar217 * fVar219;
          auVar49._0_4_ = fVar257 * fVar237;
          auVar49._8_4_ = fVar329 * fVar326;
          auVar49._12_4_ = fVar221 * fVar263;
          auVar49._16_4_ = fVar300 * fVar333;
          auVar49._20_4_ = fVar142 * fVar298;
          auVar49._24_4_ = fVar168 * fVar160;
          auVar49._28_4_ = auVar144._12_4_;
          auVar335._0_4_ = fVar191 * fVar259;
          auVar335._4_4_ = fVar173 * fVar262;
          auVar335._8_4_ = fVar274 * fVar264;
          auVar335._12_4_ = fVar239 * fVar270;
          auVar335._16_4_ = fVar241 * fVar271;
          auVar335._20_4_ = fVar244 * fVar272;
          auVar335._24_4_ = fVar256 * fVar288;
          auVar335._28_4_ = 0;
          auVar186 = vsubps_avx(auVar335,auVar49);
          auVar50._4_4_ = fVar275 * fVar262;
          auVar50._0_4_ = fVar297 * fVar259;
          auVar50._8_4_ = fVar282 * fVar264;
          auVar50._12_4_ = fVar283 * fVar270;
          auVar50._16_4_ = fVar284 * fVar271;
          auVar50._20_4_ = fVar285 * fVar272;
          auVar50._24_4_ = fVar286 * fVar288;
          auVar50._28_4_ = auVar23._28_4_;
          auVar51._4_4_ = fVar217 * fVar324;
          auVar51._0_4_ = fVar257 * fVar238;
          auVar51._8_4_ = fVar329 * fVar223;
          auVar51._12_4_ = fVar221 * fVar331;
          auVar51._16_4_ = fVar300 * fVar222;
          auVar51._20_4_ = fVar142 * fVar192;
          auVar51._24_4_ = fVar168 * fVar166;
          auVar51._28_4_ = auVar24._28_4_;
          auVar27 = vsubps_avx(auVar51,auVar50);
          auVar52._4_4_ = fVar173 * fVar324;
          auVar52._0_4_ = fVar191 * fVar238;
          auVar52._8_4_ = fVar274 * fVar223;
          auVar52._12_4_ = fVar239 * fVar331;
          auVar52._16_4_ = fVar241 * fVar222;
          auVar52._20_4_ = fVar244 * fVar192;
          auVar52._24_4_ = fVar256 * fVar166;
          auVar52._28_4_ = auVar209._28_4_;
          auVar53._4_4_ = fVar275 * fVar219;
          auVar53._0_4_ = fVar297 * fVar237;
          auVar53._8_4_ = fVar282 * fVar326;
          auVar53._12_4_ = fVar283 * fVar263;
          auVar53._16_4_ = fVar284 * fVar333;
          auVar53._20_4_ = fVar285 * fVar298;
          auVar53._24_4_ = fVar286 * fVar160;
          auVar53._28_4_ = auVar279._28_4_;
          auVar16 = vsubps_avx(auVar53,auVar52);
          auVar280._0_4_ = auVar186._0_4_ * 0.0 + auVar16._0_4_ + auVar27._0_4_ * 0.0;
          auVar280._4_4_ = auVar186._4_4_ * 0.0 + auVar16._4_4_ + auVar27._4_4_ * 0.0;
          auVar280._8_4_ = auVar186._8_4_ * 0.0 + auVar16._8_4_ + auVar27._8_4_ * 0.0;
          auVar280._12_4_ = auVar186._12_4_ * 0.0 + auVar16._12_4_ + auVar27._12_4_ * 0.0;
          auVar280._16_4_ = auVar186._16_4_ * 0.0 + auVar16._16_4_ + auVar27._16_4_ * 0.0;
          auVar280._20_4_ = auVar186._20_4_ * 0.0 + auVar16._20_4_ + auVar27._20_4_ * 0.0;
          auVar280._24_4_ = auVar186._24_4_ * 0.0 + auVar16._24_4_ + auVar27._24_4_ * 0.0;
          auVar280._28_4_ = auVar279._28_4_ + auVar16._28_4_ + auVar209._28_4_;
          auVar20 = vrcpps_avx(auVar280);
          fVar237 = auVar20._0_4_;
          fVar238 = auVar20._4_4_;
          auVar54._4_4_ = auVar280._4_4_ * fVar238;
          auVar54._0_4_ = auVar280._0_4_ * fVar237;
          fVar257 = auVar20._8_4_;
          auVar54._8_4_ = auVar280._8_4_ * fVar257;
          fVar219 = auVar20._12_4_;
          auVar54._12_4_ = auVar280._12_4_ * fVar219;
          fVar324 = auVar20._16_4_;
          auVar54._16_4_ = auVar280._16_4_ * fVar324;
          fVar217 = auVar20._20_4_;
          auVar54._20_4_ = auVar280._20_4_ * fVar217;
          fVar326 = auVar20._24_4_;
          auVar54._24_4_ = auVar280._24_4_ * fVar326;
          auVar54._28_4_ = auVar24._28_4_;
          auVar336._8_4_ = 0x3f800000;
          auVar336._0_8_ = &DAT_3f8000003f800000;
          auVar336._12_4_ = 0x3f800000;
          auVar336._16_4_ = 0x3f800000;
          auVar336._20_4_ = 0x3f800000;
          auVar336._24_4_ = 0x3f800000;
          auVar336._28_4_ = 0x3f800000;
          auVar17 = vsubps_avx(auVar336,auVar54);
          fVar237 = auVar17._0_4_ * fVar237 + fVar237;
          fVar238 = auVar17._4_4_ * fVar238 + fVar238;
          fVar257 = auVar17._8_4_ * fVar257 + fVar257;
          fVar219 = auVar17._12_4_ * fVar219 + fVar219;
          fVar324 = auVar17._16_4_ * fVar324 + fVar324;
          fVar217 = auVar17._20_4_ * fVar217 + fVar217;
          fVar326 = auVar17._24_4_ * fVar326 + fVar326;
          auVar55._4_4_ =
               (auVar186._4_4_ * fVar260 + auVar27._4_4_ * fVar240 + auVar16._4_4_ * fVar172) *
               fVar238;
          auVar55._0_4_ =
               (auVar186._0_4_ * fVar218 + auVar27._0_4_ * fVar254 + auVar16._0_4_ * fVar170) *
               fVar237;
          auVar55._8_4_ =
               (auVar186._8_4_ * fVar327 + auVar27._8_4_ * fVar220 + auVar16._8_4_ * fVar204) *
               fVar257;
          auVar55._12_4_ =
               (auVar186._12_4_ * fVar328 + auVar27._12_4_ * fVar330 + auVar16._12_4_ * fVar273) *
               fVar219;
          auVar55._16_4_ =
               (auVar186._16_4_ * fVar289 + auVar27._16_4_ * fVar332 + auVar16._16_4_ * fVar174) *
               fVar324;
          auVar55._20_4_ =
               (auVar186._20_4_ * fVar224 + auVar27._20_4_ * fVar299 + auVar16._20_4_ * fVar189) *
               fVar217;
          auVar55._24_4_ =
               (auVar186._24_4_ * fVar164 + auVar27._24_4_ * fVar162 + auVar16._24_4_ * fVar190) *
               fVar326;
          auVar55._28_4_ = auVar22._28_4_ + auVar267._28_4_ + auVar21._28_4_;
          auVar196 = vpermilps_avx(ZEXT416(uVar10),0);
          auVar212._16_16_ = auVar196;
          auVar212._0_16_ = auVar196;
          auVar186 = vcmpps_avx(auVar212,auVar55,2);
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar250._4_4_ = uVar9;
          auVar250._0_4_ = uVar9;
          auVar250._8_4_ = uVar9;
          auVar250._12_4_ = uVar9;
          auVar250._16_4_ = uVar9;
          auVar250._20_4_ = uVar9;
          auVar250._24_4_ = uVar9;
          auVar250._28_4_ = uVar9;
          auVar22 = vcmpps_avx(auVar55,auVar250,2);
          auVar186 = vandps_avx(auVar22,auVar186);
          auVar196 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
          auVar248 = vpand_avx(auVar248,auVar196);
          auVar196 = vpmovsxwd_avx(auVar248);
          auVar144 = vpshufd_avx(auVar248,0xee);
          auVar144 = vpmovsxwd_avx(auVar144);
          auVar211._16_16_ = auVar144;
          auVar211._0_16_ = auVar196;
          if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar211 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar211 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar211 >> 0x7f,0) == '\0') &&
                (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar144 >> 0x3f,0) == '\0') &&
              (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar144[0xf]) goto LAB_00f09bb7;
          auVar186 = vcmpps_avx(ZEXT832(0) << 0x20,auVar280,4);
          auVar196 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
          auVar248 = vpand_avx(auVar248,auVar196);
          auVar196 = vpmovsxwd_avx(auVar248);
          auVar248 = vpunpckhwd_avx(auVar248,auVar248);
          auVar215 = ZEXT1664(auVar248);
          auVar268._16_16_ = auVar248;
          auVar268._0_16_ = auVar196;
          auVar158 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          auVar294._4_4_ = fVar159;
          auVar294._0_4_ = fVar141;
          auVar294._8_4_ = fVar161;
          auVar294._12_4_ = fVar163;
          auVar294._16_4_ = fVar165;
          auVar294._20_4_ = fVar167;
          auVar294._24_4_ = fVar169;
          auVar294._28_4_ = fVar171;
          if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar268 >> 0x7f,0) != '\0') ||
                (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar248 >> 0x3f,0) != '\0') ||
              (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar248[0xf] < '\0') {
            auVar213._0_4_ = auVar279._0_4_ * fVar237;
            auVar213._4_4_ = auVar279._4_4_ * fVar238;
            auVar213._8_4_ = auVar279._8_4_ * fVar257;
            auVar213._12_4_ = auVar279._12_4_ * fVar219;
            auVar213._16_4_ = auVar279._16_4_ * fVar324;
            auVar213._20_4_ = auVar279._20_4_ * fVar217;
            auVar213._24_4_ = auVar279._24_4_ * fVar326;
            auVar213._28_4_ = 0;
            auVar56._4_4_ = auVar234._4_4_ * fVar238;
            auVar56._0_4_ = auVar234._0_4_ * fVar237;
            auVar56._8_4_ = auVar234._8_4_ * fVar257;
            auVar56._12_4_ = auVar234._12_4_ * fVar219;
            auVar56._16_4_ = auVar234._16_4_ * fVar324;
            auVar56._20_4_ = auVar234._20_4_ * fVar217;
            auVar56._24_4_ = auVar234._24_4_ * fVar326;
            auVar56._28_4_ = auVar17._28_4_ + auVar20._28_4_;
            auVar251._8_4_ = 0x3f800000;
            auVar251._0_8_ = &DAT_3f8000003f800000;
            auVar251._12_4_ = 0x3f800000;
            auVar251._16_4_ = 0x3f800000;
            auVar251._20_4_ = 0x3f800000;
            auVar251._24_4_ = 0x3f800000;
            auVar251._28_4_ = 0x3f800000;
            auVar186 = vsubps_avx(auVar251,auVar213);
            local_e0 = vblendvps_avx(auVar186,auVar213,auVar232);
            auVar186 = vsubps_avx(auVar251,auVar56);
            auVar215 = ZEXT3264(auVar186);
            _local_540 = vblendvps_avx(auVar186,auVar56,auVar232);
            auVar158 = ZEXT3264(auVar268);
            local_360 = auVar55;
          }
        }
        auVar323 = ZEXT3264(local_720);
        auVar309 = ZEXT3264(auVar304);
        auVar186 = auVar158._0_32_;
        if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar186 >> 0x7f,0) != '\0') ||
              (auVar158 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar186 >> 0xbf,0) != '\0') ||
            (auVar158 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar158[0x1f] < '\0') {
          auVar22 = vsubps_avx(auVar359,auVar294);
          auVar215 = ZEXT3264(local_e0);
          fVar254 = auVar294._0_4_ + auVar22._0_4_ * local_e0._0_4_;
          fVar218 = auVar294._4_4_ + auVar22._4_4_ * local_e0._4_4_;
          fVar238 = auVar294._8_4_ + auVar22._8_4_ * local_e0._8_4_;
          fVar257 = auVar294._12_4_ + auVar22._12_4_ * local_e0._12_4_;
          fVar219 = auVar294._16_4_ + auVar22._16_4_ * local_e0._16_4_;
          fVar240 = auVar294._20_4_ + auVar22._20_4_ * local_e0._20_4_;
          fVar260 = auVar294._24_4_ + auVar22._24_4_ * local_e0._24_4_;
          fVar324 = auVar294._28_4_ + auVar22._28_4_;
          fVar237 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar57._4_4_ = (fVar218 + fVar218) * fVar237;
          auVar57._0_4_ = (fVar254 + fVar254) * fVar237;
          auVar57._8_4_ = (fVar238 + fVar238) * fVar237;
          auVar57._12_4_ = (fVar257 + fVar257) * fVar237;
          auVar57._16_4_ = (fVar219 + fVar219) * fVar237;
          auVar57._20_4_ = (fVar240 + fVar240) * fVar237;
          auVar57._24_4_ = (fVar260 + fVar260) * fVar237;
          auVar57._28_4_ = fVar324 + fVar324;
          auVar22 = vcmpps_avx(local_360,auVar57,6);
          auVar20 = auVar186 & auVar22;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            local_420 = vandps_avx(auVar22,auVar186);
            local_4c0._0_4_ = (float)local_540._0_4_ + (float)local_540._0_4_ + -1.0;
            local_4c0._4_4_ = (float)local_540._4_4_ + (float)local_540._4_4_ + -1.0;
            fStack_4b8 = (float)uStack_538 + (float)uStack_538 + -1.0;
            fStack_4b4 = uStack_538._4_4_ + uStack_538._4_4_ + -1.0;
            fStack_4b0 = (float)uStack_530 + (float)uStack_530 + -1.0;
            fStack_4ac = uStack_530._4_4_ + uStack_530._4_4_ + -1.0;
            fStack_4a8 = (float)uStack_528 + (float)uStack_528 + -1.0;
            fStack_4a4 = uStack_528._4_4_ + uStack_528._4_4_ + -1.0;
            local_4e0 = local_e0;
            local_4a0 = local_360;
            local_480 = 0;
            local_670._0_8_ = auVar249._0_8_;
            local_670._8_8_ = auVar249._8_8_;
            local_460 = local_670._0_8_;
            uStack_458 = local_670._8_8_;
            local_5f0._0_8_ = auVar18._0_8_;
            local_5f0._8_8_ = auVar18._8_8_;
            local_450 = local_5f0._0_8_;
            uStack_448 = local_5f0._8_8_;
            local_600._0_8_ = auVar19._0_8_;
            local_600._8_8_ = auVar19._8_8_;
            local_440 = local_600._0_8_;
            uStack_438 = local_600._8_8_;
            local_540._4_4_ = local_4c0._4_4_;
            local_540._0_4_ = local_4c0._0_4_;
            uStack_538._0_4_ = fStack_4b8;
            uStack_538._4_4_ = fStack_4b4;
            uStack_530._0_4_ = fStack_4b0;
            uStack_530._4_4_ = fStack_4ac;
            auVar180 = _local_540;
            uStack_528._0_4_ = fStack_4a8;
            uStack_528._4_4_ = fStack_4a4;
            auVar186 = _local_540;
            _local_540 = auVar186;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              bVar131 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar131 = true, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar195._0_4_ = 1.0 / local_5c0;
              auVar195._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar248 = vshufps_avx(auVar195,auVar195,0);
              local_400[0] = auVar248._0_4_ * (local_e0._0_4_ + 0.0);
              local_400[1] = auVar248._4_4_ * (local_e0._4_4_ + 1.0);
              local_400[2] = auVar248._8_4_ * (local_e0._8_4_ + 2.0);
              local_400[3] = auVar248._12_4_ * (local_e0._12_4_ + 3.0);
              fStack_3f0 = auVar248._0_4_ * (local_e0._16_4_ + 4.0);
              fStack_3ec = auVar248._4_4_ * (local_e0._20_4_ + 5.0);
              fStack_3e8 = auVar248._8_4_ * (local_e0._24_4_ + 6.0);
              fStack_3e4 = local_e0._28_4_ + 7.0;
              uStack_530 = auVar180._16_8_;
              uStack_528 = auVar186._24_8_;
              local_3e0 = local_540;
              uStack_3d8 = uStack_538;
              uStack_3d0 = uStack_530;
              uStack_3c8 = uStack_528;
              local_3c0 = local_360;
              iVar132 = vmovmskps_avx(local_420);
              local_920 = CONCAT44((int)((ulong)context >> 0x20),iVar132);
              uVar135 = 0;
              if (local_920 != 0) {
                for (; (local_920 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                }
              }
              bVar131 = iVar132 != 0;
              if (bVar131) {
                auVar248 = vshufps_avx(ZEXT416(uVar136),ZEXT416(uVar136),0);
                register0x00001210 = auVar248;
                _local_740 = auVar248;
                auVar248 = vshufps_avx(ZEXT416(uVar134),ZEXT416(uVar134),0);
                _auStack_6b0 = auVar248;
                _local_6c0 = auVar248;
                local_6e0 = (float)*(undefined8 *)*local_780;
                fStack_6dc = (float)((ulong)*(undefined8 *)*local_780 >> 0x20);
                fStack_6d8 = (float)*(undefined8 *)(*local_780 + 8);
                fStack_6d4 = (float)((ulong)*(undefined8 *)(*local_780 + 8) >> 0x20);
                fStack_6d0 = (float)*local_788;
                fStack_6cc = (float)((ulong)*local_788 >> 0x20);
                fStack_6c8 = (float)local_788[1];
                fStack_6c4 = (float)((ulong)local_788[1] >> 0x20);
                _local_700 = auVar304;
                _local_520 = *pauVar1;
                local_47c = uVar12;
                do {
                  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_220 = local_400[uVar135];
                  local_200 = *(undefined4 *)((long)&local_3e0 + uVar135 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar135 * 4);
                  fVar254 = 1.0 - local_220;
                  fVar237 = local_220 * fVar254 * 4.0;
                  auVar248 = ZEXT416((uint)(local_220 * local_220 * 0.5));
                  auVar248 = vshufps_avx(auVar248,auVar248,0);
                  local_800._0_4_ = auVar19._0_4_;
                  local_800._4_4_ = auVar19._4_4_;
                  uStack_7f8._0_4_ = auVar19._8_4_;
                  uStack_7f8._4_4_ = auVar19._12_4_;
                  auVar196 = ZEXT416((uint)((fVar254 * fVar254 + fVar237) * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  local_900._0_4_ = auVar18._0_4_;
                  local_900._4_4_ = auVar18._4_4_;
                  fStack_8f8 = auVar18._8_4_;
                  fStack_8f4 = auVar18._12_4_;
                  auVar144 = ZEXT416((uint)((-local_220 * local_220 - fVar237) * 0.5));
                  auVar144 = vshufps_avx(auVar144,auVar144,0);
                  local_7e0._0_4_ = auVar249._0_4_;
                  local_7e0._4_4_ = auVar249._4_4_;
                  fStack_7d8 = auVar249._8_4_;
                  fStack_7d4 = auVar249._12_4_;
                  local_770.context = context->user;
                  auVar145 = ZEXT416((uint)(fVar254 * -fVar254 * 0.5));
                  auVar145 = vshufps_avx(auVar145,auVar145,0);
                  auVar197._0_4_ =
                       local_970 * auVar145._0_4_ +
                       auVar144._0_4_ * (float)local_7e0._0_4_ +
                       auVar248._0_4_ * (float)local_800._0_4_ +
                       auVar196._0_4_ * (float)local_900._0_4_;
                  auVar197._4_4_ =
                       fStack_96c * auVar145._4_4_ +
                       auVar144._4_4_ * (float)local_7e0._4_4_ +
                       auVar248._4_4_ * (float)local_800._4_4_ +
                       auVar196._4_4_ * (float)local_900._4_4_;
                  auVar197._8_4_ =
                       fStack_968 * auVar145._8_4_ +
                       auVar144._8_4_ * fStack_7d8 +
                       auVar248._8_4_ * (float)uStack_7f8 + auVar196._8_4_ * fStack_8f8;
                  auVar197._12_4_ =
                       fStack_964 * auVar145._12_4_ +
                       auVar144._12_4_ * fStack_7d4 +
                       auVar248._12_4_ * uStack_7f8._4_4_ + auVar196._12_4_ * fStack_8f4;
                  local_270 = vshufps_avx(auVar197,auVar197,0);
                  local_280[0] = (RTCHitN)local_270[0];
                  local_280[1] = (RTCHitN)local_270[1];
                  local_280[2] = (RTCHitN)local_270[2];
                  local_280[3] = (RTCHitN)local_270[3];
                  local_280[4] = (RTCHitN)local_270[4];
                  local_280[5] = (RTCHitN)local_270[5];
                  local_280[6] = (RTCHitN)local_270[6];
                  local_280[7] = (RTCHitN)local_270[7];
                  local_280[8] = (RTCHitN)local_270[8];
                  local_280[9] = (RTCHitN)local_270[9];
                  local_280[10] = (RTCHitN)local_270[10];
                  local_280[0xb] = (RTCHitN)local_270[0xb];
                  local_280[0xc] = (RTCHitN)local_270[0xc];
                  local_280[0xd] = (RTCHitN)local_270[0xd];
                  local_280[0xe] = (RTCHitN)local_270[0xe];
                  local_280[0xf] = (RTCHitN)local_270[0xf];
                  local_250 = vshufps_avx(auVar197,auVar197,0x55);
                  auVar215 = ZEXT1664(local_250);
                  local_260 = local_250;
                  local_230 = vshufps_avx(auVar197,auVar197,0xaa);
                  local_240 = local_230;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_6c0;
                  uStack_1d8 = uStack_6b8;
                  uStack_1d0 = auStack_6b0;
                  uStack_1c8 = uStack_6a8;
                  local_1c0 = local_740;
                  uStack_1b8 = uStack_738;
                  uStack_1b0 = uStack_730;
                  uStack_1a8 = uStack_728;
                  auVar186 = vcmpps_avx(auVar188._0_32_,auVar188._0_32_,0xf);
                  local_778[1] = auVar186;
                  *local_778 = auVar186;
                  local_1a0 = (local_770.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_770.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_7c0 = CONCAT44(fStack_6dc,local_6e0);
                  uStack_7b8 = CONCAT44(fStack_6d4,fStack_6d8);
                  uStack_7b0 = CONCAT44(fStack_6cc,fStack_6d0);
                  uStack_7a8 = CONCAT44(fStack_6c4,fStack_6c8);
                  local_770.valid = (int *)&local_7c0;
                  local_770.geometryUserPtr = *(void **)(local_640._0_8_ + 0x18);
                  local_770.hit = local_280;
                  local_770.N = 8;
                  local_770.ray = (RTCRayN *)ray;
                  if (*(code **)(local_640._0_8_ + 0x48) != (code *)0x0) {
                    auVar215 = ZEXT1664(local_250);
                    (**(code **)(local_640._0_8_ + 0x48))(&local_770);
                    auVar309 = ZEXT3264(_local_700);
                    auVar323 = ZEXT3264(local_720);
                    auVar188 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar110._8_8_ = uStack_7b8;
                  auVar110._0_8_ = local_7c0;
                  auVar248 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar110);
                  auVar114._8_8_ = uStack_7a8;
                  auVar114._0_8_ = uStack_7b0;
                  auVar196 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar114);
                  auVar151._16_16_ = auVar196;
                  auVar151._0_16_ = auVar248;
                  auVar22 = auVar186 & ~auVar151;
                  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar22 >> 0x7f,0) == '\0') &&
                        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar22 >> 0xbf,0) == '\0') &&
                      (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar22[0x1f]) {
                    auVar152._0_4_ = auVar248._0_4_ ^ auVar186._0_4_;
                    auVar152._4_4_ = auVar248._4_4_ ^ auVar186._4_4_;
                    auVar152._8_4_ = auVar248._8_4_ ^ auVar186._8_4_;
                    auVar152._12_4_ = auVar248._12_4_ ^ auVar186._12_4_;
                    auVar152._16_4_ = auVar196._0_4_ ^ auVar186._16_4_;
                    auVar152._20_4_ = auVar196._4_4_ ^ auVar186._20_4_;
                    auVar152._24_4_ = auVar196._8_4_ ^ auVar186._24_4_;
                    auVar152._28_4_ = auVar196._12_4_ ^ auVar186._28_4_;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_640._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar215 = ZEXT1664(auVar215._0_16_);
                      (*p_Var14)(&local_770);
                      auVar309 = ZEXT3264(_local_700);
                      auVar323 = ZEXT3264(local_720);
                      auVar188 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar111._8_8_ = uStack_7b8;
                    auVar111._0_8_ = local_7c0;
                    auVar248 = vpcmpeqd_avx((undefined1  [16])0x0,auVar111);
                    auVar115._8_8_ = uStack_7a8;
                    auVar115._0_8_ = uStack_7b0;
                    auVar196 = vpcmpeqd_avx((undefined1  [16])0x0,auVar115);
                    auVar182._16_16_ = auVar196;
                    auVar182._0_16_ = auVar248;
                    auVar152._0_4_ = auVar248._0_4_ ^ auVar186._0_4_;
                    auVar152._4_4_ = auVar248._4_4_ ^ auVar186._4_4_;
                    auVar152._8_4_ = auVar248._8_4_ ^ auVar186._8_4_;
                    auVar152._12_4_ = auVar248._12_4_ ^ auVar186._12_4_;
                    auVar152._16_4_ = auVar196._0_4_ ^ auVar186._16_4_;
                    auVar152._20_4_ = auVar196._4_4_ ^ auVar186._20_4_;
                    auVar152._24_4_ = auVar196._8_4_ ^ auVar186._24_4_;
                    auVar152._28_4_ = auVar196._12_4_ ^ auVar186._28_4_;
                    auVar201._8_4_ = 0xff800000;
                    auVar201._0_8_ = 0xff800000ff800000;
                    auVar201._12_4_ = 0xff800000;
                    auVar201._16_4_ = 0xff800000;
                    auVar201._20_4_ = 0xff800000;
                    auVar201._24_4_ = 0xff800000;
                    auVar201._28_4_ = 0xff800000;
                    auVar186 = vblendvps_avx(auVar201,*(undefined1 (*) [32])(local_770.ray + 0x100),
                                             auVar182);
                    *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar186;
                  }
                  auVar304 = auVar309._0_32_;
                  if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar152 >> 0x7f,0) != '\0') ||
                        (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar152 >> 0xbf,0) != '\0') ||
                      (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar152[0x1f] < '\0') break;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
                  local_920 = local_920 ^ 1L << (uVar135 & 0x3f);
                  uVar135 = 0;
                  if (local_920 != 0) {
                    for (; (local_920 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                    }
                  }
                  bVar131 = local_920 != 0;
                } while (bVar131);
              }
            }
            goto LAB_00f085c3;
          }
        }
        bVar131 = false;
      }
LAB_00f085c3:
      auVar188 = ZEXT1664(auVar198);
      if (8 < (int)uVar12) {
        _local_520 = vpshufd_avx(ZEXT416(uVar12),0);
        auVar248 = vshufps_avx(auVar198,auVar198,0);
        local_640._16_16_ = auVar248;
        local_640._0_16_ = auVar248;
        auVar248 = vpermilps_avx(ZEXT416(uVar10),0);
        local_100._16_16_ = auVar248;
        local_100._0_16_ = auVar248;
        auVar147._0_4_ = 1.0 / local_5c0;
        auVar147._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar248 = vshufps_avx(auVar147,auVar147,0);
        register0x00001210 = auVar248;
        _local_160 = auVar248;
        auVar248 = vshufps_avx(ZEXT416(uVar136),ZEXT416(uVar136),0);
        local_120._16_16_ = auVar248;
        local_120._0_16_ = auVar248;
        auVar248 = vshufps_avx(ZEXT416((uint)local_5e0._0_4_),ZEXT416((uint)local_5e0._0_4_),0);
        local_140._16_16_ = auVar248;
        local_140._0_16_ = auVar248;
        auVar158 = ZEXT3264(local_140);
        lVar138 = 8;
        fVar237 = (float)local_6a0._0_4_;
        fVar254 = (float)local_6a0._4_4_;
        fVar218 = fStack_698;
        fVar238 = fStack_694;
        fVar257 = fStack_690;
        fVar219 = fStack_68c;
        fVar240 = fStack_688;
        fVar260 = fStack_684;
        _local_700 = auVar304;
        do {
          auVar19 = local_5f0;
          auVar18 = local_600;
          pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar138 * 4 + lVar133);
          fVar324 = *(float *)*pauVar2;
          fVar217 = *(float *)(*pauVar2 + 4);
          fVar326 = *(float *)(*pauVar2 + 8);
          fVar220 = *(float *)(*pauVar2 + 0xc);
          fVar327 = *(float *)(*pauVar2 + 0x10);
          fVar223 = *(float *)(*pauVar2 + 0x14);
          fVar329 = *(float *)(*pauVar2 + 0x18);
          auVar127 = *pauVar2;
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x222bfac + lVar138 * 4);
          fVar263 = *(float *)*pauVar4;
          fVar330 = *(float *)(*pauVar4 + 4);
          fVar328 = *(float *)(*pauVar4 + 8);
          fVar331 = *(float *)(*pauVar4 + 0xc);
          fVar221 = *(float *)(*pauVar4 + 0x10);
          fVar333 = *(float *)(*pauVar4 + 0x14);
          fVar332 = *(float *)(*pauVar4 + 0x18);
          auVar126 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x222c430 + lVar138 * 4);
          fVar289 = *(float *)*pauVar4;
          fVar222 = *(float *)(*pauVar4 + 4);
          fVar300 = *(float *)(*pauVar4 + 8);
          fVar298 = *(float *)(*pauVar4 + 0xc);
          fVar299 = *(float *)(*pauVar4 + 0x10);
          fVar224 = *(float *)(*pauVar4 + 0x14);
          fVar192 = *(float *)(*pauVar4 + 0x18);
          auVar124 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x222c8b4 + lVar138 * 4);
          fVar142 = *(float *)*pauVar4;
          fVar160 = *(float *)(*pauVar4 + 4);
          fVar162 = *(float *)(*pauVar4 + 8);
          fVar164 = *(float *)(*pauVar4 + 0xc);
          fVar166 = *(float *)(*pauVar4 + 0x10);
          fVar168 = *(float *)(*pauVar4 + 0x14);
          fVar170 = *(float *)(*pauVar4 + 0x18);
          auVar123 = *pauVar4;
          fVar159 = auVar323._0_4_;
          fVar161 = auVar323._4_4_;
          fVar163 = auVar323._8_4_;
          fVar165 = auVar323._12_4_;
          fVar167 = auVar323._16_4_;
          fVar169 = auVar323._20_4_;
          fVar171 = auVar323._24_4_;
          fVar273 = auVar215._28_4_;
          fVar204 = fVar273 + *(float *)pauVar4[1];
          fVar172 = fVar273 + fVar273 + auVar158._28_4_;
          fVar141 = fVar273 + fVar204;
          auVar214._0_4_ =
               (float)local_580._0_4_ * fVar324 +
               (float)local_340._0_4_ * fVar263 +
               fVar289 * fVar237 + (float)local_5a0._0_4_ * fVar142;
          auVar214._4_4_ =
               (float)local_580._4_4_ * fVar217 +
               (float)local_340._4_4_ * fVar330 +
               fVar222 * fVar254 + (float)local_5a0._4_4_ * fVar160;
          auVar214._8_4_ =
               fStack_578 * fVar326 +
               fStack_338 * fVar328 + fVar300 * fVar218 + fStack_598 * fVar162;
          auVar214._12_4_ =
               fStack_574 * fVar220 +
               fStack_334 * fVar331 + fVar298 * fVar238 + fStack_594 * fVar164;
          auVar214._16_4_ =
               fStack_570 * fVar327 +
               fStack_330 * fVar221 + fVar299 * fVar257 + fStack_590 * fVar166;
          auVar214._20_4_ =
               fStack_56c * fVar223 +
               fStack_32c * fVar333 + fVar224 * fVar219 + fStack_58c * fVar168;
          auVar214._24_4_ =
               fStack_568 * fVar329 +
               fStack_328 * fVar332 + fVar192 * fVar240 + fStack_588 * fVar170;
          auVar214._28_4_ = fVar204 + fVar172;
          auVar215 = ZEXT3264(auVar214);
          auVar202._0_4_ =
               (float)local_2c0._0_4_ * fVar324 +
               (float)local_2a0._0_4_ * fVar263 + fVar243 * fVar289 + fVar159 * fVar142;
          auVar202._4_4_ =
               (float)local_2c0._4_4_ * fVar217 +
               (float)local_2a0._4_4_ * fVar330 + fVar255 * fVar222 + fVar161 * fVar160;
          auVar202._8_4_ =
               fStack_2b8 * fVar326 + fStack_298 * fVar328 + fVar258 * fVar300 + fVar163 * fVar162;
          auVar202._12_4_ =
               fStack_2b4 * fVar220 + fStack_294 * fVar331 + fVar261 * fVar298 + fVar165 * fVar164;
          auVar202._16_4_ =
               fStack_2b0 * fVar327 + fStack_290 * fVar221 + fVar243 * fVar299 + fVar167 * fVar166;
          auVar202._20_4_ =
               fStack_2ac * fVar223 + fStack_28c * fVar333 + fVar255 * fVar224 + fVar169 * fVar168;
          auVar202._24_4_ =
               fStack_2a8 * fVar329 + fStack_288 * fVar332 + fVar258 * fVar192 + fVar171 * fVar170;
          auVar202._28_4_ = fVar172 + fVar273 + fVar273 + auVar188._28_4_;
          fVar142 = fVar324 * (float)local_320._0_4_ +
                    fVar263 * (float)local_300._0_4_ +
                    fVar289 * (float)local_2e0._0_4_ + (float)local_80._0_4_ * fVar142;
          fVar160 = fVar217 * (float)local_320._4_4_ +
                    fVar330 * (float)local_300._4_4_ +
                    fVar222 * (float)local_2e0._4_4_ + (float)local_80._4_4_ * fVar160;
          fVar162 = fVar326 * fStack_318 +
                    fVar328 * fStack_2f8 + fVar300 * fStack_2d8 + fStack_78 * fVar162;
          fVar164 = fVar220 * fStack_314 +
                    fVar331 * fStack_2f4 + fVar298 * fStack_2d4 + fStack_74 * fVar164;
          fVar166 = fVar327 * fStack_310 +
                    fVar221 * fStack_2f0 + fVar299 * fStack_2d0 + fStack_70 * fVar166;
          fVar168 = fVar223 * fStack_30c +
                    fVar333 * fStack_2ec + fVar224 * fStack_2cc + fStack_6c * fVar168;
          fVar170 = fVar329 * fStack_308 +
                    fVar332 * fStack_2e8 + fVar192 * fStack_2c8 + fStack_68 * fVar170;
          fVar172 = fVar172 + fVar141;
          auVar180 = *(undefined1 (*) [24])(bspline_basis1 + lVar138 * 4 + lVar133);
          uVar105 = *(undefined8 *)
                     ((undefined1 (*) [24])(bspline_basis1 + lVar138 * 4 + lVar133))[1];
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x222e3cc + lVar138 * 4);
          fVar263 = *(float *)*pauVar4;
          fVar330 = *(float *)(*pauVar4 + 4);
          fVar328 = *(float *)(*pauVar4 + 8);
          fVar331 = *(float *)(*pauVar4 + 0xc);
          fVar221 = *(float *)(*pauVar4 + 0x10);
          fVar333 = *(float *)(*pauVar4 + 0x14);
          fVar332 = *(float *)(*pauVar4 + 0x18);
          auVar128 = *pauVar4;
          auVar186 = *(undefined1 (*) [32])(lVar133 + 0x222e850 + lVar138 * 4);
          pfVar5 = (float *)(lVar133 + 0x222ecd4 + lVar138 * 4);
          fVar289 = *pfVar5;
          fVar222 = pfVar5[1];
          fVar300 = pfVar5[2];
          fVar298 = pfVar5[3];
          fVar299 = pfVar5[4];
          fVar224 = pfVar5[5];
          fVar192 = pfVar5[6];
          auVar158 = ZEXT3264(auVar186);
          fVar324 = auVar186._0_4_;
          fVar217 = auVar186._4_4_;
          fVar326 = auVar186._8_4_;
          fVar220 = auVar186._12_4_;
          fVar327 = auVar186._16_4_;
          fVar223 = auVar186._20_4_;
          fVar329 = auVar186._24_4_;
          fVar273 = fVar260 + fStack_64;
          fVar204 = fVar260 + fVar260 + fVar141;
          local_960 = auVar180._0_4_;
          fStack_95c = auVar180._4_4_;
          fStack_958 = auVar180._8_4_;
          fStack_954 = auVar180._12_4_;
          fStack_950 = auVar180._16_4_;
          fStack_94c = auVar180._20_4_;
          fStack_948 = (float)uVar105;
          fStack_944 = (float)((ulong)uVar105 >> 0x20);
          auVar295._0_4_ =
               (float)local_580._0_4_ * local_960 +
               (float)local_340._0_4_ * fVar263 +
               fVar237 * fVar324 + (float)local_5a0._0_4_ * fVar289;
          auVar295._4_4_ =
               (float)local_580._4_4_ * fStack_95c +
               (float)local_340._4_4_ * fVar330 +
               fVar254 * fVar217 + (float)local_5a0._4_4_ * fVar222;
          auVar295._8_4_ =
               fStack_578 * fStack_958 +
               fStack_338 * fVar328 + fVar218 * fVar326 + fStack_598 * fVar300;
          auVar295._12_4_ =
               fStack_574 * fStack_954 +
               fStack_334 * fVar331 + fVar238 * fVar220 + fStack_594 * fVar298;
          auVar295._16_4_ =
               fStack_570 * fStack_950 +
               fStack_330 * fVar221 + fVar257 * fVar327 + fStack_590 * fVar299;
          auVar295._20_4_ =
               fStack_56c * fStack_94c +
               fStack_32c * fVar333 + fVar219 * fVar223 + fStack_58c * fVar224;
          auVar295._24_4_ =
               fStack_568 * fStack_948 +
               fStack_328 * fVar332 + fVar240 * fVar329 + fStack_588 * fVar192;
          auVar295._28_4_ = fVar273 + fVar204;
          auVar252._0_4_ =
               (float)local_2c0._0_4_ * local_960 +
               (float)local_2a0._0_4_ * fVar263 + fVar243 * fVar324 + fVar159 * fVar289;
          auVar252._4_4_ =
               (float)local_2c0._4_4_ * fStack_95c +
               (float)local_2a0._4_4_ * fVar330 + fVar255 * fVar217 + fVar161 * fVar222;
          auVar252._8_4_ =
               fStack_2b8 * fStack_958 +
               fStack_298 * fVar328 + fVar258 * fVar326 + fVar163 * fVar300;
          auVar252._12_4_ =
               fStack_2b4 * fStack_954 +
               fStack_294 * fVar331 + fVar261 * fVar220 + fVar165 * fVar298;
          auVar252._16_4_ =
               fStack_2b0 * fStack_950 +
               fStack_290 * fVar221 + fVar243 * fVar327 + fVar167 * fVar299;
          auVar252._20_4_ =
               fStack_2ac * fStack_94c +
               fStack_28c * fVar333 + fVar255 * fVar223 + fVar169 * fVar224;
          auVar252._24_4_ =
               fStack_2a8 * fStack_948 +
               fStack_288 * fVar332 + fVar258 * fVar329 + fVar171 * fVar192;
          auVar252._28_4_ = fVar204 + fVar260 + fVar260 + *(float *)pauVar2[1];
          auVar281._0_4_ =
               fVar263 * (float)local_300._0_4_ +
               fVar324 * (float)local_2e0._0_4_ + (float)local_80._0_4_ * fVar289 +
               local_960 * (float)local_320._0_4_;
          auVar281._4_4_ =
               fVar330 * (float)local_300._4_4_ +
               fVar217 * (float)local_2e0._4_4_ + (float)local_80._4_4_ * fVar222 +
               fStack_95c * (float)local_320._4_4_;
          auVar281._8_4_ =
               fVar328 * fStack_2f8 + fVar326 * fStack_2d8 + fStack_78 * fVar300 +
               fStack_958 * fStack_318;
          auVar281._12_4_ =
               fVar331 * fStack_2f4 + fVar220 * fStack_2d4 + fStack_74 * fVar298 +
               fStack_954 * fStack_314;
          auVar281._16_4_ =
               fVar221 * fStack_2f0 + fVar327 * fStack_2d0 + fStack_70 * fVar299 +
               fStack_950 * fStack_310;
          auVar281._20_4_ =
               fVar333 * fStack_2ec + fVar223 * fStack_2cc + fStack_6c * fVar224 +
               fStack_94c * fStack_30c;
          auVar281._24_4_ =
               fVar332 * fStack_2e8 + fVar329 * fStack_2c8 + fStack_68 * fVar192 +
               fStack_948 * fStack_308;
          auVar281._28_4_ = fVar260 + fVar273 + fVar204;
          auVar20 = vsubps_avx(auVar295,auVar214);
          auVar21 = vsubps_avx(auVar252,auVar202);
          fVar260 = auVar20._0_4_;
          fVar263 = auVar20._4_4_;
          auVar58._4_4_ = fVar263 * auVar202._4_4_;
          auVar58._0_4_ = fVar260 * auVar202._0_4_;
          fVar330 = auVar20._8_4_;
          auVar58._8_4_ = fVar330 * auVar202._8_4_;
          fVar328 = auVar20._12_4_;
          auVar58._12_4_ = fVar328 * auVar202._12_4_;
          fVar331 = auVar20._16_4_;
          auVar58._16_4_ = fVar331 * auVar202._16_4_;
          fVar221 = auVar20._20_4_;
          auVar58._20_4_ = fVar221 * auVar202._20_4_;
          fVar333 = auVar20._24_4_;
          auVar58._24_4_ = fVar333 * auVar202._24_4_;
          auVar58._28_4_ = fVar204;
          fVar237 = auVar21._0_4_;
          fVar254 = auVar21._4_4_;
          auVar59._4_4_ = fVar254 * auVar214._4_4_;
          auVar59._0_4_ = fVar237 * auVar214._0_4_;
          fVar218 = auVar21._8_4_;
          auVar59._8_4_ = fVar218 * auVar214._8_4_;
          fVar238 = auVar21._12_4_;
          auVar59._12_4_ = fVar238 * auVar214._12_4_;
          fVar257 = auVar21._16_4_;
          auVar59._16_4_ = fVar257 * auVar214._16_4_;
          fVar219 = auVar21._20_4_;
          auVar59._20_4_ = fVar219 * auVar214._20_4_;
          fVar240 = auVar21._24_4_;
          auVar59._24_4_ = fVar240 * auVar214._24_4_;
          auVar59._28_4_ = auVar252._28_4_;
          auVar27 = vsubps_avx(auVar58,auVar59);
          auVar109._4_4_ = fVar160;
          auVar109._0_4_ = fVar142;
          auVar109._8_4_ = fVar162;
          auVar109._12_4_ = fVar164;
          auVar109._16_4_ = fVar166;
          auVar109._20_4_ = fVar168;
          auVar109._24_4_ = fVar170;
          auVar109._28_4_ = fVar172;
          auVar22 = vmaxps_avx(auVar109,auVar281);
          auVar60._4_4_ = auVar22._4_4_ * auVar22._4_4_ * (fVar263 * fVar263 + fVar254 * fVar254);
          auVar60._0_4_ = auVar22._0_4_ * auVar22._0_4_ * (fVar260 * fVar260 + fVar237 * fVar237);
          auVar60._8_4_ = auVar22._8_4_ * auVar22._8_4_ * (fVar330 * fVar330 + fVar218 * fVar218);
          auVar60._12_4_ = auVar22._12_4_ * auVar22._12_4_ * (fVar328 * fVar328 + fVar238 * fVar238)
          ;
          auVar60._16_4_ = auVar22._16_4_ * auVar22._16_4_ * (fVar331 * fVar331 + fVar257 * fVar257)
          ;
          auVar60._20_4_ = auVar22._20_4_ * auVar22._20_4_ * (fVar221 * fVar221 + fVar219 * fVar219)
          ;
          auVar60._24_4_ = auVar22._24_4_ * auVar22._24_4_ * (fVar333 * fVar333 + fVar240 * fVar240)
          ;
          auVar60._28_4_ = fVar273 + auVar252._28_4_;
          auVar61._4_4_ = auVar27._4_4_ * auVar27._4_4_;
          auVar61._0_4_ = auVar27._0_4_ * auVar27._0_4_;
          auVar61._8_4_ = auVar27._8_4_ * auVar27._8_4_;
          auVar61._12_4_ = auVar27._12_4_ * auVar27._12_4_;
          auVar61._16_4_ = auVar27._16_4_ * auVar27._16_4_;
          auVar61._20_4_ = auVar27._20_4_ * auVar27._20_4_;
          auVar61._24_4_ = auVar27._24_4_ * auVar27._24_4_;
          auVar61._28_4_ = auVar27._28_4_;
          auVar22 = vcmpps_avx(auVar61,auVar60,2);
          local_480 = (uint)lVar138;
          auVar249 = vpshufd_avx(ZEXT416(local_480),0);
          auVar248 = vpor_avx(auVar249,_DAT_01ff0cf0);
          auVar249 = vpor_avx(auVar249,_DAT_02020ea0);
          auVar248 = vpcmpgtd_avx(_local_520,auVar248);
          auVar249 = vpcmpgtd_avx(_local_520,auVar249);
          auVar183._16_16_ = auVar249;
          auVar183._0_16_ = auVar248;
          auVar188 = ZEXT3264(auVar183);
          auVar27 = auVar183 & auVar22;
          fVar237 = (float)local_6a0._0_4_;
          fVar254 = (float)local_6a0._4_4_;
          fVar218 = fStack_698;
          fVar238 = fStack_694;
          fVar257 = fStack_690;
          fVar219 = fStack_68c;
          fVar240 = fStack_688;
          fVar260 = fStack_684;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
            auVar323 = ZEXT3264(auVar323._0_32_);
          }
          else {
            local_800._0_4_ = auVar128._0_4_;
            local_800._4_4_ = auVar128._4_4_;
            uStack_7f8._0_4_ = auVar128._8_4_;
            uStack_7f8._4_4_ = auVar128._12_4_;
            fStack_7f0 = auVar128._16_4_;
            fStack_7ec = auVar128._20_4_;
            fStack_7e8 = auVar128._24_4_;
            local_6e0 = local_960 * (float)local_700._0_4_ +
                        (float)local_a0._0_4_ * (float)local_800._0_4_ +
                        (float)local_c0._0_4_ * fVar324 + fVar205 * fVar289;
            fStack_6dc = fStack_95c * (float)local_700._4_4_ +
                         (float)local_a0._4_4_ * (float)local_800._4_4_ +
                         (float)local_c0._4_4_ * fVar217 + fVar225 * fVar222;
            fStack_6d8 = fStack_958 * fStack_6f8 +
                         fStack_98 * (float)uStack_7f8 + fStack_b8 * fVar326 + fVar242 * fVar300;
            fStack_6d4 = fStack_954 * fStack_6f4 +
                         fStack_94 * uStack_7f8._4_4_ + fStack_b4 * fVar220 + fVar216 * fVar298;
            fStack_6d0 = fStack_950 * fStack_6f0 +
                         fStack_90 * fStack_7f0 + fStack_b0 * fVar327 + fVar205 * fVar299;
            fStack_6cc = fStack_94c * fStack_6ec +
                         fStack_8c * fStack_7ec + fStack_ac * fVar223 + fVar225 * fVar224;
            fStack_6c8 = fStack_948 * fStack_6e8 +
                         fStack_88 * fStack_7e8 + fStack_a8 * fVar329 + fVar242 * fVar192;
            fStack_6c4 = fStack_564 + auVar186._28_4_ + auVar249._12_4_ + 0.0;
            local_6c0._0_4_ = auVar126._0_4_;
            local_6c0._4_4_ = auVar126._4_4_;
            uStack_6b8._0_4_ = auVar126._8_4_;
            uStack_6b8._4_4_ = auVar126._12_4_;
            auStack_6b0._0_4_ = auVar126._16_4_;
            auStack_6b0._4_4_ = auVar126._20_4_;
            uStack_6a8._0_4_ = auVar126._24_4_;
            local_7e0._0_4_ = auVar124._0_4_;
            local_7e0._4_4_ = auVar124._4_4_;
            fStack_7d8 = auVar124._8_4_;
            fStack_7d4 = auVar124._12_4_;
            fStack_7d0 = auVar124._16_4_;
            fStack_7cc = auVar124._20_4_;
            fStack_7c8 = auVar124._24_4_;
            local_900._0_4_ = auVar123._0_4_;
            local_900._4_4_ = auVar123._4_4_;
            fStack_8f8 = auVar123._8_4_;
            fStack_8f4 = auVar123._12_4_;
            fStack_8f0 = auVar123._16_4_;
            fStack_8ec = auVar123._20_4_;
            fStack_8e8 = auVar123._24_4_;
            pfVar5 = (float *)(lVar133 + 0x222d640 + lVar138 * 4);
            fVar324 = *pfVar5;
            fVar217 = pfVar5[1];
            fVar326 = pfVar5[2];
            fVar220 = pfVar5[3];
            fVar327 = pfVar5[4];
            fVar223 = pfVar5[5];
            fVar329 = pfVar5[6];
            pfVar6 = (float *)(lVar133 + 0x222dac4 + lVar138 * 4);
            fVar263 = *pfVar6;
            fVar330 = pfVar6[1];
            fVar328 = pfVar6[2];
            fVar331 = pfVar6[3];
            fVar221 = pfVar6[4];
            fVar333 = pfVar6[5];
            fVar332 = pfVar6[6];
            pfVar7 = (float *)(lVar133 + 0x222d1bc + lVar138 * 4);
            fVar289 = *pfVar7;
            fVar222 = pfVar7[1];
            fVar300 = pfVar7[2];
            fVar298 = pfVar7[3];
            fVar299 = pfVar7[4];
            fVar224 = pfVar7[5];
            fVar192 = pfVar7[6];
            fVar173 = pfVar5[7] + pfVar6[7];
            fStack_5a4 = pfVar6[7] + fStack_944 + 0.0;
            fVar274 = fStack_944 + fStack_284 + fStack_944 + 0.0;
            pfVar5 = (float *)(lVar133 + 0x222cd38 + lVar138 * 4);
            fVar204 = *pfVar5;
            fVar273 = pfVar5[1];
            fVar141 = pfVar5[2];
            fVar174 = pfVar5[3];
            fVar189 = pfVar5[4];
            fVar190 = pfVar5[5];
            fVar191 = pfVar5[6];
            local_620 = fVar204 * (float)local_580._0_4_ +
                        fVar289 * (float)local_340._0_4_ +
                        (float)local_6a0._0_4_ * fVar324 + (float)local_5a0._0_4_ * fVar263;
            fStack_61c = fVar273 * (float)local_580._4_4_ +
                         fVar222 * (float)local_340._4_4_ +
                         (float)local_6a0._4_4_ * fVar217 + (float)local_5a0._4_4_ * fVar330;
            fStack_618 = fVar141 * fStack_578 +
                         fVar300 * fStack_338 + fStack_698 * fVar326 + fStack_598 * fVar328;
            fStack_614 = fVar174 * fStack_574 +
                         fVar298 * fStack_334 + fStack_694 * fVar220 + fStack_594 * fVar331;
            fStack_610 = fVar189 * fStack_570 +
                         fVar299 * fStack_330 + fStack_690 * fVar327 + fStack_590 * fVar221;
            fStack_60c = fVar190 * fStack_56c +
                         fVar224 * fStack_32c + fStack_68c * fVar223 + fStack_58c * fVar333;
            fStack_608 = fVar191 * fStack_568 +
                         fVar192 * fStack_328 + fStack_688 * fVar329 + fStack_588 * fVar332;
            fStack_604 = fVar173 + fStack_5a4;
            local_5c0 = (float)local_2c0._0_4_ * fVar204 +
                        fVar243 * fVar324 + fVar159 * fVar263 + (float)local_2a0._0_4_ * fVar289;
            fStack_5bc = (float)local_2c0._4_4_ * fVar273 +
                         fVar255 * fVar217 + fVar161 * fVar330 + (float)local_2a0._4_4_ * fVar222;
            fStack_5b8 = fStack_2b8 * fVar141 +
                         fVar258 * fVar326 + fVar163 * fVar328 + fStack_298 * fVar300;
            fStack_5b4 = fStack_2b4 * fVar174 +
                         fVar261 * fVar220 + fVar165 * fVar331 + fStack_294 * fVar298;
            fStack_5b0 = fStack_2b0 * fVar189 +
                         fVar243 * fVar327 + fVar167 * fVar221 + fStack_290 * fVar299;
            fStack_5ac = fStack_2ac * fVar190 +
                         fVar255 * fVar223 + fVar169 * fVar333 + fStack_28c * fVar224;
            fStack_5a8 = fStack_2a8 * fVar191 +
                         fVar258 * fVar329 + fVar171 * fVar332 + fStack_288 * fVar192;
            fStack_5a4 = fStack_5a4 + fVar274;
            auVar342._0_4_ =
                 fVar289 * (float)local_a0._0_4_ +
                 (float)local_c0._0_4_ * fVar324 + fVar205 * fVar263 +
                 fVar204 * (float)local_700._0_4_;
            auVar342._4_4_ =
                 fVar222 * (float)local_a0._4_4_ +
                 (float)local_c0._4_4_ * fVar217 + fVar225 * fVar330 +
                 fVar273 * (float)local_700._4_4_;
            auVar342._8_4_ =
                 fVar300 * fStack_98 + fStack_b8 * fVar326 + fVar242 * fVar328 +
                 fVar141 * fStack_6f8;
            auVar342._12_4_ =
                 fVar298 * fStack_94 + fStack_b4 * fVar220 + fVar216 * fVar331 +
                 fVar174 * fStack_6f4;
            auVar342._16_4_ =
                 fVar299 * fStack_90 + fStack_b0 * fVar327 + fVar205 * fVar221 +
                 fVar189 * fStack_6f0;
            auVar342._20_4_ =
                 fVar224 * fStack_8c + fStack_ac * fVar223 + fVar225 * fVar333 +
                 fVar190 * fStack_6ec;
            auVar342._24_4_ =
                 fVar192 * fStack_88 + fStack_a8 * fVar329 + fVar242 * fVar332 +
                 fVar191 * fStack_6e8;
            auVar342._28_4_ = pfVar7[7] + fVar173 + fVar274;
            pfVar5 = (float *)(lVar133 + 0x222fa60 + lVar138 * 4);
            fVar324 = *pfVar5;
            fVar217 = pfVar5[1];
            fVar326 = pfVar5[2];
            fVar220 = pfVar5[3];
            fVar327 = pfVar5[4];
            fVar223 = pfVar5[5];
            fVar329 = pfVar5[6];
            pfVar6 = (float *)(lVar133 + 0x222fee4 + lVar138 * 4);
            fVar263 = *pfVar6;
            fVar330 = pfVar6[1];
            fVar328 = pfVar6[2];
            fVar331 = pfVar6[3];
            fVar221 = pfVar6[4];
            fVar333 = pfVar6[5];
            fVar332 = pfVar6[6];
            pfVar7 = (float *)(lVar133 + 0x222f5dc + lVar138 * 4);
            fVar289 = *pfVar7;
            fVar222 = pfVar7[1];
            fVar300 = pfVar7[2];
            fVar298 = pfVar7[3];
            fVar299 = pfVar7[4];
            fVar224 = pfVar7[5];
            fVar192 = pfVar7[6];
            pfVar8 = (float *)(lVar133 + 0x222f158 + lVar138 * 4);
            fVar204 = *pfVar8;
            fVar273 = pfVar8[1];
            fVar141 = pfVar8[2];
            fVar174 = pfVar8[3];
            fVar189 = pfVar8[4];
            fVar190 = pfVar8[5];
            fVar191 = pfVar8[6];
            auVar307._0_4_ =
                 fVar204 * (float)local_580._0_4_ +
                 fVar289 * (float)local_340._0_4_ +
                 (float)local_6a0._0_4_ * fVar324 + (float)local_5a0._0_4_ * fVar263;
            auVar307._4_4_ =
                 fVar273 * (float)local_580._4_4_ +
                 fVar222 * (float)local_340._4_4_ +
                 (float)local_6a0._4_4_ * fVar217 + (float)local_5a0._4_4_ * fVar330;
            auVar307._8_4_ =
                 fVar141 * fStack_578 +
                 fVar300 * fStack_338 + fStack_698 * fVar326 + fStack_598 * fVar328;
            auVar307._12_4_ =
                 fVar174 * fStack_574 +
                 fVar298 * fStack_334 + fStack_694 * fVar220 + fStack_594 * fVar331;
            auVar307._16_4_ =
                 fVar189 * fStack_570 +
                 fVar299 * fStack_330 + fStack_690 * fVar327 + fStack_590 * fVar221;
            auVar307._20_4_ =
                 fVar190 * fStack_56c +
                 fVar224 * fStack_32c + fStack_68c * fVar223 + fStack_58c * fVar333;
            auVar307._24_4_ =
                 fVar191 * fStack_568 +
                 fVar192 * fStack_328 + fStack_688 * fVar329 + fStack_588 * fVar332;
            auVar307._28_4_ = fStack_2a4 + fStack_2a4 + fStack_584 + fStack_5a4;
            auVar337._0_4_ =
                 fVar204 * (float)local_2c0._0_4_ +
                 (float)local_2a0._0_4_ * fVar289 + fVar243 * fVar324 + fVar263 * fVar159;
            auVar337._4_4_ =
                 fVar273 * (float)local_2c0._4_4_ +
                 (float)local_2a0._4_4_ * fVar222 + fVar255 * fVar217 + fVar330 * fVar161;
            auVar337._8_4_ =
                 fVar141 * fStack_2b8 + fStack_298 * fVar300 + fVar258 * fVar326 + fVar328 * fVar163
            ;
            auVar337._12_4_ =
                 fVar174 * fStack_2b4 + fStack_294 * fVar298 + fVar261 * fVar220 + fVar331 * fVar165
            ;
            auVar337._16_4_ =
                 fVar189 * fStack_2b0 + fStack_290 * fVar299 + fVar243 * fVar327 + fVar221 * fVar167
            ;
            auVar337._20_4_ =
                 fVar190 * fStack_2ac + fStack_28c * fVar224 + fVar255 * fVar223 + fVar333 * fVar169
            ;
            auVar337._24_4_ =
                 fVar191 * fStack_2a8 + fStack_288 * fVar192 + fVar258 * fVar329 + fVar332 * fVar171
            ;
            auVar337._28_4_ = fStack_2a4 + fStack_2a4 + fStack_684 + fStack_5a4;
            auVar253._8_4_ = 0x7fffffff;
            auVar253._0_8_ = 0x7fffffff7fffffff;
            auVar253._12_4_ = 0x7fffffff;
            auVar253._16_4_ = 0x7fffffff;
            auVar253._20_4_ = 0x7fffffff;
            auVar253._24_4_ = 0x7fffffff;
            auVar253._28_4_ = 0x7fffffff;
            auVar121._4_4_ = fStack_61c;
            auVar121._0_4_ = local_620;
            auVar121._8_4_ = fStack_618;
            auVar121._12_4_ = fStack_614;
            auVar121._16_4_ = fStack_610;
            auVar121._20_4_ = fStack_60c;
            auVar121._24_4_ = fStack_608;
            auVar121._28_4_ = fStack_604;
            auVar186 = vandps_avx(auVar121,auVar253);
            auVar122._4_4_ = fStack_5bc;
            auVar122._0_4_ = local_5c0;
            auVar122._8_4_ = fStack_5b8;
            auVar122._12_4_ = fStack_5b4;
            auVar122._16_4_ = fStack_5b0;
            auVar122._20_4_ = fStack_5ac;
            auVar122._24_4_ = fStack_5a8;
            auVar122._28_4_ = fStack_5a4;
            auVar27 = vandps_avx(auVar122,auVar253);
            auVar27 = vmaxps_avx(auVar186,auVar27);
            auVar186 = vandps_avx(auVar342,auVar253);
            auVar27 = vmaxps_avx(auVar27,auVar186);
            auVar27 = vcmpps_avx(auVar27,local_640,1);
            auVar16 = vblendvps_avx(auVar121,auVar20,auVar27);
            auVar153._0_4_ =
                 fVar204 * (float)local_700._0_4_ +
                 fVar289 * (float)local_a0._0_4_ +
                 fVar205 * fVar263 + (float)local_c0._0_4_ * fVar324;
            auVar153._4_4_ =
                 fVar273 * (float)local_700._4_4_ +
                 fVar222 * (float)local_a0._4_4_ +
                 fVar225 * fVar330 + (float)local_c0._4_4_ * fVar217;
            auVar153._8_4_ =
                 fVar141 * fStack_6f8 +
                 fVar300 * fStack_98 + fVar242 * fVar328 + fStack_b8 * fVar326;
            auVar153._12_4_ =
                 fVar174 * fStack_6f4 +
                 fVar298 * fStack_94 + fVar216 * fVar331 + fStack_b4 * fVar220;
            auVar153._16_4_ =
                 fVar189 * fStack_6f0 +
                 fVar299 * fStack_90 + fVar205 * fVar221 + fStack_b0 * fVar327;
            auVar153._20_4_ =
                 fVar190 * fStack_6ec +
                 fVar224 * fStack_8c + fVar225 * fVar333 + fStack_ac * fVar223;
            auVar153._24_4_ =
                 fVar191 * fStack_6e8 +
                 fVar192 * fStack_88 + fVar242 * fVar332 + fStack_a8 * fVar329;
            auVar153._28_4_ = auVar186._28_4_ + pfVar7[7] + pfVar6[7] + pfVar5[7];
            auVar17 = vblendvps_avx(auVar122,auVar21,auVar27);
            auVar186 = vandps_avx(auVar307,auVar253);
            auVar27 = vandps_avx(auVar337,auVar253);
            auVar209 = vmaxps_avx(auVar186,auVar27);
            auVar186 = vandps_avx(auVar153,auVar253);
            auVar186 = vmaxps_avx(auVar209,auVar186);
            local_740._0_4_ = auVar127._0_4_;
            local_740._4_4_ = auVar127._4_4_;
            uStack_738._0_4_ = auVar127._8_4_;
            uStack_738._4_4_ = auVar127._12_4_;
            uStack_730._0_4_ = auVar127._16_4_;
            uStack_730._4_4_ = auVar127._20_4_;
            uStack_728._0_4_ = auVar127._24_4_;
            auVar27 = vcmpps_avx(auVar186,local_640,1);
            auVar186 = vblendvps_avx(auVar307,auVar20,auVar27);
            auVar154._0_4_ =
                 (float)local_700._0_4_ * (float)local_740._0_4_ +
                 (float)local_a0._0_4_ * (float)local_6c0._0_4_ +
                 (float)local_c0._0_4_ * (float)local_7e0._0_4_ + fVar205 * (float)local_900._0_4_;
            auVar154._4_4_ =
                 (float)local_700._4_4_ * (float)local_740._4_4_ +
                 (float)local_a0._4_4_ * (float)local_6c0._4_4_ +
                 (float)local_c0._4_4_ * (float)local_7e0._4_4_ + fVar225 * (float)local_900._4_4_;
            auVar154._8_4_ =
                 fStack_6f8 * (float)uStack_738 +
                 fStack_98 * (float)uStack_6b8 + fStack_b8 * fStack_7d8 + fVar242 * fStack_8f8;
            auVar154._12_4_ =
                 fStack_6f4 * uStack_738._4_4_ +
                 fStack_94 * uStack_6b8._4_4_ + fStack_b4 * fStack_7d4 + fVar216 * fStack_8f4;
            auVar154._16_4_ =
                 fStack_6f0 * (float)uStack_730 +
                 fStack_90 * (float)auStack_6b0._0_4_ +
                 fStack_b0 * fStack_7d0 + fVar205 * fStack_8f0;
            auVar154._20_4_ =
                 fStack_6ec * uStack_730._4_4_ +
                 fStack_8c * (float)auStack_6b0._4_4_ +
                 fStack_ac * fStack_7cc + fVar225 * fStack_8ec;
            auVar154._24_4_ =
                 fStack_6e8 * (float)uStack_728 +
                 fStack_88 * (float)uStack_6a8 + fStack_a8 * fStack_7c8 + fVar242 * fStack_8e8;
            auVar154._28_4_ = auVar209._28_4_ + fStack_6c4 + auVar249._12_4_ + 0.0;
            auVar27 = vblendvps_avx(auVar337,auVar21,auVar27);
            fVar173 = auVar16._0_4_;
            fVar274 = auVar16._4_4_;
            fVar239 = auVar16._8_4_;
            fVar241 = auVar16._12_4_;
            fVar244 = auVar16._16_4_;
            fVar256 = auVar16._20_4_;
            fVar259 = auVar16._24_4_;
            fVar262 = auVar16._28_4_;
            fVar289 = auVar186._0_4_;
            fVar300 = auVar186._4_4_;
            fVar299 = auVar186._8_4_;
            fVar192 = auVar186._12_4_;
            fVar273 = auVar186._16_4_;
            fVar159 = auVar186._20_4_;
            fVar163 = auVar186._24_4_;
            fVar324 = auVar17._0_4_;
            fVar326 = auVar17._4_4_;
            fVar327 = auVar17._8_4_;
            fVar329 = auVar17._12_4_;
            fVar330 = auVar17._16_4_;
            fVar331 = auVar17._20_4_;
            fVar333 = auVar17._24_4_;
            auVar321._0_4_ = fVar324 * fVar324 + fVar173 * fVar173;
            auVar321._4_4_ = fVar326 * fVar326 + fVar274 * fVar274;
            auVar321._8_4_ = fVar327 * fVar327 + fVar239 * fVar239;
            auVar321._12_4_ = fVar329 * fVar329 + fVar241 * fVar241;
            auVar321._16_4_ = fVar330 * fVar330 + fVar244 * fVar244;
            auVar321._20_4_ = fVar331 * fVar331 + fVar256 * fVar256;
            auVar321._24_4_ = fVar333 * fVar333 + fVar259 * fVar259;
            auVar321._28_4_ = auVar20._28_4_ + fVar216;
            auVar20 = vrsqrtps_avx(auVar321);
            fVar217 = auVar20._0_4_;
            fVar220 = auVar20._4_4_;
            auVar62._4_4_ = fVar220 * 1.5;
            auVar62._0_4_ = fVar217 * 1.5;
            fVar223 = auVar20._8_4_;
            auVar62._8_4_ = fVar223 * 1.5;
            fVar263 = auVar20._12_4_;
            auVar62._12_4_ = fVar263 * 1.5;
            fVar328 = auVar20._16_4_;
            auVar62._16_4_ = fVar328 * 1.5;
            fVar221 = auVar20._20_4_;
            auVar62._20_4_ = fVar221 * 1.5;
            fVar332 = auVar20._24_4_;
            auVar62._24_4_ = fVar332 * 1.5;
            auVar62._28_4_ = auVar337._28_4_;
            auVar63._4_4_ = fVar220 * fVar220 * fVar220 * auVar321._4_4_ * 0.5;
            auVar63._0_4_ = fVar217 * fVar217 * fVar217 * auVar321._0_4_ * 0.5;
            auVar63._8_4_ = fVar223 * fVar223 * fVar223 * auVar321._8_4_ * 0.5;
            auVar63._12_4_ = fVar263 * fVar263 * fVar263 * auVar321._12_4_ * 0.5;
            auVar63._16_4_ = fVar328 * fVar328 * fVar328 * auVar321._16_4_ * 0.5;
            auVar63._20_4_ = fVar221 * fVar221 * fVar221 * auVar321._20_4_ * 0.5;
            auVar63._24_4_ = fVar332 * fVar332 * fVar332 * auVar321._24_4_ * 0.5;
            auVar63._28_4_ = auVar321._28_4_;
            auVar16 = vsubps_avx(auVar62,auVar63);
            fVar167 = auVar16._0_4_;
            fVar169 = auVar16._4_4_;
            fVar171 = auVar16._8_4_;
            fVar174 = auVar16._12_4_;
            fVar189 = auVar16._16_4_;
            fVar190 = auVar16._20_4_;
            fVar191 = auVar16._24_4_;
            fVar217 = auVar27._0_4_;
            fVar220 = auVar27._4_4_;
            fVar223 = auVar27._8_4_;
            fVar263 = auVar27._12_4_;
            fVar328 = auVar27._16_4_;
            fVar221 = auVar27._20_4_;
            fVar332 = auVar27._24_4_;
            auVar296._0_4_ = fVar217 * fVar217 + fVar289 * fVar289;
            auVar296._4_4_ = fVar220 * fVar220 + fVar300 * fVar300;
            auVar296._8_4_ = fVar223 * fVar223 + fVar299 * fVar299;
            auVar296._12_4_ = fVar263 * fVar263 + fVar192 * fVar192;
            auVar296._16_4_ = fVar328 * fVar328 + fVar273 * fVar273;
            auVar296._20_4_ = fVar221 * fVar221 + fVar159 * fVar159;
            auVar296._24_4_ = fVar332 * fVar332 + fVar163 * fVar163;
            auVar296._28_4_ = auVar20._28_4_ + auVar186._28_4_;
            auVar186 = vrsqrtps_avx(auVar296);
            fVar222 = auVar186._0_4_;
            fVar298 = auVar186._4_4_;
            auVar64._4_4_ = fVar298 * 1.5;
            auVar64._0_4_ = fVar222 * 1.5;
            fVar224 = auVar186._8_4_;
            auVar64._8_4_ = fVar224 * 1.5;
            fVar204 = auVar186._12_4_;
            auVar64._12_4_ = fVar204 * 1.5;
            fVar141 = auVar186._16_4_;
            auVar64._16_4_ = fVar141 * 1.5;
            fVar161 = auVar186._20_4_;
            auVar64._20_4_ = fVar161 * 1.5;
            fVar165 = auVar186._24_4_;
            auVar64._24_4_ = fVar165 * 1.5;
            auVar64._28_4_ = auVar337._28_4_;
            auVar65._4_4_ = fVar298 * fVar298 * fVar298 * auVar296._4_4_ * 0.5;
            auVar65._0_4_ = fVar222 * fVar222 * fVar222 * auVar296._0_4_ * 0.5;
            auVar65._8_4_ = fVar224 * fVar224 * fVar224 * auVar296._8_4_ * 0.5;
            auVar65._12_4_ = fVar204 * fVar204 * fVar204 * auVar296._12_4_ * 0.5;
            auVar65._16_4_ = fVar141 * fVar141 * fVar141 * auVar296._16_4_ * 0.5;
            auVar65._20_4_ = fVar161 * fVar161 * fVar161 * auVar296._20_4_ * 0.5;
            auVar65._24_4_ = fVar165 * fVar165 * fVar165 * auVar296._24_4_ * 0.5;
            auVar65._28_4_ = auVar296._28_4_;
            auVar20 = vsubps_avx(auVar64,auVar65);
            fVar222 = auVar20._0_4_;
            fVar298 = auVar20._4_4_;
            fVar224 = auVar20._8_4_;
            fVar204 = auVar20._12_4_;
            fVar141 = auVar20._16_4_;
            fVar161 = auVar20._20_4_;
            fVar165 = auVar20._24_4_;
            fVar324 = fVar142 * fVar167 * fVar324;
            fVar326 = fVar160 * fVar169 * fVar326;
            auVar66._4_4_ = fVar326;
            auVar66._0_4_ = fVar324;
            fVar327 = fVar162 * fVar171 * fVar327;
            auVar66._8_4_ = fVar327;
            fVar329 = fVar164 * fVar174 * fVar329;
            auVar66._12_4_ = fVar329;
            fVar330 = fVar166 * fVar189 * fVar330;
            auVar66._16_4_ = fVar330;
            fVar331 = fVar168 * fVar190 * fVar331;
            auVar66._20_4_ = fVar331;
            fVar333 = fVar170 * fVar191 * fVar333;
            auVar66._24_4_ = fVar333;
            auVar66._28_4_ = auVar186._28_4_;
            local_740._4_4_ = fVar326 + auVar214._4_4_;
            local_740._0_4_ = fVar324 + auVar214._0_4_;
            uStack_738._0_4_ = fVar327 + auVar214._8_4_;
            uStack_738._4_4_ = fVar329 + auVar214._12_4_;
            uStack_730._0_4_ = fVar330 + auVar214._16_4_;
            uStack_730._4_4_ = fVar331 + auVar214._20_4_;
            uStack_728._0_4_ = fVar333 + auVar214._24_4_;
            uStack_728._4_4_ = auVar186._28_4_ + auVar214._28_4_;
            fVar324 = fVar142 * fVar167 * -fVar173;
            fVar326 = fVar160 * fVar169 * -fVar274;
            auVar67._4_4_ = fVar326;
            auVar67._0_4_ = fVar324;
            fVar327 = fVar162 * fVar171 * -fVar239;
            auVar67._8_4_ = fVar327;
            fVar329 = fVar164 * fVar174 * -fVar241;
            auVar67._12_4_ = fVar329;
            fVar330 = fVar166 * fVar189 * -fVar244;
            auVar67._16_4_ = fVar330;
            fVar331 = fVar168 * fVar190 * -fVar256;
            auVar67._20_4_ = fVar331;
            fVar333 = fVar170 * fVar191 * -fVar259;
            auVar67._24_4_ = fVar333;
            auVar67._28_4_ = -fVar262;
            local_900._4_4_ = auVar202._4_4_ + fVar326;
            local_900._0_4_ = auVar202._0_4_ + fVar324;
            fStack_8f8 = auVar202._8_4_ + fVar327;
            fStack_8f4 = auVar202._12_4_ + fVar329;
            fStack_8f0 = auVar202._16_4_ + fVar330;
            fStack_8ec = auVar202._20_4_ + fVar331;
            fStack_8e8 = auVar202._24_4_ + fVar333;
            fStack_8e4 = auVar202._28_4_ + -fVar262;
            fVar324 = fVar167 * 0.0 * fVar142;
            fVar326 = fVar169 * 0.0 * fVar160;
            auVar68._4_4_ = fVar326;
            auVar68._0_4_ = fVar324;
            fVar327 = fVar171 * 0.0 * fVar162;
            auVar68._8_4_ = fVar327;
            fVar329 = fVar174 * 0.0 * fVar164;
            auVar68._12_4_ = fVar329;
            fVar330 = fVar189 * 0.0 * fVar166;
            auVar68._16_4_ = fVar330;
            fVar331 = fVar190 * 0.0 * fVar168;
            auVar68._20_4_ = fVar331;
            fVar333 = fVar191 * 0.0 * fVar170;
            auVar68._24_4_ = fVar333;
            auVar68._28_4_ = fVar262;
            auVar186 = vsubps_avx(auVar214,auVar66);
            auVar361._0_4_ = fVar324 + auVar154._0_4_;
            auVar361._4_4_ = fVar326 + auVar154._4_4_;
            auVar361._8_4_ = fVar327 + auVar154._8_4_;
            auVar361._12_4_ = fVar329 + auVar154._12_4_;
            auVar361._16_4_ = fVar330 + auVar154._16_4_;
            auVar361._20_4_ = fVar331 + auVar154._20_4_;
            auVar361._24_4_ = fVar333 + auVar154._24_4_;
            auVar361._28_4_ = fVar262 + auVar154._28_4_;
            fVar324 = auVar281._0_4_ * fVar222 * fVar217;
            fVar217 = auVar281._4_4_ * fVar298 * fVar220;
            auVar69._4_4_ = fVar217;
            auVar69._0_4_ = fVar324;
            fVar326 = auVar281._8_4_ * fVar224 * fVar223;
            auVar69._8_4_ = fVar326;
            fVar220 = auVar281._12_4_ * fVar204 * fVar263;
            auVar69._12_4_ = fVar220;
            fVar327 = auVar281._16_4_ * fVar141 * fVar328;
            auVar69._16_4_ = fVar327;
            fVar223 = auVar281._20_4_ * fVar161 * fVar221;
            auVar69._20_4_ = fVar223;
            fVar329 = auVar281._24_4_ * fVar165 * fVar332;
            auVar69._24_4_ = fVar329;
            auVar69._28_4_ = fVar172;
            auVar359 = vsubps_avx(auVar202,auVar67);
            auVar343._0_4_ = auVar295._0_4_ + fVar324;
            auVar343._4_4_ = auVar295._4_4_ + fVar217;
            auVar343._8_4_ = auVar295._8_4_ + fVar326;
            auVar343._12_4_ = auVar295._12_4_ + fVar220;
            auVar343._16_4_ = auVar295._16_4_ + fVar327;
            auVar343._20_4_ = auVar295._20_4_ + fVar223;
            auVar343._24_4_ = auVar295._24_4_ + fVar329;
            auVar343._28_4_ = auVar295._28_4_ + fVar172;
            fVar324 = fVar222 * -fVar289 * auVar281._0_4_;
            fVar217 = fVar298 * -fVar300 * auVar281._4_4_;
            auVar70._4_4_ = fVar217;
            auVar70._0_4_ = fVar324;
            fVar326 = fVar224 * -fVar299 * auVar281._8_4_;
            auVar70._8_4_ = fVar326;
            fVar220 = fVar204 * -fVar192 * auVar281._12_4_;
            auVar70._12_4_ = fVar220;
            fVar327 = fVar141 * -fVar273 * auVar281._16_4_;
            auVar70._16_4_ = fVar327;
            fVar223 = fVar161 * -fVar159 * auVar281._20_4_;
            auVar70._20_4_ = fVar223;
            fVar329 = fVar165 * -fVar163 * auVar281._24_4_;
            auVar70._24_4_ = fVar329;
            auVar70._28_4_ = auVar214._28_4_;
            auVar23 = vsubps_avx(auVar154,auVar68);
            auVar235._0_4_ = auVar252._0_4_ + fVar324;
            auVar235._4_4_ = auVar252._4_4_ + fVar217;
            auVar235._8_4_ = auVar252._8_4_ + fVar326;
            auVar235._12_4_ = auVar252._12_4_ + fVar220;
            auVar235._16_4_ = auVar252._16_4_ + fVar327;
            auVar235._20_4_ = auVar252._20_4_ + fVar223;
            auVar235._24_4_ = auVar252._24_4_ + fVar329;
            auVar235._28_4_ = auVar252._28_4_ + auVar214._28_4_;
            fVar324 = fVar222 * 0.0 * auVar281._0_4_;
            fVar217 = fVar298 * 0.0 * auVar281._4_4_;
            auVar71._4_4_ = fVar217;
            auVar71._0_4_ = fVar324;
            fVar326 = fVar224 * 0.0 * auVar281._8_4_;
            auVar71._8_4_ = fVar326;
            fVar220 = fVar204 * 0.0 * auVar281._12_4_;
            auVar71._12_4_ = fVar220;
            fVar327 = fVar141 * 0.0 * auVar281._16_4_;
            auVar71._16_4_ = fVar327;
            fVar223 = fVar161 * 0.0 * auVar281._20_4_;
            auVar71._20_4_ = fVar223;
            fVar329 = fVar165 * 0.0 * auVar281._24_4_;
            auVar71._24_4_ = fVar329;
            auVar71._28_4_ = auVar154._28_4_;
            auVar27 = vsubps_avx(auVar295,auVar69);
            auVar119._4_4_ = fStack_6dc;
            auVar119._0_4_ = local_6e0;
            auVar119._8_4_ = fStack_6d8;
            auVar119._12_4_ = fStack_6d4;
            auVar119._16_4_ = fStack_6d0;
            auVar119._20_4_ = fStack_6cc;
            auVar119._24_4_ = fStack_6c8;
            auVar119._28_4_ = fStack_6c4;
            auVar308._0_4_ = local_6e0 + fVar324;
            auVar308._4_4_ = fStack_6dc + fVar217;
            auVar308._8_4_ = fStack_6d8 + fVar326;
            auVar308._12_4_ = fStack_6d4 + fVar220;
            auVar308._16_4_ = fStack_6d0 + fVar327;
            auVar308._20_4_ = fStack_6cc + fVar223;
            auVar308._24_4_ = fStack_6c8 + fVar329;
            auVar308._28_4_ = fStack_6c4 + auVar154._28_4_;
            auVar16 = vsubps_avx(auVar252,auVar70);
            auVar17 = vsubps_avx(auVar119,auVar71);
            auVar209 = vsubps_avx(auVar235,auVar359);
            auVar210 = vsubps_avx(auVar308,auVar23);
            auVar72._4_4_ = auVar23._4_4_ * auVar209._4_4_;
            auVar72._0_4_ = auVar23._0_4_ * auVar209._0_4_;
            auVar72._8_4_ = auVar23._8_4_ * auVar209._8_4_;
            auVar72._12_4_ = auVar23._12_4_ * auVar209._12_4_;
            auVar72._16_4_ = auVar23._16_4_ * auVar209._16_4_;
            auVar72._20_4_ = auVar23._20_4_ * auVar209._20_4_;
            auVar72._24_4_ = auVar23._24_4_ * auVar209._24_4_;
            auVar72._28_4_ = auVar337._28_4_;
            auVar73._4_4_ = auVar359._4_4_ * auVar210._4_4_;
            auVar73._0_4_ = auVar359._0_4_ * auVar210._0_4_;
            auVar73._8_4_ = auVar359._8_4_ * auVar210._8_4_;
            auVar73._12_4_ = auVar359._12_4_ * auVar210._12_4_;
            auVar73._16_4_ = auVar359._16_4_ * auVar210._16_4_;
            auVar73._20_4_ = auVar359._20_4_ * auVar210._20_4_;
            auVar73._24_4_ = auVar359._24_4_ * auVar210._24_4_;
            auVar73._28_4_ = auVar252._28_4_;
            auVar232 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar186._4_4_ * auVar210._4_4_;
            auVar74._0_4_ = auVar186._0_4_ * auVar210._0_4_;
            auVar74._8_4_ = auVar186._8_4_ * auVar210._8_4_;
            auVar74._12_4_ = auVar186._12_4_ * auVar210._12_4_;
            auVar74._16_4_ = auVar186._16_4_ * auVar210._16_4_;
            auVar74._20_4_ = auVar186._20_4_ * auVar210._20_4_;
            auVar74._24_4_ = auVar186._24_4_ * auVar210._24_4_;
            auVar74._28_4_ = auVar210._28_4_;
            auVar210 = vsubps_avx(auVar343,auVar186);
            auVar75._4_4_ = auVar23._4_4_ * auVar210._4_4_;
            auVar75._0_4_ = auVar23._0_4_ * auVar210._0_4_;
            auVar75._8_4_ = auVar23._8_4_ * auVar210._8_4_;
            auVar75._12_4_ = auVar23._12_4_ * auVar210._12_4_;
            auVar75._16_4_ = auVar23._16_4_ * auVar210._16_4_;
            auVar75._20_4_ = auVar23._20_4_ * auVar210._20_4_;
            auVar75._24_4_ = auVar23._24_4_ * auVar210._24_4_;
            auVar75._28_4_ = auVar20._28_4_;
            auVar267 = vsubps_avx(auVar75,auVar74);
            auVar76._4_4_ = auVar359._4_4_ * auVar210._4_4_;
            auVar76._0_4_ = auVar359._0_4_ * auVar210._0_4_;
            auVar76._8_4_ = auVar359._8_4_ * auVar210._8_4_;
            auVar76._12_4_ = auVar359._12_4_ * auVar210._12_4_;
            auVar76._16_4_ = auVar359._16_4_ * auVar210._16_4_;
            auVar76._20_4_ = auVar359._20_4_ * auVar210._20_4_;
            auVar76._24_4_ = auVar359._24_4_ * auVar210._24_4_;
            auVar76._28_4_ = auVar20._28_4_;
            auVar77._4_4_ = auVar186._4_4_ * auVar209._4_4_;
            auVar77._0_4_ = auVar186._0_4_ * auVar209._0_4_;
            auVar77._8_4_ = auVar186._8_4_ * auVar209._8_4_;
            auVar77._12_4_ = auVar186._12_4_ * auVar209._12_4_;
            auVar77._16_4_ = auVar186._16_4_ * auVar209._16_4_;
            auVar77._20_4_ = auVar186._20_4_ * auVar209._20_4_;
            auVar77._24_4_ = auVar186._24_4_ * auVar209._24_4_;
            auVar77._28_4_ = auVar209._28_4_;
            auVar20 = vsubps_avx(auVar77,auVar76);
            auVar184._0_4_ = auVar232._0_4_ * 0.0 + auVar20._0_4_ + auVar267._0_4_ * 0.0;
            auVar184._4_4_ = auVar232._4_4_ * 0.0 + auVar20._4_4_ + auVar267._4_4_ * 0.0;
            auVar184._8_4_ = auVar232._8_4_ * 0.0 + auVar20._8_4_ + auVar267._8_4_ * 0.0;
            auVar184._12_4_ = auVar232._12_4_ * 0.0 + auVar20._12_4_ + auVar267._12_4_ * 0.0;
            auVar184._16_4_ = auVar232._16_4_ * 0.0 + auVar20._16_4_ + auVar267._16_4_ * 0.0;
            auVar184._20_4_ = auVar232._20_4_ * 0.0 + auVar20._20_4_ + auVar267._20_4_ * 0.0;
            auVar184._24_4_ = auVar232._24_4_ * 0.0 + auVar20._24_4_ + auVar267._24_4_ * 0.0;
            auVar184._28_4_ = auVar232._28_4_ + auVar20._28_4_ + auVar267._28_4_;
            auVar325 = vcmpps_avx(auVar184,ZEXT832(0) << 0x20,2);
            auVar20 = vblendvps_avx(auVar27,_local_740,auVar325);
            auVar215 = ZEXT3264(auVar20);
            auVar27 = vblendvps_avx(auVar16,_local_900,auVar325);
            auVar16 = vblendvps_avx(auVar17,auVar361,auVar325);
            auVar17 = vblendvps_avx(auVar186,auVar343,auVar325);
            auVar209 = vblendvps_avx(auVar359,auVar235,auVar325);
            auVar210 = vblendvps_avx(auVar23,auVar308,auVar325);
            auVar232 = vblendvps_avx(auVar343,auVar186,auVar325);
            auVar267 = vblendvps_avx(auVar235,auVar359,auVar325);
            auVar304 = vblendvps_avx(auVar308,auVar23,auVar325);
            auVar186 = vandps_avx(auVar22,auVar183);
            auVar232 = vsubps_avx(auVar232,auVar20);
            auVar24 = vsubps_avx(auVar267,auVar27);
            auVar304 = vsubps_avx(auVar304,auVar16);
            auVar25 = vsubps_avx(auVar27,auVar209);
            fVar324 = auVar24._0_4_;
            fVar275 = auVar16._0_4_;
            fVar263 = auVar24._4_4_;
            fVar282 = auVar16._4_4_;
            auVar78._4_4_ = fVar282 * fVar263;
            auVar78._0_4_ = fVar275 * fVar324;
            fVar289 = auVar24._8_4_;
            fVar283 = auVar16._8_4_;
            auVar78._8_4_ = fVar283 * fVar289;
            fVar204 = auVar24._12_4_;
            fVar284 = auVar16._12_4_;
            auVar78._12_4_ = fVar284 * fVar204;
            fVar167 = auVar24._16_4_;
            fVar285 = auVar16._16_4_;
            auVar78._16_4_ = fVar285 * fVar167;
            fVar173 = auVar24._20_4_;
            fVar286 = auVar16._20_4_;
            auVar78._20_4_ = fVar286 * fVar173;
            fVar262 = auVar24._24_4_;
            fVar287 = auVar16._24_4_;
            auVar78._24_4_ = fVar287 * fVar262;
            auVar78._28_4_ = auVar267._28_4_;
            fVar217 = auVar27._0_4_;
            fVar302 = auVar304._0_4_;
            fVar330 = auVar27._4_4_;
            fVar311 = auVar304._4_4_;
            auVar79._4_4_ = fVar311 * fVar330;
            auVar79._0_4_ = fVar302 * fVar217;
            fVar222 = auVar27._8_4_;
            fVar313 = auVar304._8_4_;
            auVar79._8_4_ = fVar313 * fVar222;
            fVar273 = auVar27._12_4_;
            fVar315 = auVar304._12_4_;
            auVar79._12_4_ = fVar315 * fVar273;
            fVar169 = auVar27._16_4_;
            fVar316 = auVar304._16_4_;
            auVar79._16_4_ = fVar316 * fVar169;
            fVar274 = auVar27._20_4_;
            fVar317 = auVar304._20_4_;
            auVar79._20_4_ = fVar317 * fVar274;
            fVar264 = auVar27._24_4_;
            fVar318 = auVar304._24_4_;
            uVar9 = auVar359._28_4_;
            auVar79._24_4_ = fVar318 * fVar264;
            auVar79._28_4_ = uVar9;
            auVar267 = vsubps_avx(auVar79,auVar78);
            fVar326 = auVar20._0_4_;
            fVar328 = auVar20._4_4_;
            auVar80._4_4_ = fVar311 * fVar328;
            auVar80._0_4_ = fVar302 * fVar326;
            fVar300 = auVar20._8_4_;
            auVar80._8_4_ = fVar313 * fVar300;
            fVar141 = auVar20._12_4_;
            auVar80._12_4_ = fVar315 * fVar141;
            fVar171 = auVar20._16_4_;
            auVar80._16_4_ = fVar316 * fVar171;
            fVar239 = auVar20._20_4_;
            auVar80._20_4_ = fVar317 * fVar239;
            fVar270 = auVar20._24_4_;
            auVar80._24_4_ = fVar318 * fVar270;
            auVar80._28_4_ = uVar9;
            fVar220 = auVar232._0_4_;
            fVar331 = auVar232._4_4_;
            auVar81._4_4_ = fVar282 * fVar331;
            auVar81._0_4_ = fVar275 * fVar220;
            fVar298 = auVar232._8_4_;
            auVar81._8_4_ = fVar283 * fVar298;
            fVar159 = auVar232._12_4_;
            auVar81._12_4_ = fVar284 * fVar159;
            fVar174 = auVar232._16_4_;
            auVar81._16_4_ = fVar285 * fVar174;
            fVar241 = auVar232._20_4_;
            auVar81._20_4_ = fVar286 * fVar241;
            fVar271 = auVar232._24_4_;
            auVar81._24_4_ = fVar287 * fVar271;
            auVar81._28_4_ = auVar343._28_4_;
            auVar359 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = fVar330 * fVar331;
            auVar82._0_4_ = fVar217 * fVar220;
            auVar82._8_4_ = fVar222 * fVar298;
            auVar82._12_4_ = fVar273 * fVar159;
            auVar82._16_4_ = fVar169 * fVar174;
            auVar82._20_4_ = fVar274 * fVar241;
            auVar82._24_4_ = fVar264 * fVar271;
            auVar82._28_4_ = uVar9;
            auVar83._4_4_ = fVar328 * fVar263;
            auVar83._0_4_ = fVar326 * fVar324;
            auVar83._8_4_ = fVar300 * fVar289;
            auVar83._12_4_ = fVar141 * fVar204;
            auVar83._16_4_ = fVar171 * fVar167;
            auVar83._20_4_ = fVar239 * fVar173;
            auVar83._24_4_ = fVar270 * fVar262;
            auVar83._28_4_ = auVar23._28_4_;
            auVar23 = vsubps_avx(auVar83,auVar82);
            auVar26 = vsubps_avx(auVar16,auVar210);
            fVar223 = auVar23._28_4_ + auVar359._28_4_;
            auVar322._0_4_ = auVar23._0_4_ + auVar359._0_4_ * 0.0 + auVar267._0_4_ * 0.0;
            auVar322._4_4_ = auVar23._4_4_ + auVar359._4_4_ * 0.0 + auVar267._4_4_ * 0.0;
            auVar322._8_4_ = auVar23._8_4_ + auVar359._8_4_ * 0.0 + auVar267._8_4_ * 0.0;
            auVar322._12_4_ = auVar23._12_4_ + auVar359._12_4_ * 0.0 + auVar267._12_4_ * 0.0;
            auVar322._16_4_ = auVar23._16_4_ + auVar359._16_4_ * 0.0 + auVar267._16_4_ * 0.0;
            auVar322._20_4_ = auVar23._20_4_ + auVar359._20_4_ * 0.0 + auVar267._20_4_ * 0.0;
            auVar322._24_4_ = auVar23._24_4_ + auVar359._24_4_ * 0.0 + auVar267._24_4_ * 0.0;
            auVar322._28_4_ = fVar223 + auVar267._28_4_;
            fVar327 = auVar25._0_4_;
            fVar221 = auVar25._4_4_;
            auVar84._4_4_ = auVar210._4_4_ * fVar221;
            auVar84._0_4_ = auVar210._0_4_ * fVar327;
            fVar299 = auVar25._8_4_;
            auVar84._8_4_ = auVar210._8_4_ * fVar299;
            fVar161 = auVar25._12_4_;
            auVar84._12_4_ = auVar210._12_4_ * fVar161;
            fVar189 = auVar25._16_4_;
            auVar84._16_4_ = auVar210._16_4_ * fVar189;
            fVar244 = auVar25._20_4_;
            auVar84._20_4_ = auVar210._20_4_ * fVar244;
            fVar272 = auVar25._24_4_;
            auVar84._24_4_ = auVar210._24_4_ * fVar272;
            auVar84._28_4_ = fVar223;
            fVar223 = auVar26._0_4_;
            fVar333 = auVar26._4_4_;
            auVar85._4_4_ = auVar209._4_4_ * fVar333;
            auVar85._0_4_ = auVar209._0_4_ * fVar223;
            fVar224 = auVar26._8_4_;
            auVar85._8_4_ = auVar209._8_4_ * fVar224;
            fVar163 = auVar26._12_4_;
            auVar85._12_4_ = auVar209._12_4_ * fVar163;
            fVar190 = auVar26._16_4_;
            auVar85._16_4_ = auVar209._16_4_ * fVar190;
            fVar256 = auVar26._20_4_;
            auVar85._20_4_ = auVar209._20_4_ * fVar256;
            fVar288 = auVar26._24_4_;
            auVar85._24_4_ = auVar209._24_4_ * fVar288;
            auVar85._28_4_ = auVar23._28_4_;
            auVar359 = vsubps_avx(auVar85,auVar84);
            auVar23 = vsubps_avx(auVar20,auVar17);
            fVar329 = auVar23._0_4_;
            fVar332 = auVar23._4_4_;
            auVar86._4_4_ = auVar210._4_4_ * fVar332;
            auVar86._0_4_ = auVar210._0_4_ * fVar329;
            fVar192 = auVar23._8_4_;
            auVar86._8_4_ = auVar210._8_4_ * fVar192;
            fVar165 = auVar23._12_4_;
            auVar86._12_4_ = auVar210._12_4_ * fVar165;
            fVar191 = auVar23._16_4_;
            auVar86._16_4_ = auVar210._16_4_ * fVar191;
            fVar259 = auVar23._20_4_;
            auVar86._20_4_ = auVar210._20_4_ * fVar259;
            fVar297 = auVar23._24_4_;
            auVar86._24_4_ = auVar210._24_4_ * fVar297;
            auVar86._28_4_ = auVar210._28_4_;
            auVar87._4_4_ = fVar333 * auVar17._4_4_;
            auVar87._0_4_ = fVar223 * auVar17._0_4_;
            auVar87._8_4_ = fVar224 * auVar17._8_4_;
            auVar87._12_4_ = fVar163 * auVar17._12_4_;
            auVar87._16_4_ = fVar190 * auVar17._16_4_;
            auVar87._20_4_ = fVar256 * auVar17._20_4_;
            auVar87._24_4_ = fVar288 * auVar17._24_4_;
            auVar87._28_4_ = auVar267._28_4_;
            auVar210 = vsubps_avx(auVar86,auVar87);
            auVar88._4_4_ = auVar209._4_4_ * fVar332;
            auVar88._0_4_ = auVar209._0_4_ * fVar329;
            auVar88._8_4_ = auVar209._8_4_ * fVar192;
            auVar88._12_4_ = auVar209._12_4_ * fVar165;
            auVar88._16_4_ = auVar209._16_4_ * fVar191;
            auVar88._20_4_ = auVar209._20_4_ * fVar259;
            auVar88._24_4_ = auVar209._24_4_ * fVar297;
            auVar88._28_4_ = auVar209._28_4_;
            auVar89._4_4_ = fVar221 * auVar17._4_4_;
            auVar89._0_4_ = fVar327 * auVar17._0_4_;
            auVar89._8_4_ = fVar299 * auVar17._8_4_;
            auVar89._12_4_ = fVar161 * auVar17._12_4_;
            auVar89._16_4_ = fVar189 * auVar17._16_4_;
            auVar89._20_4_ = fVar244 * auVar17._20_4_;
            auVar89._24_4_ = fVar272 * auVar17._24_4_;
            auVar89._28_4_ = auVar17._28_4_;
            auVar17 = vsubps_avx(auVar89,auVar88);
            auVar155._0_4_ = auVar359._0_4_ * 0.0 + auVar17._0_4_ + auVar210._0_4_ * 0.0;
            auVar155._4_4_ = auVar359._4_4_ * 0.0 + auVar17._4_4_ + auVar210._4_4_ * 0.0;
            auVar155._8_4_ = auVar359._8_4_ * 0.0 + auVar17._8_4_ + auVar210._8_4_ * 0.0;
            auVar155._12_4_ = auVar359._12_4_ * 0.0 + auVar17._12_4_ + auVar210._12_4_ * 0.0;
            auVar155._16_4_ = auVar359._16_4_ * 0.0 + auVar17._16_4_ + auVar210._16_4_ * 0.0;
            auVar155._20_4_ = auVar359._20_4_ * 0.0 + auVar17._20_4_ + auVar210._20_4_ * 0.0;
            auVar155._24_4_ = auVar359._24_4_ * 0.0 + auVar17._24_4_ + auVar210._24_4_ * 0.0;
            auVar155._28_4_ = auVar210._28_4_ + auVar17._28_4_ + auVar210._28_4_;
            auVar158 = ZEXT3264(auVar155);
            auVar17 = vmaxps_avx(auVar322,auVar155);
            auVar17 = vcmpps_avx(auVar17,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar209 = auVar186 & auVar17;
            if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar209 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar209 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar209 >> 0x7f,0) == '\0') &&
                  (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar209 >> 0xbf,0) == '\0') &&
                (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar209[0x1f]) {
LAB_00f09ba9:
              auVar188 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
              auVar339._4_4_ = fVar160;
              auVar339._0_4_ = fVar142;
              auVar339._8_4_ = fVar162;
              auVar339._12_4_ = fVar164;
              auVar339._16_4_ = fVar166;
              auVar339._20_4_ = fVar168;
              auVar339._24_4_ = fVar170;
              auVar339._28_4_ = fVar172;
            }
            else {
              auVar209 = vandps_avx(auVar17,auVar186);
              auVar90._4_4_ = fVar333 * fVar263;
              auVar90._0_4_ = fVar223 * fVar324;
              auVar90._8_4_ = fVar224 * fVar289;
              auVar90._12_4_ = fVar163 * fVar204;
              auVar90._16_4_ = fVar190 * fVar167;
              auVar90._20_4_ = fVar256 * fVar173;
              auVar90._24_4_ = fVar288 * fVar262;
              auVar90._28_4_ = auVar186._28_4_;
              auVar91._4_4_ = fVar221 * fVar311;
              auVar91._0_4_ = fVar327 * fVar302;
              auVar91._8_4_ = fVar299 * fVar313;
              auVar91._12_4_ = fVar161 * fVar315;
              auVar91._16_4_ = fVar189 * fVar316;
              auVar91._20_4_ = fVar244 * fVar317;
              auVar91._24_4_ = fVar272 * fVar318;
              auVar91._28_4_ = auVar17._28_4_;
              auVar17 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar332 * fVar311;
              auVar92._0_4_ = fVar329 * fVar302;
              auVar92._8_4_ = fVar192 * fVar313;
              auVar92._12_4_ = fVar165 * fVar315;
              auVar92._16_4_ = fVar191 * fVar316;
              auVar92._20_4_ = fVar259 * fVar317;
              auVar92._24_4_ = fVar297 * fVar318;
              auVar92._28_4_ = auVar304._28_4_;
              auVar93._4_4_ = fVar333 * fVar331;
              auVar93._0_4_ = fVar223 * fVar220;
              auVar93._8_4_ = fVar224 * fVar298;
              auVar93._12_4_ = fVar163 * fVar159;
              auVar93._16_4_ = fVar190 * fVar174;
              auVar93._20_4_ = fVar256 * fVar241;
              auVar93._24_4_ = fVar288 * fVar271;
              auVar93._28_4_ = auVar26._28_4_;
              auVar210 = vsubps_avx(auVar93,auVar92);
              auVar94._4_4_ = fVar221 * fVar331;
              auVar94._0_4_ = fVar327 * fVar220;
              auVar94._8_4_ = fVar299 * fVar298;
              auVar94._12_4_ = fVar161 * fVar159;
              auVar94._16_4_ = fVar189 * fVar174;
              auVar94._20_4_ = fVar244 * fVar241;
              auVar94._24_4_ = fVar272 * fVar271;
              auVar94._28_4_ = auVar232._28_4_;
              auVar95._4_4_ = fVar332 * fVar263;
              auVar95._0_4_ = fVar329 * fVar324;
              auVar95._8_4_ = fVar192 * fVar289;
              auVar95._12_4_ = fVar165 * fVar204;
              auVar95._16_4_ = fVar191 * fVar167;
              auVar95._20_4_ = fVar259 * fVar173;
              auVar95._24_4_ = fVar297 * fVar262;
              auVar95._28_4_ = auVar24._28_4_;
              auVar267 = vsubps_avx(auVar95,auVar94);
              auVar185._0_4_ = auVar17._0_4_ * 0.0 + auVar267._0_4_ + auVar210._0_4_ * 0.0;
              auVar185._4_4_ = auVar17._4_4_ * 0.0 + auVar267._4_4_ + auVar210._4_4_ * 0.0;
              auVar185._8_4_ = auVar17._8_4_ * 0.0 + auVar267._8_4_ + auVar210._8_4_ * 0.0;
              auVar185._12_4_ = auVar17._12_4_ * 0.0 + auVar267._12_4_ + auVar210._12_4_ * 0.0;
              auVar185._16_4_ = auVar17._16_4_ * 0.0 + auVar267._16_4_ + auVar210._16_4_ * 0.0;
              auVar185._20_4_ = auVar17._20_4_ * 0.0 + auVar267._20_4_ + auVar210._20_4_ * 0.0;
              auVar185._24_4_ = auVar17._24_4_ * 0.0 + auVar267._24_4_ + auVar210._24_4_ * 0.0;
              auVar185._28_4_ = auVar24._28_4_ + auVar267._28_4_ + auVar232._28_4_;
              auVar186 = vrcpps_avx(auVar185);
              fVar324 = auVar186._0_4_;
              fVar220 = auVar186._4_4_;
              auVar96._4_4_ = auVar185._4_4_ * fVar220;
              auVar96._0_4_ = auVar185._0_4_ * fVar324;
              fVar327 = auVar186._8_4_;
              auVar96._8_4_ = auVar185._8_4_ * fVar327;
              fVar223 = auVar186._12_4_;
              auVar96._12_4_ = auVar185._12_4_ * fVar223;
              fVar329 = auVar186._16_4_;
              auVar96._16_4_ = auVar185._16_4_ * fVar329;
              fVar263 = auVar186._20_4_;
              auVar96._20_4_ = auVar185._20_4_ * fVar263;
              fVar331 = auVar186._24_4_;
              auVar96._24_4_ = auVar185._24_4_ * fVar331;
              auVar96._28_4_ = auVar26._28_4_;
              auVar338._8_4_ = 0x3f800000;
              auVar338._0_8_ = &DAT_3f8000003f800000;
              auVar338._12_4_ = 0x3f800000;
              auVar338._16_4_ = 0x3f800000;
              auVar338._20_4_ = 0x3f800000;
              auVar338._24_4_ = 0x3f800000;
              auVar338._28_4_ = 0x3f800000;
              auVar186 = vsubps_avx(auVar338,auVar96);
              fVar324 = auVar186._0_4_ * fVar324 + fVar324;
              fVar220 = auVar186._4_4_ * fVar220 + fVar220;
              fVar327 = auVar186._8_4_ * fVar327 + fVar327;
              fVar223 = auVar186._12_4_ * fVar223 + fVar223;
              fVar329 = auVar186._16_4_ * fVar329 + fVar329;
              fVar263 = auVar186._20_4_ * fVar263 + fVar263;
              fVar331 = auVar186._24_4_ * fVar331 + fVar331;
              auVar97._4_4_ =
                   (fVar328 * auVar17._4_4_ + auVar210._4_4_ * fVar330 + auVar267._4_4_ * fVar282) *
                   fVar220;
              auVar97._0_4_ =
                   (fVar326 * auVar17._0_4_ + auVar210._0_4_ * fVar217 + auVar267._0_4_ * fVar275) *
                   fVar324;
              auVar97._8_4_ =
                   (fVar300 * auVar17._8_4_ + auVar210._8_4_ * fVar222 + auVar267._8_4_ * fVar283) *
                   fVar327;
              auVar97._12_4_ =
                   (fVar141 * auVar17._12_4_ + auVar210._12_4_ * fVar273 + auVar267._12_4_ * fVar284
                   ) * fVar223;
              auVar97._16_4_ =
                   (fVar171 * auVar17._16_4_ + auVar210._16_4_ * fVar169 + auVar267._16_4_ * fVar285
                   ) * fVar329;
              auVar97._20_4_ =
                   (fVar239 * auVar17._20_4_ + auVar210._20_4_ * fVar274 + auVar267._20_4_ * fVar286
                   ) * fVar263;
              auVar97._24_4_ =
                   (fVar270 * auVar17._24_4_ + auVar210._24_4_ * fVar264 + auVar267._24_4_ * fVar287
                   ) * fVar331;
              auVar97._28_4_ = auVar20._28_4_ + auVar27._28_4_ + auVar16._28_4_;
              auVar215 = ZEXT3264(auVar97);
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar236._4_4_ = uVar9;
              auVar236._0_4_ = uVar9;
              auVar236._8_4_ = uVar9;
              auVar236._12_4_ = uVar9;
              auVar236._16_4_ = uVar9;
              auVar236._20_4_ = uVar9;
              auVar236._24_4_ = uVar9;
              auVar236._28_4_ = uVar9;
              auVar186 = vcmpps_avx(local_100,auVar97,2);
              auVar20 = vcmpps_avx(auVar97,auVar236,2);
              auVar186 = vandps_avx(auVar186,auVar20);
              auVar27 = auVar209 & auVar186;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar27 >> 0x7f,0) == '\0') &&
                    (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0xbf,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar27[0x1f]) goto LAB_00f09ba9;
              auVar186 = vandps_avx(auVar209,auVar186);
              auVar27 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar185,4);
              auVar16 = auVar186 & auVar27;
              auVar188 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
              auVar339._4_4_ = fVar160;
              auVar339._0_4_ = fVar142;
              auVar339._8_4_ = fVar162;
              auVar339._12_4_ = fVar164;
              auVar339._16_4_ = fVar166;
              auVar339._20_4_ = fVar168;
              auVar339._24_4_ = fVar170;
              auVar339._28_4_ = fVar172;
              if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar16 >> 0x7f,0) != '\0') ||
                    (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0xbf,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar16[0x1f] < '\0') {
                auVar186 = vandps_avx(auVar27,auVar186);
                auVar188 = ZEXT3264(auVar186);
                auVar98._4_4_ = fVar220 * auVar322._4_4_;
                auVar98._0_4_ = fVar324 * auVar322._0_4_;
                auVar98._8_4_ = fVar327 * auVar322._8_4_;
                auVar98._12_4_ = fVar223 * auVar322._12_4_;
                auVar98._16_4_ = fVar329 * auVar322._16_4_;
                auVar98._20_4_ = fVar263 * auVar322._20_4_;
                auVar98._24_4_ = fVar331 * auVar322._24_4_;
                auVar98._28_4_ = auVar20._28_4_;
                auVar99._4_4_ = auVar155._4_4_ * fVar220;
                auVar99._0_4_ = auVar155._0_4_ * fVar324;
                auVar99._8_4_ = auVar155._8_4_ * fVar327;
                auVar99._12_4_ = auVar155._12_4_ * fVar223;
                auVar99._16_4_ = auVar155._16_4_ * fVar329;
                auVar99._20_4_ = auVar155._20_4_ * fVar263;
                auVar99._24_4_ = auVar155._24_4_ * fVar331;
                auVar99._28_4_ = auVar155._28_4_;
                auVar269._8_4_ = 0x3f800000;
                auVar269._0_8_ = &DAT_3f8000003f800000;
                auVar269._12_4_ = 0x3f800000;
                auVar269._16_4_ = 0x3f800000;
                auVar269._20_4_ = 0x3f800000;
                auVar269._24_4_ = 0x3f800000;
                auVar269._28_4_ = 0x3f800000;
                auVar186 = vsubps_avx(auVar269,auVar98);
                local_380 = vblendvps_avx(auVar186,auVar98,auVar325);
                auVar186 = vsubps_avx(auVar269,auVar99);
                _local_560 = vblendvps_avx(auVar186,auVar99,auVar325);
                auVar158 = ZEXT3264(_local_560);
                local_3a0 = auVar97;
              }
            }
            auVar186 = auVar188._0_32_;
            auVar323 = ZEXT3264(local_720);
            local_5e0 = auVar21;
            if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar186 >> 0x7f,0) != '\0') ||
                  (auVar188 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar186 >> 0xbf,0) != '\0') ||
                (auVar188 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar188[0x1f] < '\0') {
              auVar20 = vsubps_avx(auVar281,auVar339);
              auVar215 = ZEXT3264(local_380);
              fVar217 = auVar339._0_4_ + auVar20._0_4_ * local_380._0_4_;
              fVar326 = auVar339._4_4_ + auVar20._4_4_ * local_380._4_4_;
              fVar220 = auVar339._8_4_ + auVar20._8_4_ * local_380._8_4_;
              fVar327 = auVar339._12_4_ + auVar20._12_4_ * local_380._12_4_;
              fVar223 = auVar339._16_4_ + auVar20._16_4_ * local_380._16_4_;
              fVar329 = auVar339._20_4_ + auVar20._20_4_ * local_380._20_4_;
              fVar263 = auVar339._24_4_ + auVar20._24_4_ * local_380._24_4_;
              fVar330 = auVar339._28_4_ + auVar20._28_4_;
              fVar324 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar100._4_4_ = (fVar326 + fVar326) * fVar324;
              auVar100._0_4_ = (fVar217 + fVar217) * fVar324;
              auVar100._8_4_ = (fVar220 + fVar220) * fVar324;
              auVar100._12_4_ = (fVar327 + fVar327) * fVar324;
              auVar100._16_4_ = (fVar223 + fVar223) * fVar324;
              auVar100._20_4_ = (fVar329 + fVar329) * fVar324;
              auVar100._24_4_ = (fVar263 + fVar263) * fVar324;
              auVar100._28_4_ = fVar330 + fVar330;
              auVar20 = vcmpps_avx(local_3a0,auVar100,6);
              auVar158 = ZEXT3264(auVar20);
              auVar21 = auVar186 & auVar20;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                local_420 = vandps_avx(auVar20,auVar186);
                auVar158 = ZEXT3264(local_420);
                auVar178._0_8_ =
                     CONCAT44((float)local_560._4_4_ + (float)local_560._4_4_ + -1.0,
                              (float)local_560._0_4_ + (float)local_560._0_4_ + -1.0);
                auVar178._8_4_ = (float)uStack_558 + (float)uStack_558 + -1.0;
                auVar178._12_4_ = uStack_558._4_4_ + uStack_558._4_4_ + -1.0;
                auVar180._16_4_ = (float)uStack_550 + (float)uStack_550 + -1.0;
                auVar180._0_16_ = auVar178;
                auVar180._20_4_ = uStack_550._4_4_ + uStack_550._4_4_ + -1.0;
                fStack_4a8 = (float)uStack_548 + (float)uStack_548 + -1.0;
                _local_4c0 = auVar180;
                fStack_4a4 = uStack_548._4_4_ + uStack_548._4_4_ + -1.0;
                auVar188 = ZEXT3264(_local_4c0);
                local_4e0 = local_380;
                local_4a0 = local_3a0;
                local_460 = local_670._0_8_;
                uStack_458 = local_670._8_8_;
                local_450 = local_5f0._0_8_;
                uStack_448 = local_5f0._8_8_;
                local_440 = local_600._0_8_;
                uStack_438 = local_600._8_8_;
                pGVar13 = (context->scene->geometries).items[uVar136].ptr;
                _local_560 = _local_4c0;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar137 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar137 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar179._0_4_ = (float)(int)local_480;
                  auVar179._4_8_ = SUB128(ZEXT812(0),4);
                  auVar179._12_4_ = 0;
                  auVar248 = vshufps_avx(auVar179,auVar179,0);
                  local_400[0] = (auVar248._0_4_ + local_380._0_4_ + 0.0) * (float)local_160._0_4_;
                  local_400[1] = (auVar248._4_4_ + local_380._4_4_ + 1.0) * (float)local_160._4_4_;
                  local_400[2] = (auVar248._8_4_ + local_380._8_4_ + 2.0) * fStack_158;
                  local_400[3] = (auVar248._12_4_ + local_380._12_4_ + 3.0) * fStack_154;
                  fStack_3f0 = (auVar248._0_4_ + local_380._16_4_ + 4.0) * fStack_150;
                  fStack_3ec = (auVar248._4_4_ + local_380._20_4_ + 5.0) * fStack_14c;
                  fStack_3e8 = (auVar248._8_4_ + local_380._24_4_ + 6.0) * fStack_148;
                  fStack_3e4 = auVar248._12_4_ + (float)local_380._28_4_ + 7.0;
                  uStack_558 = auVar178._8_8_;
                  uStack_550 = auVar180._16_8_;
                  uStack_548 = local_4c0._24_8_;
                  local_3e0 = auVar178._0_8_;
                  uStack_3d8 = uStack_558;
                  uStack_3d0 = uStack_550;
                  uStack_3c8 = uStack_548;
                  auVar188 = ZEXT3264(local_3a0);
                  local_3c0 = local_3a0;
                  iVar132 = vmovmskps_avx(local_420);
                  local_920 = CONCAT44((int)((ulong)context->args >> 0x20),iVar132);
                  lVar15 = 0;
                  if (local_920 != 0) {
                    for (; (local_920 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                    }
                  }
                  local_8e0 = (uint)lVar15;
                  uStack_8dc = (undefined4)((ulong)lVar15 >> 0x20);
                  local_740._0_4_ = (int)CONCAT71((int7)(local_920 >> 8),iVar132 != 0);
                  if (iVar132 != 0) {
                    _auStack_6b0 = auVar22._16_16_;
                    _local_6c0 = local_670;
                    auVar248 = *local_780;
                    uVar105 = *local_788;
                    uVar106 = local_788[1];
                    local_47c = uVar12;
                    local_470 = uVar129;
                    uStack_468 = uVar130;
                    do {
                      uVar134 = *(uint *)(ray + k * 4 + 0x100);
                      lVar15 = CONCAT44(uStack_8dc,local_8e0);
                      local_220 = local_400[lVar15];
                      local_200 = *(undefined4 *)((long)&local_3e0 + lVar15 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + lVar15 * 4)
                      ;
                      fVar254 = 1.0 - local_220;
                      fVar237 = local_220 * fVar254 * 4.0;
                      auVar249 = ZEXT416((uint)(local_220 * local_220 * 0.5));
                      auVar249 = vshufps_avx(auVar249,auVar249,0);
                      local_900._0_4_ = auVar18._0_4_;
                      local_900._4_4_ = auVar18._4_4_;
                      fStack_8f8 = auVar18._8_4_;
                      fStack_8f4 = auVar18._12_4_;
                      auVar198 = ZEXT416((uint)((fVar254 * fVar254 + fVar237) * 0.5));
                      auVar198 = vshufps_avx(auVar198,auVar198,0);
                      local_7e0._0_4_ = auVar19._0_4_;
                      local_7e0._4_4_ = auVar19._4_4_;
                      fStack_7d8 = auVar19._8_4_;
                      fStack_7d4 = auVar19._12_4_;
                      auVar196 = ZEXT416((uint)((-local_220 * local_220 - fVar237) * 0.5));
                      auVar196 = vshufps_avx(auVar196,auVar196,0);
                      local_770.context = context->user;
                      auVar144 = ZEXT416((uint)(fVar254 * -fVar254 * 0.5));
                      auVar144 = vshufps_avx(auVar144,auVar144,0);
                      auVar199._0_4_ =
                           auVar144._0_4_ * local_970 +
                           auVar196._0_4_ * (float)local_6c0._0_4_ +
                           auVar249._0_4_ * (float)local_900._0_4_ +
                           auVar198._0_4_ * (float)local_7e0._0_4_;
                      auVar199._4_4_ =
                           auVar144._4_4_ * fStack_96c +
                           auVar196._4_4_ * (float)local_6c0._4_4_ +
                           auVar249._4_4_ * (float)local_900._4_4_ +
                           auVar198._4_4_ * (float)local_7e0._4_4_;
                      auVar199._8_4_ =
                           auVar144._8_4_ * fStack_968 +
                           auVar196._8_4_ * (float)uStack_6b8 +
                           auVar249._8_4_ * fStack_8f8 + auVar198._8_4_ * fStack_7d8;
                      auVar199._12_4_ =
                           auVar144._12_4_ * fStack_964 +
                           auVar196._12_4_ * uStack_6b8._4_4_ +
                           auVar249._12_4_ * fStack_8f4 + auVar198._12_4_ * fStack_7d4;
                      local_270 = vshufps_avx(auVar199,auVar199,0);
                      local_280[0] = (RTCHitN)local_270[0];
                      local_280[1] = (RTCHitN)local_270[1];
                      local_280[2] = (RTCHitN)local_270[2];
                      local_280[3] = (RTCHitN)local_270[3];
                      local_280[4] = (RTCHitN)local_270[4];
                      local_280[5] = (RTCHitN)local_270[5];
                      local_280[6] = (RTCHitN)local_270[6];
                      local_280[7] = (RTCHitN)local_270[7];
                      local_280[8] = (RTCHitN)local_270[8];
                      local_280[9] = (RTCHitN)local_270[9];
                      local_280[10] = (RTCHitN)local_270[10];
                      local_280[0xb] = (RTCHitN)local_270[0xb];
                      local_280[0xc] = (RTCHitN)local_270[0xc];
                      local_280[0xd] = (RTCHitN)local_270[0xd];
                      local_280[0xe] = (RTCHitN)local_270[0xe];
                      local_280[0xf] = (RTCHitN)local_270[0xf];
                      local_250 = vshufps_avx(auVar199,auVar199,0x55);
                      auVar215 = ZEXT1664(local_250);
                      local_260 = local_250;
                      local_230 = vshufps_avx(auVar199,auVar199,0xaa);
                      local_240 = local_230;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_140._0_8_;
                      uStack_1d8 = local_140._8_8_;
                      uStack_1d0 = local_140._16_8_;
                      uStack_1c8 = local_140._24_8_;
                      local_1c0 = local_120._0_8_;
                      uStack_1b8 = local_120._8_8_;
                      uStack_1b0 = local_120._16_8_;
                      uStack_1a8 = local_120._24_8_;
                      auVar186 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                      local_778[1] = auVar186;
                      *local_778 = auVar186;
                      local_1a0 = (local_770.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_770.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_800 = auVar248._0_8_;
                      uStack_7f8 = auVar248._8_8_;
                      local_7c0 = local_800;
                      uStack_7b8 = uStack_7f8;
                      local_770.valid = (int *)&local_7c0;
                      local_770.geometryUserPtr = pGVar13->userPtr;
                      local_770.hit = local_280;
                      local_770.N = 8;
                      uStack_7b0 = uVar105;
                      uStack_7a8 = uVar106;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar215 = ZEXT1664(local_250);
                        (*pGVar13->occlusionFilterN)(&local_770);
                      }
                      auVar112._8_8_ = uStack_7b8;
                      auVar112._0_8_ = local_7c0;
                      auVar249 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar112);
                      auVar116._8_8_ = uStack_7a8;
                      auVar116._0_8_ = uStack_7b0;
                      auVar198 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar116);
                      auVar188 = ZEXT1664(auVar198);
                      auVar156._16_16_ = auVar198;
                      auVar156._0_16_ = auVar249;
                      auVar22 = auVar186 & ~auVar156;
                      local_960 = auVar186._0_4_;
                      fStack_95c = auVar186._4_4_;
                      fStack_958 = auVar186._8_4_;
                      fStack_954 = auVar186._12_4_;
                      fStack_950 = auVar186._16_4_;
                      fStack_94c = auVar186._20_4_;
                      fStack_948 = auVar186._24_4_;
                      fStack_944 = auVar186._28_4_;
                      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar22 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar22 >> 0x7f,0) == '\0') &&
                            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar22 >> 0xbf,0) == '\0') &&
                          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar22[0x1f]) {
                        auVar157._0_4_ = auVar249._0_4_ ^ (uint)local_960;
                        auVar157._4_4_ = auVar249._4_4_ ^ (uint)fStack_95c;
                        auVar157._8_4_ = auVar249._8_4_ ^ (uint)fStack_958;
                        auVar157._12_4_ = auVar249._12_4_ ^ (uint)fStack_954;
                        auVar157._16_4_ = auVar198._0_4_ ^ (uint)fStack_950;
                        auVar157._20_4_ = auVar198._4_4_ ^ (uint)fStack_94c;
                        auVar157._24_4_ = auVar198._8_4_ ^ (uint)fStack_948;
                        auVar157._28_4_ = auVar198._12_4_ ^ (uint)fStack_944;
                      }
                      else {
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          (*p_Var14)(&local_770);
                        }
                        auVar113._8_8_ = uStack_7b8;
                        auVar113._0_8_ = local_7c0;
                        auVar249 = vpcmpeqd_avx((undefined1  [16])0x0,auVar113);
                        auVar117._8_8_ = uStack_7a8;
                        auVar117._0_8_ = uStack_7b0;
                        auVar198 = vpcmpeqd_avx((undefined1  [16])0x0,auVar117);
                        auVar187._16_16_ = auVar198;
                        auVar187._0_16_ = auVar249;
                        auVar157._0_4_ = auVar249._0_4_ ^ (uint)local_960;
                        auVar157._4_4_ = auVar249._4_4_ ^ (uint)fStack_95c;
                        auVar157._8_4_ = auVar249._8_4_ ^ (uint)fStack_958;
                        auVar157._12_4_ = auVar249._12_4_ ^ (uint)fStack_954;
                        auVar157._16_4_ = auVar198._0_4_ ^ (uint)fStack_950;
                        auVar157._20_4_ = auVar198._4_4_ ^ (uint)fStack_94c;
                        auVar157._24_4_ = auVar198._8_4_ ^ (uint)fStack_948;
                        auVar157._28_4_ = auVar198._12_4_ ^ (uint)fStack_944;
                        auVar203._8_4_ = 0xff800000;
                        auVar203._0_8_ = 0xff800000ff800000;
                        auVar203._12_4_ = 0xff800000;
                        auVar203._16_4_ = 0xff800000;
                        auVar203._20_4_ = 0xff800000;
                        auVar203._24_4_ = 0xff800000;
                        auVar203._28_4_ = 0xff800000;
                        auVar186 = vblendvps_avx(auVar203,*(undefined1 (*) [32])
                                                           (local_770.ray + 0x100),auVar187);
                        auVar188 = ZEXT3264(auVar186);
                        *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar186;
                      }
                      auVar158 = ZEXT3264(auVar157);
                      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar157 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar157 >> 0x7f,0) != '\0') ||
                            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar157 >> 0xbf,0) != '\0') ||
                          (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar157[0x1f] < '\0') break;
                      auVar158 = ZEXT464(uVar134);
                      *(uint *)(ray + k * 4 + 0x100) = uVar134;
                      local_920 = local_920 ^ 1L << ((ulong)local_8e0 & 0x3f);
                      lVar15 = 0;
                      if (local_920 != 0) {
                        for (; (local_920 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                        }
                      }
                      local_8e0 = (uint)lVar15;
                      uStack_8dc = (undefined4)((ulong)lVar15 >> 0x20);
                      local_740._0_4_ = (int)CONCAT71((int7)(local_920 >> 8),local_920 != 0);
                    } while (local_920 != 0);
                  }
                  bVar137 = local_740[0] & 1;
                  auVar323 = ZEXT3264(local_720);
                }
                bVar131 = (bool)(bVar131 | bVar137);
                fVar237 = (float)local_6a0._0_4_;
                fVar254 = (float)local_6a0._4_4_;
                fVar218 = fStack_698;
                fVar238 = fStack_694;
                fVar257 = fStack_690;
                fVar219 = fStack_68c;
                fVar240 = fStack_688;
                fVar260 = fStack_684;
              }
            }
          }
          lVar138 = lVar138 + 8;
        } while ((int)lVar138 < (int)uVar12);
      }
      if (bVar131 != false) {
        return bVar140;
      }
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar146._4_4_ = uVar9;
      auVar146._0_4_ = uVar9;
      auVar146._8_4_ = uVar9;
      auVar146._12_4_ = uVar9;
      auVar248 = vcmpps_avx(local_4f0,auVar146,2);
      uVar134 = vmovmskps_avx(auVar248);
      uVar134 = (uint)uVar139 & uVar134;
      bVar140 = uVar134 != 0;
    } while (bVar140);
  }
  return bVar140;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }